

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_sync.cpp
# Opt level: O1

void __thiscall
amrex::MLNodeLaplacian::compSyncResidualCoarse
          (MLNodeLaplacian *this,MultiFab *sync_resid,MultiFab *a_phi,MultiFab *vold,MultiFab *rhcc,
          BoxArray *fine_grids,IntVect *ref_ratio)

{
  Box *domain;
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  Real RVar20;
  LinOpBCType LVar21;
  LinOpBCType LVar22;
  LinOpBCType LVar23;
  LinOpBCType LVar24;
  Geometry *this_00;
  DistributionMapping *cdm;
  BoxArray *ba;
  pointer paVar25;
  pointer paVar26;
  long *plVar27;
  FabArray<amrex::IArrayBox> *this_01;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_02;
  EBCellFlagFab *this_03;
  undefined8 uVar28;
  GpuArray<amrex::LinOpBCType,_3U> bchi;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double *pdVar32;
  int i;
  int iVar33;
  FabType FVar34;
  int iVar35;
  uint uVar36;
  int iVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  int *piVar41;
  DataAllocator DVar42;
  long lVar43;
  long lVar44;
  Arena *arena;
  long lVar45;
  long lVar46;
  bool bVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  ulong uVar52;
  long lVar53;
  _func_int **pp_Var54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  int iVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  long lVar68;
  long lVar69;
  long lVar70;
  long lVar71;
  bool bVar72;
  int iVar73;
  long lVar74;
  long lVar75;
  double *pdVar76;
  long lVar77;
  long lVar78;
  long lVar79;
  long lVar80;
  int iVar81;
  long lVar82;
  long lVar83;
  long lVar84;
  long lVar85;
  long lVar86;
  long lVar87;
  long lVar88;
  long lVar89;
  _func_int **pp_Var90;
  long lVar91;
  long lVar92;
  long lVar93;
  long lVar94;
  long lVar95;
  long lVar96;
  long lVar97;
  long lVar98;
  double *pdVar99;
  long lVar100;
  long lVar101;
  ulong uVar102;
  bool bVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  undefined8 uVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  Real RVar120;
  double dVar121;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  int iVar129;
  double dVar130;
  double dVar131;
  int iVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  Periodicity PVar140;
  GpuArray<amrex::LinOpBCType,_3U> bclo;
  long local_1000;
  long local_ff8;
  long local_ff0;
  double *local_fe8;
  long local_fe0;
  double *local_fd8;
  long local_fd0;
  double *local_fc8;
  double *local_fc0;
  ulong local_fb8;
  long local_fb0;
  long local_fa8;
  long local_fa0;
  long local_f98;
  long local_f90;
  long local_f88;
  long local_f80;
  long local_f78;
  long local_f70;
  long local_f68;
  long local_f60;
  double *local_f58;
  long local_f50;
  double *local_f48;
  long local_f40;
  long local_f38;
  long local_f20;
  double *local_f18;
  long local_f10;
  long local_f08;
  long local_f00;
  long local_ef8;
  long local_ef0;
  long local_ee8;
  long local_ed8;
  long local_ed0;
  long local_ec8;
  long local_eb8;
  long local_ea8;
  long local_ea0;
  long local_e90;
  long local_e88;
  long local_e80;
  long local_e70;
  long local_e68;
  long local_e60;
  long local_e58;
  long local_e50;
  long local_e40;
  long local_e38;
  long local_e30;
  long local_e28;
  long local_e20;
  long local_e18;
  long local_e08;
  long local_de8;
  long local_de0;
  long local_dd8;
  long local_dd0;
  long local_dc8;
  Box bx_2;
  long local_d88;
  long local_d80;
  long local_d78;
  Box local_d68;
  long local_d40;
  long local_d38;
  long local_d30;
  ulong local_d28;
  ulong local_d20;
  long local_d18;
  long local_d10;
  double *local_d08;
  double *local_d00;
  long local_cf8;
  long local_cf0;
  long local_ce8;
  long local_ce0;
  long local_cd8;
  long local_cd0;
  long local_cc8;
  ulong local_cc0;
  long local_cb8;
  long local_cb0;
  long local_ca8;
  long local_ca0;
  ulong local_c98;
  long local_c90;
  long local_c88;
  long local_c80;
  Box bx;
  Box bx_1;
  int local_c18;
  uint local_c14;
  uint local_c10;
  long local_be8;
  long local_be0;
  long local_bd8;
  long local_bd0;
  long local_bc8;
  long local_bc0;
  long local_bb0;
  long local_ba8;
  long local_ba0;
  long local_b98;
  long local_b90;
  Box lhs;
  Array4<const_double> local_b60;
  FabArray<amrex::FArrayBox> *local_b20;
  long local_b18;
  long local_b10;
  long local_b08;
  long local_b00;
  ulong local_af8;
  ulong local_af0;
  Array4<const_int> local_ae8;
  Box result;
  Box bx_3;
  Array4<const_double> local_a68;
  Box local_a28;
  Box bx_6;
  undefined4 uStack_9ec;
  int local_9e8;
  int local_9e4;
  int local_9e0;
  FabArray<amrex::EBCellFlagFab> *local_9b0;
  Array4<const_double> local_9a0;
  int local_95c;
  Array4<const_double> local_958;
  MFIter mfi_1;
  Real facz;
  Real facy;
  Real facx;
  Box bx_5;
  Box bx_4;
  int local_7f8;
  int local_7f4;
  int local_7f0;
  FArrayBox rhs;
  FArrayBox cn;
  FArrayBox sten;
  FArrayBox u;
  undefined1 local_638 [28];
  undefined4 uStack_61c;
  int local_618;
  int local_614;
  int local_610;
  double local_5f8;
  undefined8 uStack_5f0;
  double local_5e8;
  undefined8 uStack_5e0;
  double local_5d8;
  undefined8 uStack_5d0;
  double local_5c8;
  undefined8 uStack_5c0;
  double local_5b8;
  undefined8 uStack_5b0;
  double local_5a8;
  undefined8 uStack_5a0;
  double local_598;
  undefined8 uStack_590;
  double local_588;
  undefined8 uStack_580;
  double local_578;
  undefined8 uStack_570;
  undefined1 local_568 [16];
  Real facy_2;
  Real fm2xm2y4z;
  undefined8 uStack_540;
  Real f2x2ymz;
  undefined8 uStack_530;
  Real f2xmy2z;
  Real fmx2y2z;
  undefined8 uStack_510;
  Real fxyz;
  undefined8 uStack_500;
  Real fm2x4ym2z;
  undefined8 uStack_4f0;
  Real f4xm2ym2z;
  undefined8 uStack_4e0;
  double local_4d8;
  undefined8 uStack_4d0;
  double local_4c8;
  undefined8 uStack_4c0;
  Real facx_2;
  undefined8 uStack_4b0;
  Real facz_2;
  undefined8 uStack_4a0;
  Elixir steneli;
  Elixir rhseli;
  Elixir ueli;
  Box local_44c;
  Elixir cneli;
  MFItInfo mfi_info;
  MultiFab phi;
  BoxArray local_280;
  BoxArray local_218;
  iMultiFab crse_cc_mask;
  
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&sync_resid->super_FabArray<amrex::FArrayBox>,0.0,0,
             (sync_resid->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,
             &(sync_resid->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow);
  this_00 = *(Geometry **)
             &(((this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                .
                super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  cdm = *(DistributionMapping **)
         &(((this->super_MLNodeLinOp).super_MLLinOp.m_dmap.
            super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
            .
            super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>).
          super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
  ;
  ba = *(BoxArray **)
        &(((this->super_MLNodeLinOp).super_MLLinOp.m_grids.
           super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
           .
           super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->
         super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
         super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>;
  crse_cc_mask.super_FabArray<amrex::IArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
       (_func_int **)0x100000001;
  crse_cc_mask.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type =
       indexType;
  convert(&local_218,ba,(IntVect *)&crse_cc_mask);
  crse_cc_mask.super_FabArray<amrex::IArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
       (_func_int **)0x0;
  crse_cc_mask.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type = null;
  convert(&local_280,fine_grids,(IntVect *)&crse_cc_mask);
  paVar25 = (this->super_MLNodeLinOp).super_MLLinOp.m_lobc.
            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            .
            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  paVar26 = (this->super_MLNodeLinOp).super_MLLinOp.m_hibc.
            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            .
            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  LVar21 = paVar25->_M_elems[0];
  local_cc0 = (ulong)paVar25->_M_elems[1];
  LVar22 = paVar25->_M_elems[2];
  local_af0 = (ulong)paVar26->_M_elems[0];
  LVar23 = paVar26->_M_elems[1];
  LVar24 = paVar26->_M_elems[2];
  phi.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
       (_func_int **)0x100000001;
  phi.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type = indexType;
  PVar140 = Geometry::periodicity(this_00);
  mfi_1.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ =
       (undefined1)PVar140.period.vect[0];
  mfi_1.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ = PVar140.period.vect._1_7_
  ;
  mfi_1.fabArray._0_4_ = PVar140.period.vect[2];
  makeFineMask(&crse_cc_mask,ba,cdm,(IntVect *)&phi,&local_280,ref_ratio,(Periodicity *)&mfi_1,1,0);
  MFIter::MFIter((MFIter *)&phi,(FabArrayBase *)&crse_cc_mask,'\0');
  domain = &this_00->domain;
  if (phi.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
      m_loshft.vect[0] <
      phi.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
      m_loshft.vect[2]) {
    lVar38 = local_cc0 << 0x20;
    uVar52 = (ulong)LVar23 << 0x20 | local_af0;
    do {
      FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>
                ((Array4<int> *)&mfi_1,&crse_cc_mask.super_FabArray<amrex::IArrayBox>,(MFIter *)&phi
                );
      BATransformer::operator()
                ((Box *)&rhs,
                 (BATransformer *)
                 (CONCAT44(phi.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.
                           m_op.m_indexType.m_typ.itype,
                           phi.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.
                           m_bat_type) + 8),
                 (Box *)((long)*(int *)(*(long *)phi.super_FabArray<amrex::FArrayBox>.
                                                 super_FabArrayBase.boxarray.m_bat.m_op._44_8_ +
                                       (long)phi.super_FabArray<amrex::FArrayBox>.super_FabArrayBase
                                             .boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[0] * 4) *
                         0x1c + **(long **)(CONCAT44(phi.super_FabArray<amrex::FArrayBox>.
                                                     super_FabArrayBase.boxarray.m_bat.m_op.
                                                     m_indexType.m_typ.itype,
                                                     phi.super_FabArray<amrex::FArrayBox>.
                                                     super_FabArrayBase.boxarray.m_bat.m_bat_type) +
                                           0x50)));
      bchi.arr[2] = LVar24;
      bchi.arr[0] = (int)uVar52;
      bchi.arr[1] = (int)(uVar52 >> 0x20);
      bclo.arr[2] = LVar22;
      bclo.arr._0_8_ = lVar38 + (ulong)LVar21;
      mlndlap_fillbc_cc<int>((Box *)&rhs,(Array4<int> *)&mfi_1,domain,bclo,bchi);
      MFIter::operator++((MFIter *)&phi);
    } while (phi.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
             m_loshft.vect[0] <
             phi.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
             m_loshft.vect[2]);
  }
  MFIter::~MFIter((MFIter *)&phi);
  mfi_1.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ = 0;
  mfi_1.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = 1;
  mfi_1.fabArray._0_4_ = 0;
  mfi_1.fabArray._4_4_ = 0;
  mfi_1.tile_size.vect[0] = 0;
  mfi_1.tile_size.vect[1] = 0;
  mfi_1.tile_size.vect[2] = 0;
  mfi_1.flags = '\0';
  mfi_1._29_3_ = 0;
  mfi_1.currentIndex = 0;
  mfi_1.beginIndex = 0;
  rhs.super_BaseFab<double>._vptr_BaseFab = (_func_int **)&PTR__FabFactory_0074e8d0;
  MultiFab::MultiFab(&phi,&local_218,cdm,1,1,(MFInfo *)&mfi_1,(FabFactory<amrex::FArrayBox> *)&rhs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi_1.tile_size);
  MFIter::MFIter(&mfi_1,(FabArrayBase *)&phi,true);
  if (mfi_1.currentIndex < mfi_1.endIndex) {
    do {
      MFIter::tilebox((Box *)&cn,&mfi_1);
      MFIter::growntilebox(&bx_1,&mfi_1,-1000000);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&rhs,&phi.super_FabArray<amrex::FArrayBox>,&mfi_1);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&u,&a_phi->super_FabArray<amrex::FArrayBox>,&mfi_1);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                ((Array4<const_int> *)&sten,&crse_cc_mask.super_FabArray<amrex::IArrayBox>,&mfi_1);
      if (bx_1.smallend.vect[2] <= bx_1.bigend.vect[2]) {
        lVar38 = (long)bx_1.smallend.vect[0];
        iVar33 = bx_1.smallend.vect[2] + -1;
        iVar37 = bx_1.smallend.vect[2];
        do {
          if (bx_1.smallend.vect[1] <= bx_1.bigend.vect[1]) {
            lVar39 = (long)iVar37;
            iVar35 = bx_1.smallend.vect[1];
            iVar81 = bx_1.smallend.vect[1] + -1;
            do {
              if (bx_1.smallend.vect[0] <= bx_1.bigend.vect[0]) {
                lVar40 = (long)iVar35;
                lVar82 = (lVar40 - rhs.super_BaseFab<double>.domain.bigend.vect[0]) *
                         (long)rhs.super_BaseFab<double>.super_DataAllocator.m_arena;
                lVar56 = (lVar39 - rhs.super_BaseFab<double>.domain.bigend.vect[1]) *
                         (long)rhs.super_BaseFab<double>.dptr;
                lVar48 = (long)sten.super_BaseFab<double>.domain.smallend.vect[2];
                lVar60 = (long)(~sten.super_BaseFab<double>.domain.bigend.vect[1] + iVar37) *
                         (long)sten.super_BaseFab<double>.dptr;
                lVar61 = (long)(iVar37 - sten.super_BaseFab<double>.domain.bigend.vect[1]) *
                         (long)sten.super_BaseFab<double>.dptr;
                lVar97 = (lVar39 - sten.super_BaseFab<double>.domain.bigend.vect[1]) *
                         (long)sten.super_BaseFab<double>.dptr * 4;
                lVar83 = (long)(iVar33 - sten.super_BaseFab<double>.domain.bigend.vect[1]) *
                         (long)sten.super_BaseFab<double>.dptr * 4;
                lVar62 = (long)(iVar81 - sten.super_BaseFab<double>.domain.bigend.vect[0]) *
                         (long)sten.super_BaseFab<double>.super_DataAllocator.m_arena * 4;
                lVar49 = (lVar40 - sten.super_BaseFab<double>.domain.bigend.vect[0]) *
                         (long)sten.super_BaseFab<double>.super_DataAllocator.m_arena * 4;
                lVar57 = 0;
                lVar74 = lVar38;
                pp_Var90 = rhs.super_BaseFab<double>._vptr_BaseFab +
                           lVar38 + ((lVar56 + lVar82) -
                                    (long)rhs.super_BaseFab<double>.domain.smallend.vect[2]);
                do {
                  pp_Var54 = pp_Var90;
                  if (((((lVar38 + lVar57 < (long)(int)cn.super_BaseFab<double>._vptr_BaseFab) ||
                        (iVar35 < cn.super_BaseFab<double>._vptr_BaseFab._4_4_)) ||
                       (iVar37 < (int)cn.super_BaseFab<double>.super_DataAllocator.m_arena)) ||
                      (((long)cn.super_BaseFab<double>.super_DataAllocator.m_arena._4_4_ <
                        lVar38 + lVar57 || ((int)cn.super_BaseFab<double>.dptr < iVar35)))) ||
                     (cn.super_BaseFab<double>.dptr._4_4_ < iVar37)) {
LAB_005acf2a:
                    *pp_Var54 = (_func_int *)0x0;
                  }
                  else {
                    (rhs.super_BaseFab<double>._vptr_BaseFab +
                    lVar38 + ((lVar56 + lVar82) -
                             (long)rhs.super_BaseFab<double>.domain.smallend.vect[2]))[lVar57] =
                         u.super_BaseFab<double>._vptr_BaseFab
                         [lVar38 + (((lVar39 - u.super_BaseFab<double>.domain.bigend.vect[1]) *
                                     (long)u.super_BaseFab<double>.dptr +
                                    (lVar40 - u.super_BaseFab<double>.domain.bigend.vect[0]) *
                                    (long)u.super_BaseFab<double>.super_DataAllocator.m_arena +
                                    lVar57) - (long)u.super_BaseFab<double>.domain.smallend.vect[2])
                         ];
                    lVar53 = (long)(((bx_1.smallend.vect[0] + -1) -
                                    sten.super_BaseFab<double>.domain.smallend.vect[2]) +
                                   (int)lVar57);
                    lVar86 = lVar53 * 4 +
                             (long)(~sten.super_BaseFab<double>.domain.bigend.vect[0] + iVar35) *
                             (long)sten.super_BaseFab<double>.super_DataAllocator.m_arena * 4;
                    if ((((*(int *)((long)sten.super_BaseFab<double>._vptr_BaseFab +
                                   lVar60 * 4 + lVar86) == 0) &&
                         (*(int *)((long)sten.super_BaseFab<double>._vptr_BaseFab +
                                  lVar57 * 4 + lVar62 + lVar83 + lVar48 * -4 + lVar38 * 4) == 0)) &&
                        ((lVar53 = lVar53 * 4 +
                                   (long)(iVar35 - sten.super_BaseFab<double>.domain.bigend.vect[0])
                                   * (long)sten.super_BaseFab<double>.super_DataAllocator.m_arena *
                                   4,
                         *(int *)((long)sten.super_BaseFab<double>._vptr_BaseFab +
                                 lVar60 * 4 + lVar53) == 0 &&
                         (((*(int *)((long)sten.super_BaseFab<double>._vptr_BaseFab +
                                    lVar57 * 4 + lVar49 + lVar83 + lVar48 * -4 + lVar38 * 4) == 0 &&
                           (*(int *)((long)sten.super_BaseFab<double>._vptr_BaseFab +
                                    lVar61 * 4 + lVar86) == 0)) &&
                          (*(int *)((long)sten.super_BaseFab<double>._vptr_BaseFab +
                                   lVar57 * 4 + lVar97 + lVar62 + lVar48 * -4 + lVar38 * 4) == 0))))
                        )) && ((*(int *)((long)sten.super_BaseFab<double>._vptr_BaseFab +
                                        lVar61 * 4 + lVar53) == 0 &&
                               (*(int *)((long)sten.super_BaseFab<double>._vptr_BaseFab +
                                        lVar57 * 4 + lVar97 + lVar49 + lVar48 * -4 + lVar38 * 4) ==
                                0)))) {
                      pp_Var54 = rhs.super_BaseFab<double>._vptr_BaseFab +
                                 lVar82 + lVar56 + (lVar74 - rhs.super_BaseFab<double>.domain.
                                                             smallend.vect[2]);
                      goto LAB_005acf2a;
                    }
                  }
                  lVar74 = lVar74 + 1;
                  lVar57 = lVar57 + 1;
                  pp_Var90 = pp_Var90 + 1;
                } while ((bx_1.bigend.vect[0] - bx_1.smallend.vect[0]) + 1 != (int)lVar57);
              }
              iVar81 = iVar81 + 1;
              bVar103 = iVar35 != bx_1.bigend.vect[1];
              iVar35 = iVar35 + 1;
            } while (bVar103);
          }
          iVar33 = iVar33 + 1;
          bVar103 = iVar37 != bx_1.bigend.vect[2];
          iVar37 = iVar37 + 1;
        } while (bVar103);
      }
      MFIter::operator++(&mfi_1);
    } while (mfi_1.currentIndex < mfi_1.endIndex);
  }
  MFIter::~MFIter(&mfi_1);
  uVar52 = local_af0;
  bx.smallend.vect._0_8_ = *(undefined8 *)(domain->smallend).vect;
  uVar28 = *(undefined8 *)((this_00->domain).smallend.vect + 2);
  bx.bigend.vect[1] = (int)((ulong)*(undefined8 *)(this_00->domain).bigend.vect >> 0x20);
  bx._20_8_ = *(undefined8 *)((this_00->domain).bigend.vect + 2);
  bx.smallend.vect[2] = (int)uVar28;
  bx.bigend.vect[0] = (int)((ulong)uVar28 >> 0x20);
  lVar38 = 0;
  do {
    if ((bx.btype.itype >> ((uint)lVar38 & 0x1f) & 1) == 0) {
      piVar41 = bx.bigend.vect + lVar38;
      *piVar41 = *piVar41 + 1;
    }
    lVar38 = lVar38 + 1;
  } while (lVar38 != 3);
  bx.btype.itype = 7;
  dVar7 = (this_00->super_CoordSys).inv_dx[0];
  dVar8 = (this_00->super_CoordSys).inv_dx[1];
  dVar9 = (this_00->super_CoordSys).inv_dx[2];
  plVar27 = *(long **)&(((this->m_sigma).
                         super_vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                       ).
                       super__Vector_base<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
  ;
  this_01 = (FabArray<amrex::IArrayBox> *)
            **(undefined8 **)
              &(((this->super_MLNodeLinOp).m_dirichlet_mask.
                 super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                 .
                 super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               ).
               super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ;
  lVar38 = **(long **)&(((this->super_MLNodeLinOp).super_MLLinOp.m_factory.
                         super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                       ).
                       super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ;
  if (lVar38 == 0) {
    lVar38 = 0;
  }
  else {
    lVar38 = __dynamic_cast(lVar38,&FabFactory<amrex::FArrayBox>::typeinfo,
                            &EBFArrayBoxFactory::typeinfo,0);
  }
  if (lVar38 == 0) {
    local_9b0 = (FabArray<amrex::EBCellFlagFab> *)0x0;
  }
  else {
    local_9b0 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar38 + 0xd8));
  }
  this_02.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (((this->m_integral).
         super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
         .
         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  if (lVar38 == 0) {
    local_b20 = (FabArray<amrex::FArrayBox> *)0x0;
  }
  else {
    local_b20 = &EBDataCollection::getVolFrac(*(EBDataCollection **)(lVar38 + 0xd8))->
                 super_FabArray<amrex::FArrayBox>;
  }
  mfi_info.num_streams = Gpu::Device::max_gpu_streams;
  mfi_info.do_tiling = true;
  mfi_info.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  mfi_info.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  mfi_info.tilesize.vect[2] = DAT_00753ec0;
  mfi_info.dynamic = true;
  mfi_info.device_sync = true;
  FArrayBox::FArrayBox(&rhs);
  FArrayBox::FArrayBox(&u);
  FArrayBox::FArrayBox(&sten);
  FArrayBox::FArrayBox(&cn);
  MFIter::MFIter(&mfi_1,(FabArrayBase *)sync_resid,&mfi_info);
  if (mfi_1.currentIndex < mfi_1.endIndex) {
    facx_2 = dVar7 * 0.027777777777777776 * dVar7;
    facy_2 = dVar8 * 0.027777777777777776 * dVar8;
    register0x000012c8 = 0;
    facz_2 = dVar9 * 0.027777777777777776 * dVar9;
    local_568._0_8_ = facy_2 + facy_2;
    local_568._8_8_ = 0;
    local_578 = facx_2 * 4.0;
    uStack_570 = 0;
    f4xm2ym2z = (local_578 - (double)local_568._0_8_) + facz_2 * -2.0;
    uStack_4e0 = 0;
    local_588 = facy_2 * 4.0;
    local_598 = facx_2 * -2.0;
    uStack_580 = 0;
    fm2x4ym2z = local_598 + local_588 + facz_2 * -2.0;
    uStack_4f0 = 0;
    fxyz = facx_2 + facy_2 + facz_2;
    uStack_500 = 0;
    local_5a8 = -facx_2;
    uStack_5a0 = 0x8000000000000000;
    local_4c8 = facz_2 + facz_2;
    fmx2y2z = ((double)local_568._0_8_ - facx_2) + local_4c8;
    uStack_510 = 0;
    local_4d8 = -facy_2;
    uStack_4d0 = 0x8000000000000000;
    uStack_4b0 = 0;
    local_5b8 = facx_2 + facx_2;
    f2xmy2z = (local_5b8 - facy_2) + local_4c8;
    register0x00001388 = 0;
    uStack_5b0 = 0;
    f2x2ymz = (local_5b8 + (double)local_568._0_8_) - facz_2;
    uStack_530 = 0;
    local_5c8 = -(double)local_568._0_8_;
    uStack_5c0 = 0x8000000000000000;
    uStack_590 = 0;
    local_5d8 = facz_2 * 4.0;
    uStack_5d0 = 0;
    fm2xm2y4z = (local_598 - (double)local_568._0_8_) + local_5d8;
    uStack_540 = 0;
    uStack_4c0 = 0;
    local_5e8 = -local_4c8;
    uStack_5e0 = 0x8000000000000000;
    uStack_4a0 = 0;
    local_5f8 = -facz_2;
    uStack_5f0 = 0x8000000000000000;
    dVar10 = *(double *)(&DAT_006ba920 + (ulong)(((int)uVar52 - 0x66U & 0xfffffffb) == 0) * 8);
    do {
      MFIter::tilebox(&local_d68,&mfi_1);
      FVar34 = regular;
      if (lVar38 != 0) {
        piVar41 = &mfi_1.currentIndex;
        if (mfi_1.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar41 = ((mfi_1.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + mfi_1.currentIndex;
        }
        this_03 = (local_9b0->m_fabs_v).
                  super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[*piVar41];
        bx_1.bigend.vect[1] = local_d68.bigend.vect[1];
        bx_1.bigend.vect[2] = local_d68.bigend.vect[2];
        bx_1.smallend.vect[1] = local_d68.smallend.vect[1];
        bx_1.smallend.vect[0] = local_d68.smallend.vect[0];
        bx_1.smallend.vect[2] = local_d68.smallend.vect[2];
        bx_1.bigend.vect[0] = local_d68.bigend.vect[0];
        lVar39 = 0;
        do {
          if ((local_d68.btype.itype >> ((uint)lVar39 & 0x1f) & 1) != 0) {
            piVar41 = bx_1.bigend.vect + lVar39;
            *piVar41 = *piVar41 + -1;
          }
          lVar39 = lVar39 + 1;
        } while (lVar39 != 3);
        bx_1.btype.itype = 0;
        FVar34 = EBCellFlagFab::getType(this_03,&bx_1);
      }
      if (FVar34 != covered) {
        local_cb8 = CONCAT44(local_cb8._4_4_,FVar34);
        bx_2.smallend.vect[0] = local_d68.smallend.vect[0] + -1;
        bx_2.smallend.vect[1] = local_d68.smallend.vect[1] + -1;
        bx_2.smallend.vect[2] = local_d68.smallend.vect[2] + -1;
        bx_2.bigend.vect[0] = local_d68.bigend.vect[0] + 1;
        bx_2.bigend.vect[1] = local_d68.bigend.vect[1] + 1;
        bx_2.bigend.vect[2] = local_d68.bigend.vect[2] + 1;
        lVar39 = 0;
        do {
          if ((local_d68.btype.itype >> ((uint)lVar39 & 0x1f) & 1) != 0) {
            piVar41 = bx_2.bigend.vect + lVar39;
            *piVar41 = *piVar41 + -1;
          }
          lVar39 = lVar39 + 1;
        } while (lVar39 != 3);
        bx_2.btype.itype = 0;
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  ((Array4<const_int> *)&bx_1,&crse_cc_mask.super_FabArray<amrex::IArrayBox>,&mfi_1)
        ;
        bVar103 = bx_2.bigend.vect[2] < bx_2.smallend.vect[2];
        if (bx_2.smallend.vect[2] <= bx_2.bigend.vect[2]) {
          lVar40 = CONCAT44(bx_1.bigend.vect[2],bx_1.bigend.vect[1]) * 4;
          lVar74 = CONCAT44(bx_1.bigend.vect[0],bx_1.smallend.vect[2]) * 4;
          lVar48 = ((long)bx_2.smallend.vect[1] - (long)(int)local_c14) * lVar74 +
                   ((long)bx_2.smallend.vect[2] - (long)(int)local_c10) * lVar40 +
                   (long)bx_2.smallend.vect[0] * 4 + (long)local_c18 * -4 + bx_1.smallend.vect._0_8_
          ;
          lVar39 = (long)bx_2.smallend.vect[2];
          do {
            lVar49 = lVar48;
            lVar56 = (long)bx_2.smallend.vect[1];
            if (bx_2.smallend.vect[1] <= bx_2.bigend.vect[1]) {
              do {
                if (bx_2.smallend.vect[0] <= bx_2.bigend.vect[0]) {
                  lVar57 = 0;
LAB_005ad5ce:
                  if (*(int *)(lVar49 + lVar57 * 4) != 0) goto code_r0x005ad5d5;
                  if (!bVar103) {
                    BATransformer::operator()
                              ((Box *)local_638,
                               (BATransformer *)
                               (CONCAT44(mfi_1.fabArray._4_4_,(int)mfi_1.fabArray) + 8),
                               (Box *)((long)((mfi_1.index_map)->
                                             super_vector<int,_std::allocator<int>_>).
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start[mfi_1.currentIndex] *
                                       0x1c + **(long **)(CONCAT44(mfi_1.fabArray._4_4_,
                                                                   (int)mfi_1.fabArray) + 0x50)));
                    bx_3.btype.itype = local_638._24_4_;
                    bx_3.bigend.vect[2] = local_638._20_4_;
                    bx_3.bigend.vect[1] = local_638._16_4_;
                    bx_3.smallend.vect[0] = local_638._0_4_;
                    bx_3.smallend.vect[1] = local_638._4_4_;
                    bx_3.smallend.vect[2] = local_638._8_4_;
                    bx_3.bigend.vect[0] = local_638._12_4_;
                    lVar39 = 0;
                    do {
                      if ((bx_3.btype.itype >> ((uint)lVar39 & 0x1f) & 1) != 0) {
                        piVar41 = bx_3.bigend.vect + lVar39;
                        *piVar41 = *piVar41 + -1;
                      }
                      lVar39 = lVar39 + 1;
                    } while (lVar39 != 3);
                    bx_3._20_8_ = bx_3._20_8_ & 0xffffffff;
                    FArrayBox::resize(&u,&bx_2,3,(Arena *)0x0);
                    DVar42 = u.super_BaseFab<double>.super_DataAllocator;
                    if (u.super_BaseFab<double>.super_DataAllocator.m_arena == (Arena *)0x0) {
                      DVar42.m_arena = The_Arena();
                    }
                    Gpu::Elixir::Elixir(&ueli,(void *)0x0,DVar42.m_arena);
                    iVar81 = u.super_BaseFab<double>.domain.smallend.vect[2];
                    iVar37 = u.super_BaseFab<double>.domain.smallend.vect[1];
                    iVar33 = u.super_BaseFab<double>.domain.smallend.vect[0];
                    pdVar32 = u.super_BaseFab<double>.dptr;
                    lVar40 = (long)u.super_BaseFab<double>.domain.smallend.vect[0];
                    lVar48 = (long)u.super_BaseFab<double>.domain.smallend.vect[1];
                    lVar49 = (long)u.super_BaseFab<double>.domain.smallend.vect[2];
                    lVar39 = (long)((u.super_BaseFab<double>.domain.bigend.vect[1] -
                                    u.super_BaseFab<double>.domain.smallend.vect[1]) + 1);
                    lVar74 = (long)((u.super_BaseFab<double>.domain.bigend.vect[2] -
                                    u.super_BaseFab<double>.domain.smallend.vect[2]) + 1);
                    uVar52 = CONCAT44(-(uint)(bx_3.smallend.vect[1] < bx_2.smallend.vect[1]),
                                      -(uint)(bx_3.smallend.vect[0] < bx_2.smallend.vect[0]));
                    uVar52 = ~uVar52 & bx_3.smallend.vect._0_8_ |
                             CONCAT44(bx_2.smallend.vect[1],bx_2.smallend.vect[0]) & uVar52;
                    lhs.smallend.vect[0] = (int)uVar52;
                    lhs.smallend.vect[1] = (int)(uVar52 >> 0x20);
                    lhs.smallend.vect[2] = bx_3.smallend.vect[2];
                    if (bx_3.smallend.vect[2] < bx_2.smallend.vect[2]) {
                      lhs.smallend.vect[2] = bx_2.smallend.vect[2];
                    }
                    uVar52 = CONCAT44(-(uint)(bx_2.bigend.vect[1] < bx_3.bigend.vect[1]),
                                      -(uint)(bx_2.bigend.vect[0] < bx_3.bigend.vect[0]));
                    uVar52 = ~uVar52 & CONCAT44(bx_3.bigend.vect[1],bx_3.bigend.vect[0]) |
                             CONCAT44(bx_2.bigend.vect[1],bx_2.bigend.vect[0]) & uVar52;
                    lhs.bigend.vect[0] = (int)uVar52;
                    lhs.bigend.vect[1] = (int)(uVar52 >> 0x20);
                    lhs.bigend.vect[2] = bx_3.bigend.vect[2];
                    if (bx_2.bigend.vect[2] < bx_3.bigend.vect[2]) {
                      lhs.bigend.vect[2] = bx_2.bigend.vect[2];
                    }
                    lhs.btype.itype = bx_2.btype.itype;
                    paVar25 = (this->super_MLNodeLinOp).super_MLLinOp.m_lobc.
                              super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                              .
                              super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    paVar26 = (this->super_MLNodeLinOp).super_MLLinOp.m_hibc.
                              super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                              .
                              super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    lVar56 = 0;
                    do {
                      if ((*(int *)((long)paVar25->_M_elems + lVar56) == 0x6a) &&
                         (iVar35 = *(int *)((long)lhs.smallend.vect + lVar56),
                         iVar35 == *(int *)((long)(domain->smallend).vect + lVar56))) {
                        *(int *)((long)lhs.smallend.vect + lVar56) = iVar35 + -1;
                      }
                      if ((*(int *)((long)paVar26->_M_elems + lVar56) == 0x6a) &&
                         (iVar35 = *(int *)((long)lhs.bigend.vect + lVar56),
                         iVar35 == *(int *)((long)(this_00->domain).bigend.vect + lVar56))) {
                        *(int *)((long)lhs.bigend.vect + lVar56) = iVar35 + 1;
                      }
                      lVar56 = lVar56 + 4;
                    } while (lVar56 != 0xc);
                    lVar57 = (long)((u.super_BaseFab<double>.domain.bigend.vect[0] -
                                    u.super_BaseFab<double>.domain.smallend.vect[0]) + 1);
                    lVar56 = lVar39 * lVar57;
                    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                              ((Array4<const_double> *)local_638,
                               &vold->super_FabArray<amrex::FArrayBox>,&mfi_1);
                    lVar60 = (long)bx_2.smallend.vect[2];
                    if (bx_2.smallend.vect[2] <= bx_2.bigend.vect[2]) {
                      lVar53 = (long)bx_2.smallend.vect[1];
                      lVar97 = (long)bx_2.smallend.vect[0];
                      lVar86 = (lVar53 * 8 + (lVar60 - lVar49) * lVar39 * 8 + lVar48 * -8) * lVar57
                               + lVar97 * 8 + lVar40 * -8 + (long)pdVar32;
                      lVar83 = ((lVar74 * 8 + lVar60 * 8 + lVar49 * -8) * lVar39 + lVar53 * 8 +
                               lVar48 * -8) * lVar57 + lVar97 * 8 + lVar40 * -8 + (long)pdVar32;
                      lVar82 = ((lVar74 * 0x10 + lVar60 * 8 + lVar49 * -8) * lVar39 + lVar53 * 8 +
                               lVar48 * -8) * lVar57 + lVar97 * 8 + lVar40 * -8 + (long)pdVar32;
                      lVar61 = lVar56 * 8;
                      lVar62 = lVar57 * 8;
                      do {
                        lVar50 = lVar53;
                        lVar63 = lVar82;
                        lVar66 = lVar83;
                        lVar87 = lVar86;
                        if (bx_2.smallend.vect[1] <= bx_2.bigend.vect[1]) {
                          do {
                            if (bx_2.smallend.vect[0] <= bx_2.bigend.vect[0]) {
                              lVar94 = (long)local_618;
                              lVar91 = (lVar60 - local_610) *
                                       CONCAT44(local_638._20_4_,local_638._16_4_);
                              lVar84 = (lVar50 - local_614) *
                                       CONCAT44(local_638._12_4_,local_638._8_4_);
                              lVar95 = 0;
                              do {
                                if ((((lVar97 + lVar95 < (long)lhs.smallend.vect[0]) ||
                                     (lVar50 < lhs.smallend.vect[1])) ||
                                    (lVar60 < lhs.smallend.vect[2])) ||
                                   ((((long)lhs.bigend.vect[0] < lVar97 + lVar95 ||
                                     (lhs.bigend.vect[1] < lVar50)) ||
                                    ((lhs.bigend.vect[2] < lVar60 ||
                                     (*(int *)((lVar50 - (int)local_c14) *
                                               CONCAT44(bx_1.bigend.vect[0],bx_1.smallend.vect[2]) *
                                               4 + (lVar60 - (int)local_c10) *
                                                   CONCAT44(bx_1.bigend.vect[2],bx_1.bigend.vect[1])
                                                   * 4 + (long)local_c18 * -4 +
                                               bx_1.smallend.vect._0_8_ + lVar97 * 4 + lVar95 * 4)
                                      == 0)))))) {
                                  *(undefined8 *)(lVar87 + lVar95 * 8) = 0;
                                  *(undefined8 *)(lVar66 + lVar95 * 8) = 0;
                                  *(undefined8 *)(lVar63 + lVar95 * 8) = 0;
                                }
                                else {
                                  *(double *)(lVar87 + lVar95 * 8) =
                                       *(double *)
                                        (local_638._0_8_ +
                                        (lVar97 + ((lVar91 + lVar84 + lVar95) - lVar94)) * 8);
                                  *(double *)(lVar66 + lVar95 * 8) =
                                       *(double *)
                                        (local_638._0_8_ +
                                        (lVar97 + ((lVar91 + lVar84 + CONCAT44(uStack_61c,
                                                                               local_638._24_4_) +
                                                                      lVar95) - lVar94)) * 8);
                                  *(double *)(lVar63 + lVar95 * 8) =
                                       *(double *)
                                        (local_638._0_8_ +
                                        (lVar97 + ((lVar91 + lVar84 + CONCAT44(uStack_61c,
                                                                               local_638._24_4_) * 2
                                                                      + lVar95) - lVar94)) * 8);
                                }
                                lVar95 = lVar95 + 1;
                              } while ((bx_2.bigend.vect[0] - bx_2.smallend.vect[0]) + 1 !=
                                       (int)lVar95);
                            }
                            lVar50 = lVar50 + 1;
                            lVar87 = lVar87 + lVar62;
                            lVar66 = lVar66 + lVar62;
                            lVar63 = lVar63 + lVar62;
                          } while (bx_2.bigend.vect[1] + 1 != (int)lVar50);
                        }
                        lVar60 = lVar60 + 1;
                        lVar86 = lVar86 + lVar61;
                        lVar83 = lVar83 + lVar61;
                        lVar82 = lVar82 + lVar61;
                      } while (bx_2.bigend.vect[2] + 1 != (int)lVar60);
                    }
                    FArrayBox::resize(&rhs,&local_d68,1,(Arena *)0x0);
                    DVar42 = rhs.super_BaseFab<double>.super_DataAllocator;
                    if (rhs.super_BaseFab<double>.super_DataAllocator.m_arena == (Arena *)0x0) {
                      DVar42.m_arena = The_Arena();
                    }
                    Gpu::Elixir::Elixir(&rhseli,(void *)0x0,DVar42.m_arena);
                    local_d08 = rhs.super_BaseFab<double>.dptr;
                    lVar61 = (long)rhs.super_BaseFab<double>.domain.smallend.vect[0];
                    local_c88 = (long)rhs.super_BaseFab<double>.domain.smallend.vect[1];
                    lVar60 = (long)rhs.super_BaseFab<double>.domain.smallend.vect[2];
                    local_cf0 = (long)((rhs.super_BaseFab<double>.domain.bigend.vect[0] -
                                       rhs.super_BaseFab<double>.domain.smallend.vect[0]) + 1);
                    local_b18 = (long)((rhs.super_BaseFab<double>.domain.bigend.vect[1] -
                                       rhs.super_BaseFab<double>.domain.smallend.vect[1]) + 1);
                    local_ca0 = local_b18 * local_cf0;
                    FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                              (&local_ae8,this_01,&mfi_1);
                    if ((int)local_cb8 == 1) {
                      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                                (&local_a68,local_b20,&mfi_1);
                      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                                (&local_958,
                                 (FabArray<amrex::FArrayBox> *)
                                 this_02.
                                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                                 .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                                 &mfi_1);
                      local_f08 = (long)local_d68.smallend.vect[2];
                      if (local_d68.smallend.vect[2] <= local_d68.bigend.vect[2]) {
                        local_ca8 = (long)local_d68.smallend.vect[1];
                        local_c90 = (long)local_d68.smallend.vect[0];
                        local_cd0 = local_c90 * 8;
                        local_cf8 = local_f08 + -1;
                        lVar83 = lVar74 * 0x10 + local_f08 * 8 + lVar49 * -8;
                        lVar62 = (lVar83 + -8) * lVar39 + local_ca8 * 8 + lVar48 * -8;
                        lVar82 = ((lVar74 + local_f08) * 8 + lVar49 * -8 + -8) * lVar39 +
                                 local_ca8 * 8 + lVar48 * -8;
                        lVar97 = local_ca8 * 8 + (local_cf8 - lVar49) * lVar39 * 8 + lVar48 * -8;
                        lVar86 = local_ca8 * 8 + lVar83 * lVar39 + lVar48 * -8;
                        lVar83 = (lVar74 * 8 + local_f08 * 8 + lVar49 * -8) * lVar39 + local_ca8 * 8
                                 + lVar48 * -8;
                        lVar74 = local_ca8 * 8 + (local_f08 - lVar49) * lVar39 * 8 + lVar48 * -8;
                        local_d28 = bx.bigend.vect[0] - local_c90;
                        local_d20 = bx.smallend.vect[0] - local_c90;
                        local_cd8 = (lVar62 + -8) * lVar57 + local_c90 * 8 + lVar40 * -8 +
                                    (long)pdVar32;
                        local_bc0 = (lVar82 + -8) * lVar57 + local_c90 * 8 + lVar40 * -8 +
                                    (long)pdVar32;
                        local_bc8 = (lVar97 + -8) * lVar57 + local_c90 * 8 + lVar40 * -8 +
                                    (long)pdVar32;
                        local_bd0 = (lVar86 + -8) * lVar57 + local_c90 * 8 + lVar40 * -8 +
                                    (long)pdVar32;
                        local_bd8 = (lVar83 + -8) * lVar57 + local_c90 * 8 + lVar40 * -8 +
                                    (long)pdVar32;
                        local_be0 = (lVar74 + -8) * lVar57 + local_c90 * 8 + lVar40 * -8 +
                                    (long)pdVar32;
                        local_be8 = lVar62 * lVar57 + local_c90 * 8 + lVar40 * -8 + (long)pdVar32;
                        local_cb0 = lVar82 * lVar57 + local_c90 * 8 + lVar40 * -8 + (long)pdVar32;
                        local_b90 = lVar97 * lVar57 + local_c90 * 8 + lVar40 * -8 + (long)pdVar32;
                        local_b98 = lVar86 * lVar57 + local_c90 * 8 + lVar40 * -8 + (long)pdVar32;
                        local_ba0 = lVar83 * lVar57 + local_c90 * 8 + lVar40 * -8 + (long)pdVar32;
                        local_ba8 = lVar74 * lVar57 + local_c90 * 8 + lVar40 * -8 + (long)pdVar32;
                        local_b08 = local_c90 * 4;
                        local_c98 = CONCAT44(local_c98._4_4_,local_d68.bigend.vect[0]);
                        local_af8 = (ulong)(uint)local_d68.bigend.vect[1];
                        local_ce8 = (long)bx.bigend.vect[2];
                        local_b00 = lVar56 * 8;
                        lVar74 = lVar57 * 8;
                        do {
                          if (local_d68.smallend.vect[1] <= local_d68.bigend.vect[1]) {
                            local_d00 = local_d08 + (local_f08 - lVar60) * local_ca0;
                            bVar72 = local_f08 == bx.smallend.vect[2] && LVar22 == inflow;
                            local_cc8 = CONCAT71(local_cc8._1_7_,bVar72);
                            bVar103 = local_f08 == local_ce8 && LVar24 == inflow;
                            local_d38 = CONCAT71(local_d38._1_7_,bVar103);
                            local_c80 = local_ae8.jstride * 4;
                            lVar62 = (long)local_ae8.p +
                                     (local_ca8 - local_ae8.begin.y) * local_c80 +
                                     (local_f08 - local_ae8.begin.z) * local_ae8.kstride * 4 +
                                     (long)local_ae8.begin.x * -4 + local_b08;
                            local_e18 = local_ba8;
                            local_ec8 = local_ba0;
                            local_ed0 = local_b98;
                            local_e80 = local_b90;
                            local_f58 = (double *)local_cb0;
                            local_ed8 = local_be8;
                            local_e20 = local_be0;
                            local_e28 = local_bd8;
                            local_e30 = local_bd0;
                            local_e38 = local_bc8;
                            local_dd8 = local_bc0;
                            local_de0 = local_cd8;
                            local_f50 = local_ca8;
                            local_dd0 = local_ca8 + -1;
                            do {
                              if (local_d68.smallend.vect[0] <= local_d68.bigend.vect[0]) {
                                bVar47 = local_f50 == bx.smallend.vect[1] && (int)local_cc0 == 0x6a;
                                local_d30 = CONCAT71(local_d30._1_7_,bVar47);
                                lVar64 = (long)local_958.begin.x;
                                lVar88 = (local_cf8 - local_958.begin.z) * local_958.kstride * 8;
                                lVar95 = (local_dd0 - local_958.begin.y) * local_958.jstride * 8;
                                lVar82 = lVar88 + lVar95;
                                lVar98 = local_958.nstride * 0x38;
                                lVar83 = (local_f08 - local_958.begin.z) * local_958.kstride * 8;
                                lVar95 = lVar95 + lVar83;
                                lVar67 = (local_f50 - local_958.begin.y) * local_958.jstride * 8;
                                lVar88 = lVar88 + lVar67;
                                lVar67 = lVar67 + lVar83;
                                lVar77 = local_958.nstride * 0x10;
                                lVar83 = local_958.nstride * 0x30;
                                lVar51 = local_958.nstride * 0x40;
                                lVar97 = lVar83 + lVar82 + lVar64 * -8 + local_cd0;
                                lVar86 = lVar98 + lVar82 + lVar64 * -8 + local_cd0;
                                lVar53 = lVar82 + lVar64 * -8 + local_cd0;
                                lVar50 = lVar51 + lVar82 + lVar64 * -8 + local_cd0;
                                lVar63 = lVar77 + lVar82 + lVar64 * -8 + local_cd0;
                                lVar82 = local_958.nstride * 8 + lVar82 + lVar64 * -8 + local_cd0;
                                lVar66 = lVar95 + lVar83 + lVar64 * -8 + local_cd0;
                                lVar87 = lVar95 + lVar98 + lVar64 * -8 + local_cd0;
                                lVar84 = lVar95 + lVar64 * -8 + local_cd0;
                                lVar91 = lVar95 + lVar51 + lVar64 * -8 + local_cd0;
                                lVar94 = lVar95 + lVar77 + lVar64 * -8 + local_cd0;
                                lVar95 = lVar95 + local_958.nstride * 8 + lVar64 * -8 + local_cd0;
                                lVar78 = lVar88 + lVar83 + lVar64 * -8 + local_cd0;
                                lVar45 = lVar88 + lVar98 + lVar64 * -8 + local_cd0;
                                local_d18 = (long)local_958.p + lVar88 + lVar64 * -8 + local_cd0;
                                lVar46 = lVar88 + lVar51 + lVar64 * -8 + local_cd0;
                                local_d10 = (long)local_958.p +
                                            lVar88 + lVar77 + lVar64 * -8 + local_cd0;
                                lVar88 = lVar88 + local_958.nstride * 8 + lVar64 * -8 + local_cd0;
                                lVar83 = lVar83 + lVar67 + lVar64 * -8 + local_cd0;
                                lVar98 = lVar98 + lVar67 + lVar64 * -8 + local_cd0;
                                lVar71 = lVar67 + lVar64 * -8 + local_cd0;
                                lVar51 = lVar51 + lVar67 + lVar64 * -8 + local_cd0;
                                local_ce0 = (long)local_958.p +
                                            lVar77 + lVar67 + lVar64 * -8 + local_cd0;
                                lVar64 = lVar67 + local_958.nstride * 8 + lVar64 * -8 + local_cd0;
                                lVar68 = (local_cf8 - local_a68.begin.z) * local_a68.kstride * 8;
                                lVar43 = (local_f08 - local_a68.begin.z) * local_a68.kstride * 8;
                                lVar77 = (local_dd0 - local_a68.begin.y) * local_a68.jstride * 8;
                                lVar92 = (local_f50 - local_a68.begin.y) * local_a68.jstride * 8;
                                lVar44 = (long)local_a68.begin.x;
                                lVar67 = lVar68 + lVar77 + lVar44 * -8 + local_cd0;
                                lVar77 = lVar77 + lVar43 + lVar44 * -8 + local_cd0;
                                lVar68 = lVar68 + lVar92 + lVar44 * -8 + local_cd0;
                                lVar43 = lVar92 + lVar43 + lVar44 * -8 + local_cd0;
                                uVar52 = 0;
                                do {
                                  dVar110 = 0.0;
                                  if (*(int *)(lVar62 + uVar52 * 4) == 0) {
                                    dVar119 = 1.0;
                                    dVar110 = dVar119;
                                    if (LVar21 == Neumann) {
                                      if (local_d20 == uVar52) {
LAB_005ae6aa:
                                        dVar110 = 0.0;
                                      }
                                    }
                                    else if (LVar21 == inflow && local_d20 == uVar52)
                                    goto LAB_005ae6aa;
                                    dVar127 = dVar119;
                                    if ((((int)local_af0 == 0x66) || ((int)local_af0 == 0x6a)) &&
                                       (local_d28 == uVar52)) {
                                      dVar127 = 0.0;
                                    }
                                    dVar128 = dVar119;
                                    if ((int)local_cc0 == 0x66) {
                                      if (local_f50 == bx.smallend.vect[1]) {
LAB_005ae70a:
                                        dVar128 = 0.0;
                                      }
                                    }
                                    else if (bVar47) goto LAB_005ae70a;
                                    dVar118 = dVar119;
                                    if (LVar23 == Neumann) {
                                      if (local_f50 == bx.bigend.vect[1]) {
LAB_005ae73f:
                                        dVar118 = 0.0;
                                      }
                                    }
                                    else if (local_f50 == bx.bigend.vect[1] && LVar23 == inflow)
                                    goto LAB_005ae73f;
                                    dVar133 = dVar119;
                                    if (LVar22 == Neumann) {
                                      if (local_f08 == bx.smallend.vect[2]) {
LAB_005ae76b:
                                        dVar133 = 0.0;
                                      }
                                    }
                                    else if (bVar72) goto LAB_005ae76b;
                                    if (LVar24 == Neumann) {
                                      if (local_f08 == local_ce8) {
LAB_005ae7a7:
                                        dVar119 = 0.0;
                                      }
                                    }
                                    else if (bVar103) goto LAB_005ae7a7;
                                    dVar11 = *(double *)
                                              ((long)local_958.p + uVar52 * 8 + lVar95 + -8);
                                    dVar104 = *(double *)((long)local_958.p + uVar52 * 8 + lVar95);
                                    dVar112 = *(double *)
                                               ((long)local_a68.p + uVar52 * 8 + lVar77 + -8);
                                    dVar121 = *(double *)((long)local_a68.p + uVar52 * 8 + lVar77);
                                    dVar113 = *(double *)
                                               ((long)local_958.p + uVar52 * 8 + lVar94 + -8);
                                    dVar113 = dVar113 + dVar113;
                                    dVar114 = *(double *)((long)local_958.p + uVar52 * 8 + lVar94);
                                    dVar104 = dVar104 + dVar104;
                                    dVar114 = dVar114 + dVar114;
                                    dVar105 = *(double *)
                                               ((long)local_958.p + uVar52 * 8 + lVar64 + -8);
                                    dVar12 = *(double *)
                                              ((long)local_a68.p + uVar52 * 8 + lVar43 + -8);
                                    dVar105 = dVar105 + dVar105;
                                    dVar138 = *(double *)
                                               ((long)local_958.p + uVar52 * 8 + lVar71 + -8);
                                    dVar130 = dVar138 + dVar138 + dVar12;
                                    dVar138 = *(double *)(local_ce0 + -8 + uVar52 * 8);
                                    dVar138 = dVar138 + dVar138;
                                    dVar106 = *(double *)((long)local_958.p + uVar52 * 8 + lVar64) *
                                              -2.0;
                                    dVar13 = *(double *)((long)local_a68.p + uVar52 * 8 + lVar43);
                                    dVar125 = *(double *)(local_ce0 + uVar52 * 8) * -2.0;
                                    dVar107 = *(double *)
                                               ((long)local_958.p + uVar52 * 8 + lVar82 + -8) * -2.0
                                    ;
                                    dVar14 = *(double *)
                                              ((long)local_a68.p + uVar52 * 8 + lVar67 + -8);
                                    dVar115 = *(double *)
                                               ((long)local_958.p + uVar52 * 8 + lVar63 + -8) * -2.0
                                    ;
                                    dVar108 = *(double *)((long)local_958.p + uVar52 * 8 + lVar82);
                                    dVar108 = dVar108 + dVar108;
                                    dVar109 = *(double *)((long)local_958.p + uVar52 * 8 + lVar53);
                                    dVar15 = *(double *)((long)local_a68.p + uVar52 * 8 + lVar67);
                                    dVar131 = (dVar109 + dVar109) - dVar15;
                                    dVar109 = *(double *)((long)local_958.p + uVar52 * 8 + lVar63);
                                    dVar109 = dVar109 + dVar109;
                                    dVar116 = *(double *)
                                               ((long)local_958.p + uVar52 * 8 + lVar88 + -8);
                                    dVar116 = dVar116 + dVar116;
                                    dVar16 = *(double *)(local_d18 + -8 + uVar52 * 8);
                                    dVar17 = *(double *)
                                              ((long)local_a68.p + uVar52 * 8 + lVar68 + -8);
                                    dVar117 = *(double *)(local_d10 + -8 + uVar52 * 8);
                                    dVar117 = dVar117 + dVar117;
                                    dVar126 = *(double *)((long)local_958.p + uVar52 * 8 + lVar88);
                                    dVar126 = dVar126 + dVar126;
                                    dVar137 = *(double *)(local_d18 + uVar52 * 8);
                                    dVar137 = dVar137 + dVar137;
                                    dVar18 = *(double *)((long)local_a68.p + uVar52 * 8 + lVar68);
                                    dVar136 = *(double *)(local_d10 + uVar52 * 8);
                                    dVar136 = dVar136 + dVar136;
                                    dVar19 = *(double *)
                                              ((long)local_958.p + uVar52 * 8 + lVar84 + -8);
                                    dVar134 = *(double *)((long)local_958.p + uVar52 * 8 + lVar84);
                                    dVar134 = dVar134 + dVar134;
                                    dVar135 = *(double *)((long)local_958.p + uVar52 * 8 + lVar71);
                                    dVar139 = dVar13 - (dVar135 + dVar135);
                                    dVar135 = *(double *)
                                               ((long)local_958.p + uVar52 * 8 + lVar53 + -8) * -2.0
                                              - dVar14;
                                    dVar110 = ((*(double *)((long)local_958.p + uVar52 * 8 + lVar78)
                                                * -4.0 + (dVar137 - dVar18) + dVar126) *
                                               *(double *)(local_ed8 + uVar52 * 8) * dVar127 *
                                               dVar118 +
                                              (*(double *)
                                                ((long)local_958.p + uVar52 * 8 + lVar78 + -8) * 4.0
                                              + (dVar16 * -2.0 - dVar17) + dVar116) *
                                              *(double *)(local_ed8 + -8 + uVar52 * 8) * dVar110 *
                                              dVar118 + (*(double *)
                                                          ((long)local_958.p + uVar52 * 8 + lVar97)
                                                         * 4.0 + (dVar131 - dVar108)) *
                                                        *(double *)(local_de0 + uVar52 * 8) *
                                                        dVar127 * dVar128 +
                                                        (*(double *)
                                                          ((long)local_958.p +
                                                          uVar52 * 8 + lVar97 + -8) * -4.0 +
                                                        dVar135 + dVar107) *
                                                        *(double *)(local_de0 + -8 + uVar52 * 8) *
                                                        dVar110 * dVar128 +
                                                        (*(double *)
                                                          ((long)local_958.p + uVar52 * 8 + lVar83)
                                                         * 4.0 + dVar139 + dVar106) *
                                                        *(double *)(local_ed0 + uVar52 * 8) *
                                                        dVar127 * dVar118 +
                                                        (*(double *)
                                                          ((long)local_958.p +
                                                          uVar52 * 8 + lVar83 + -8) * -4.0 +
                                                        (dVar130 - dVar105)) *
                                                        *(double *)(local_ed0 + -8 + uVar52 * 8) *
                                                        dVar110 * dVar118 +
                                                        (*(double *)
                                                          ((long)local_958.p +
                                                          uVar52 * 8 + lVar66 + -8) * 4.0 +
                                                        dVar11 + dVar11 + dVar19 + dVar19 + dVar112)
                                                        * *(double *)(local_e30 + -8 + uVar52 * 8) *
                                                        dVar110 * dVar128 +
                                                        (*(double *)
                                                          ((long)local_958.p + uVar52 * 8 + lVar66)
                                                         * -4.0 + (dVar121 - dVar134) + dVar104) *
                                                        *(double *)(local_e30 + uVar52 * 8) *
                                                        dVar127 * dVar128) * dVar9 * 0.25 +
                                              ((*(double *)((long)local_958.p + uVar52 * 8 + lVar46)
                                                * -4.0 + (dVar18 - dVar126) + dVar136) *
                                               *(double *)(local_e80 + uVar52 * 8) * dVar118 *
                                               dVar133 +
                                              (*(double *)
                                                ((long)local_958.p + uVar52 * 8 + lVar46 + -8) * 4.0
                                              + ((dVar116 - dVar17) - dVar117)) *
                                              *(double *)(local_e80 + -8 + uVar52 * 8) * dVar118 *
                                              dVar133 + (*(double *)
                                                          ((long)local_958.p + uVar52 * 8 + lVar50)
                                                         * 4.0 + dVar108 + dVar15 + dVar109) *
                                                        *(double *)(local_e38 + uVar52 * 8) *
                                                        dVar128 * dVar133 +
                                                        (*(double *)
                                                          ((long)local_958.p +
                                                          uVar52 * 8 + lVar50 + -8) * -4.0 +
                                                        (dVar107 - dVar14) + dVar115) *
                                                        *(double *)(local_e38 + -8 + uVar52 * 8) *
                                                        dVar128 * dVar133 +
                                                        (*(double *)
                                                          ((long)local_958.p + uVar52 * 8 + lVar51)
                                                         * 4.0 + dVar106 + dVar13 + dVar125) *
                                                        *(double *)(local_e18 + uVar52 * 8) *
                                                        dVar118 * dVar119 +
                                                        (*(double *)
                                                          ((long)local_958.p +
                                                          uVar52 * 8 + lVar51 + -8) * -4.0 +
                                                        (dVar105 - dVar12) + dVar138) *
                                                        *(double *)(local_e18 + -8 + uVar52 * 8) *
                                                        dVar118 * dVar119 +
                                                        (*(double *)
                                                          ((long)local_958.p +
                                                          uVar52 * 8 + lVar91 + -8) * 4.0 +
                                                        (dVar11 * -2.0 - dVar112) + dVar113) *
                                                        *(double *)(local_e20 + -8 + uVar52 * 8) *
                                                        dVar128 * dVar119 +
                                                        (*(double *)
                                                          ((long)local_958.p + uVar52 * 8 + lVar91)
                                                         * -4.0 + ((dVar104 + dVar121) - dVar114)) *
                                                        *(double *)(local_e20 + uVar52 * 8) *
                                                        dVar128 * dVar119) * dVar7 * 0.25 +
                                              ((*(double *)((long)local_958.p + uVar52 * 8 + lVar45)
                                                * -4.0 + (dVar18 - dVar137) + dVar136) *
                                               *(double *)((long)local_f58 + uVar52 * 8) * dVar127 *
                                               dVar133 +
                                              (*(double *)
                                                ((long)local_958.p + uVar52 * 8 + lVar45 + -8) * 4.0
                                              + dVar16 + dVar16 + dVar17 + dVar117) *
                                              *(double *)((long)local_f58 + -8 + uVar52 * 8) *
                                              dVar110 * dVar133 +
                                              (*(double *)((long)local_958.p + uVar52 * 8 + lVar86)
                                               * 4.0 + (dVar131 - dVar109)) *
                                              *(double *)(local_dd8 + uVar52 * 8) * dVar127 *
                                              dVar133 + (*(double *)
                                                          ((long)local_958.p +
                                                          uVar52 * 8 + lVar86 + -8) * -4.0 +
                                                        dVar115 + dVar135) *
                                                        *(double *)(local_dd8 + -8 + uVar52 * 8) *
                                                        dVar110 * dVar133 +
                                                        (*(double *)
                                                          ((long)local_958.p + uVar52 * 8 + lVar98)
                                                         * 4.0 + dVar125 + dVar139) *
                                                        *(double *)(local_ec8 + uVar52 * 8) *
                                                        dVar127 * dVar119 +
                                                        (*(double *)
                                                          ((long)local_958.p +
                                                          uVar52 * 8 + lVar98 + -8) * -4.0 +
                                                        (dVar130 - dVar138)) *
                                                        *(double *)(local_ec8 + -8 + uVar52 * 8) *
                                                        dVar110 * dVar119 +
                                                        (*(double *)
                                                          ((long)local_958.p +
                                                          uVar52 * 8 + lVar87 + -8) * 4.0 +
                                                        (dVar19 * -2.0 - dVar112) + dVar113) *
                                                        *(double *)(local_e28 + -8 + uVar52 * 8) *
                                                        dVar110 * dVar119 +
                                                        (*(double *)
                                                          ((long)local_958.p + uVar52 * 8 + lVar87)
                                                         * -4.0 + (dVar134 - dVar121) + dVar114) *
                                                        *(double *)(local_e28 + uVar52 * 8) *
                                                        dVar127 * dVar119) * dVar8 * 0.25;
                                  }
                                  local_d00[(local_f50 - local_c88) * local_cf0 +
                                            ((local_c90 + uVar52) - lVar61)] = dVar110;
                                  uVar52 = uVar52 + 1;
                                  local_d40 = lVar62;
                                } while ((local_d68.bigend.vect[0] - local_d68.smallend.vect[0]) + 1
                                         != (int)uVar52);
                              }
                              local_f50 = local_f50 + 1;
                              local_dd0 = local_dd0 + 1;
                              local_de0 = local_de0 + lVar74;
                              local_dd8 = local_dd8 + lVar74;
                              local_e38 = local_e38 + lVar74;
                              local_e30 = local_e30 + lVar74;
                              local_e28 = local_e28 + lVar74;
                              local_e20 = local_e20 + lVar74;
                              local_ed8 = local_ed8 + lVar74;
                              local_f58 = (double *)((long)local_f58 + lVar74);
                              local_e80 = local_e80 + lVar74;
                              local_ed0 = local_ed0 + lVar74;
                              local_ec8 = local_ec8 + lVar74;
                              local_e18 = local_e18 + lVar74;
                              lVar62 = lVar62 + local_c80;
                            } while (local_d68.bigend.vect[1] + 1U != (int)local_f50);
                          }
                          local_f08 = local_f08 + 1;
                          local_cf8 = local_cf8 + 1;
                          local_cd8 = local_cd8 + local_b00;
                          local_bc0 = local_bc0 + local_b00;
                          local_bc8 = local_bc8 + local_b00;
                          local_bd0 = local_bd0 + local_b00;
                          local_bd8 = local_bd8 + local_b00;
                          local_be0 = local_be0 + local_b00;
                          local_be8 = local_be8 + local_b00;
                          local_cb0 = local_cb0 + local_b00;
                          local_b90 = local_b90 + local_b00;
                          local_b98 = local_b98 + local_b00;
                          local_ba0 = local_ba0 + local_b00;
                          local_ba8 = local_ba8 + local_b00;
                        } while (local_d68.bigend.vect[2] + 1 != (int)local_f08);
                      }
                    }
                    else {
                      local_fd0 = (long)local_d68.smallend.vect[2];
                      if (local_d68.smallend.vect[2] <= local_d68.bigend.vect[2]) {
                        lVar83 = lVar56 * lVar74;
                        lVar66 = (long)local_d68.smallend.vect[1];
                        lVar63 = (long)local_d68.smallend.vect[0];
                        lVar86 = (lVar74 * 0x10 + local_fd0 * 8 + lVar49 * -8) * lVar39;
                        lVar82 = (lVar74 * 8 + local_fd0 * 8 + lVar49 * -8) * lVar39;
                        lVar53 = (local_fd0 - lVar49) * lVar39;
                        lVar50 = lVar66 * 8 + lVar48 * -8;
                        pdVar99 = pdVar32 + (lVar63 - lVar40);
                        lVar97 = lVar39 * 8 * lVar57;
                        iVar35 = ~iVar81 + local_d68.smallend.vect[2];
                        local_eb8 = (lVar86 + lVar66 * 8 + lVar48 * -8) * lVar57 + lVar63 * 8 +
                                    lVar40 * -8 + (long)pdVar32;
                        local_e88 = (lVar82 + lVar66 * 8 + lVar48 * -8) * lVar57 + lVar63 * 8 +
                                    lVar40 * -8 + (long)pdVar32;
                        local_e90 = (lVar66 * 8 + lVar53 * 8 + lVar48 * -8) * lVar57 + lVar63 * 8 +
                                    lVar40 * -8 + (long)pdVar32;
                        lVar62 = lVar57 * 8;
                        local_f58 = pdVar99;
                        do {
                          if (local_d68.smallend.vect[1] <= local_d68.bigend.vect[1]) {
                            lVar78 = (long)iVar35;
                            lVar45 = (lVar74 * 0x10 + lVar78 * 8) * lVar39;
                            lVar88 = (lVar74 * 8 + lVar78 * 8) * lVar39;
                            lVar78 = lVar78 * lVar39 * 8;
                            local_fe8 = (double *)((lVar45 + lVar50) * lVar57 + (long)pdVar99);
                            local_fd8 = (double *)((lVar50 + lVar88) * lVar57 + (long)pdVar99);
                            local_fc0 = (double *)((lVar50 + lVar78) * lVar57 + (long)pdVar99);
                            lVar46 = (~iVar81 + (int)local_fd0) * lVar56;
                            lVar95 = (local_fd0 - lVar49) * lVar56;
                            lVar98 = (long)local_ae8.p +
                                     (lVar66 - local_ae8.begin.y) * local_ae8.jstride * 4 +
                                     (local_fd0 - local_ae8.begin.z) * local_ae8.kstride * 4 +
                                     (long)local_ae8.begin.x * -4 + lVar63 * 4;
                            lVar87 = local_e90;
                            lVar84 = local_eb8;
                            lVar91 = lVar66;
                            lVar94 = local_e88;
                            iVar73 = ~iVar37 + local_d68.smallend.vect[1];
                            do {
                              if (local_d68.smallend.vect[0] <= local_d68.bigend.vect[0]) {
                                lVar71 = (long)iVar73;
                                lVar51 = (~iVar37 + (int)lVar91) * lVar57;
                                lVar64 = (lVar91 - lVar48) * lVar57;
                                lVar67 = 0;
                                do {
                                  dVar110 = 0.0;
                                  if (*(int *)(lVar98 + lVar67 * 4) == 0) {
                                    if (LVar21 == Neumann) {
                                      dVar110 = 1.0;
                                      if (bx.smallend.vect[0] - lVar63 == lVar67) {
LAB_005af7a3:
                                        dVar110 = 0.0;
                                      }
                                    }
                                    else {
                                      dVar110 = 1.0;
                                      if (LVar21 == inflow && bx.smallend.vect[0] - lVar63 == lVar67
                                         ) goto LAB_005af7a3;
                                    }
                                    if ((((int)local_af0 == 0x66) ||
                                        (dVar119 = 1.0, (int)local_af0 == 0x6a)) &&
                                       (dVar119 = 1.0, bx.bigend.vect[0] - lVar63 == lVar67)) {
                                      dVar119 = 0.0;
                                    }
                                    if ((int)local_cc0 == 0x66) {
                                      dVar127 = 1.0;
                                      if (lVar91 == bx.smallend.vect[1]) {
LAB_005af7f9:
                                        dVar127 = 0.0;
                                      }
                                    }
                                    else {
                                      dVar127 = 1.0;
                                      if (lVar91 == bx.smallend.vect[1] && (int)local_cc0 == 0x6a)
                                      goto LAB_005af7f9;
                                    }
                                    if (LVar23 == Neumann) {
                                      dVar128 = 1.0;
                                      if (lVar91 == bx.bigend.vect[1]) {
LAB_005af825:
                                        dVar128 = 0.0;
                                      }
                                    }
                                    else {
                                      dVar128 = 1.0;
                                      if (lVar91 == bx.bigend.vect[1] && LVar23 == inflow)
                                      goto LAB_005af825;
                                    }
                                    if (LVar22 == Neumann) {
                                      dVar118 = 1.0;
                                      if (local_fd0 == bx.smallend.vect[2]) {
LAB_005af856:
                                        dVar118 = 0.0;
                                      }
                                    }
                                    else {
                                      dVar118 = 1.0;
                                      if (local_fd0 == bx.smallend.vect[2] && LVar22 == inflow)
                                      goto LAB_005af856;
                                    }
                                    dVar133 = 1.0;
                                    if (LVar24 == Neumann) {
                                      if (local_fd0 == bx.bigend.vect[2]) {
LAB_005af88f:
                                        dVar133 = 0.0;
                                      }
                                    }
                                    else if (local_fd0 == bx.bigend.vect[2] && LVar24 == inflow)
                                    goto LAB_005af88f;
                                    lVar77 = (long)(~iVar33 + local_d68.smallend.vect[0] +
                                                   (int)lVar67);
                                    pdVar76 = pdVar32 + lVar51 + lVar77 + lVar46;
                                    pdVar1 = pdVar32 + lVar64 + lVar77 + lVar46;
                                    pdVar2 = pdVar32 + lVar51 + lVar77 + lVar95;
                                    pdVar3 = pdVar32 + lVar64 + lVar77 + lVar95;
                                    dVar110 = (dVar119 * *(double *)(lVar84 + lVar67 * 8) * dVar128
                                              + dVar110 * pdVar3[lVar83 * 2] * dVar128 +
                                                *(double *)
                                                 ((long)local_f58 +
                                                 lVar67 * 8 + (lVar86 + lVar71 * 8) * lVar57) *
                                                dVar119 * dVar127 +
                                                pdVar2[lVar83 * 2] * dVar110 * dVar127 +
                                                (((-pdVar76[lVar83 * 2] * dVar110 * dVar127 -
                                                  *(double *)
                                                   ((long)pdVar99 +
                                                   lVar67 * 8 + (lVar45 + lVar71 * 8) * lVar57) *
                                                  dVar119 * dVar127) -
                                                 pdVar1[lVar83 * 2] * dVar110 * dVar128) -
                                                local_fe8[lVar67] * dVar119 * dVar128)) *
                                              dVar9 * 0.25 +
                                              (*(double *)(lVar87 + lVar67 * 8) * dVar128 * dVar133
                                              + ((*(double *)
                                                   ((long)local_f58 +
                                                   lVar67 * 8 + (lVar53 * 8 + lVar71 * 8) * lVar57)
                                                  * dVar127 * dVar133 +
                                                 ((local_fc0[lVar67] * dVar128 * dVar118 +
                                                  ((*(double *)
                                                     ((long)pdVar99 +
                                                     lVar67 * 8 + (lVar78 + lVar71 * 8) * lVar57) *
                                                    dVar127 * dVar118 - *pdVar76 * dVar127 * dVar118
                                                   ) - *pdVar1 * dVar128 * dVar118)) -
                                                 *pdVar2 * dVar127 * dVar133)) -
                                                *pdVar3 * dVar128 * dVar133)) * dVar7 * 0.25 +
                                              (*(double *)(lVar94 + lVar67 * 8) * dVar119 * dVar133
                                              + pdVar3[lVar83] * dVar110 * dVar133 +
                                                (((local_fd8[lVar67] * dVar119 * dVar118 +
                                                  pdVar1[lVar83] * dVar110 * dVar118 +
                                                  (-pdVar76[lVar83] * dVar110 * dVar118 -
                                                  *(double *)
                                                   ((long)pdVar99 +
                                                   lVar67 * 8 + (lVar88 + lVar71 * 8) * lVar57) *
                                                  dVar119 * dVar118)) -
                                                 pdVar2[lVar83] * dVar110 * dVar133) -
                                                *(double *)
                                                 ((long)local_f58 +
                                                 lVar67 * 8 + (lVar82 + lVar71 * 8) * lVar57) *
                                                dVar119 * dVar133)) * dVar8 * 0.25;
                                  }
                                  local_d08[(local_fd0 - lVar60) * local_ca0 +
                                            (lVar91 - local_c88) * local_cf0 +
                                            ((lVar63 + lVar67) - lVar61)] = dVar110;
                                  lVar67 = lVar67 + 1;
                                } while ((local_d68.bigend.vect[0] - local_d68.smallend.vect[0]) + 1
                                         != (int)lVar67);
                              }
                              lVar91 = lVar91 + 1;
                              lVar98 = lVar98 + local_ae8.jstride * 4;
                              iVar73 = iVar73 + 1;
                              lVar84 = lVar84 + lVar62;
                              lVar94 = lVar94 + lVar62;
                              lVar87 = lVar87 + lVar62;
                              local_fe8 = local_fe8 + lVar57;
                              local_fd8 = local_fd8 + lVar57;
                              local_fc0 = local_fc0 + lVar57;
                            } while (local_d68.bigend.vect[1] + 1U != (int)lVar91);
                          }
                          local_fd0 = local_fd0 + 1;
                          local_f58 = (double *)((long)local_f58 + lVar97);
                          iVar35 = iVar35 + 1;
                          local_eb8 = local_eb8 + lVar97;
                          local_e88 = local_e88 + lVar97;
                          local_e90 = local_e90 + lVar97;
                        } while (local_d68.bigend.vect[2] + 1 != (int)local_fd0);
                      }
                    }
                    if (rhcc != (MultiFab *)0x0) {
                      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                                (&local_a68,&rhcc->super_FabArray<amrex::FArrayBox>,&mfi_1);
                      lVar74 = (long)bx_2.smallend.vect[2];
                      if (bx_2.smallend.vect[2] <= bx_2.bigend.vect[2]) {
                        iVar35 = bx_3.bigend.vect[2];
                        if (bx_2.bigend.vect[2] < bx_3.bigend.vect[2]) {
                          iVar35 = bx_2.bigend.vect[2];
                        }
                        if (bx_2.bigend.vect[1] < bx_3.bigend.vect[1]) {
                          bx_3.bigend.vect[1] = bx_2.bigend.vect[1];
                        }
                        if (bx_2.bigend.vect[0] < bx_3.bigend.vect[0]) {
                          bx_3.bigend.vect[0] = bx_2.bigend.vect[0];
                        }
                        if (bx_3.smallend.vect[2] < bx_2.smallend.vect[2]) {
                          bx_3.smallend.vect[2] = bx_2.smallend.vect[2];
                        }
                        iVar73 = bx_3.smallend.vect[1];
                        if (bx_3.smallend.vect[1] < bx_2.smallend.vect[1]) {
                          iVar73 = bx_2.smallend.vect[1];
                        }
                        lVar62 = (long)bx_2.smallend.vect[0];
                        iVar59 = bx_3.smallend.vect[0];
                        if (bx_3.smallend.vect[0] < bx_2.smallend.vect[0]) {
                          iVar59 = bx_2.smallend.vect[0];
                        }
                        do {
                          if (bx_2.smallend.vect[1] <= bx_2.bigend.vect[1]) {
                            lVar82 = (long)bx_2.smallend.vect[1];
                            do {
                              if (bx_2.smallend.vect[0] <= bx_2.bigend.vect[0]) {
                                lVar83 = 0;
                                do {
                                  dVar110 = 0.0;
                                  if (((((long)iVar59 <= lVar62 + lVar83) && (iVar73 <= lVar82)) &&
                                      ((bx_3.smallend.vect[2] <= lVar74 &&
                                       ((lVar62 + lVar83 <= (long)bx_3.bigend.vect[0] &&
                                        (lVar82 <= bx_3.bigend.vect[1])))))) &&
                                     ((lVar74 <= iVar35 &&
                                      (*(int *)((lVar82 - (int)local_c14) *
                                                CONCAT44(bx_1.bigend.vect[0],bx_1.smallend.vect[2])
                                                * 4 + (lVar74 - (int)local_c10) *
                                                      CONCAT44(bx_1.bigend.vect[2],
                                                               bx_1.bigend.vect[1]) * 4 +
                                                (long)local_c18 * -4 +
                                                bx_1.smallend.vect._0_8_ + lVar62 * 4 + lVar83 * 4)
                                       != 0)))) {
                                    dVar110 = local_a68.p
                                              [lVar62 + (((lVar74 - local_a68.begin.z) *
                                                          local_a68.kstride +
                                                         (lVar82 - local_a68.begin.y) *
                                                         local_a68.jstride + lVar83) -
                                                        (long)local_a68.begin.x)];
                                  }
                                  pdVar32[(lVar74 - lVar49) * lVar56 +
                                          (lVar82 - lVar48) * lVar57 + ((lVar62 + lVar83) - lVar40)]
                                       = dVar110;
                                  lVar83 = lVar83 + 1;
                                } while ((bx_2.bigend.vect[0] - bx_2.smallend.vect[0]) + 1 !=
                                         (int)lVar83);
                              }
                              lVar82 = lVar82 + 1;
                            } while (bx_2.bigend.vect[1] + 1 != (int)lVar82);
                          }
                          lVar74 = lVar74 + 1;
                        } while (bx_2.bigend.vect[2] + 1 != (int)lVar74);
                      }
                      if ((int)local_cb8 == 1) {
                        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                                  (&local_958,local_b20,&mfi_1);
                        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                                  ((Array4<const_double> *)&bx_6,
                                   (FabArray<amrex::FArrayBox> *)
                                   this_02.
                                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                                   .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                                   &mfi_1);
                        local_f58 = (double *)(long)local_d68.smallend.vect[2];
                        if (local_d68.smallend.vect[2] <= local_d68.bigend.vect[2]) {
                          lVar83 = (long)local_d68.smallend.vect[1];
                          lVar97 = (long)local_d68.smallend.vect[0];
                          lVar74 = lVar83 * 8;
                          lVar62 = lVar97 * 8;
                          local_e68 = (lVar74 + ((long)local_f58 - lVar60) * local_b18 * 8 +
                                      local_c88 * -8) * local_cf0 + lVar97 * 8 + lVar61 * -8 +
                                      (long)local_d08;
                          local_e40 = (long)local_f58 + -1;
                          lVar82 = lVar74 + (local_e40 - lVar49) * lVar39 * 8 + lVar48 * -8;
                          local_eb8 = lVar82 * lVar57 + lVar97 * 8 + lVar40 * -8 + (long)pdVar32;
                          lVar74 = lVar74 + ((long)local_f58 - lVar49) * lVar39 * 8 + lVar48 * -8;
                          local_e88 = lVar74 * lVar57 + lVar97 * 8 + lVar40 * -8 + (long)pdVar32;
                          local_e90 = (lVar82 + -8) * lVar57 + lVar97 * 8 + lVar40 * -8 +
                                      (long)pdVar32;
                          local_ef8 = (lVar74 + -8) * lVar57 + lVar97 * 8 + lVar40 * -8 +
                                      (long)pdVar32;
                          lVar74 = lVar56 * 8;
                          lVar82 = lVar57 * 8;
                          do {
                            if (local_d68.smallend.vect[1] <= local_d68.bigend.vect[1]) {
                              local_1000 = (long)local_ae8.p +
                                           (lVar83 - local_ae8.begin.y) * local_ae8.jstride * 4 +
                                           ((long)local_f58 - (long)local_ae8.begin.z) *
                                           local_ae8.kstride * 4 + (long)local_ae8.begin.x * -4 +
                                           lVar97 * 4;
                              local_fd8 = (double *)local_ef8;
                              local_fc0 = (double *)local_e90;
                              local_fe0 = local_e88;
                              local_fc8 = (double *)local_eb8;
                              lVar86 = local_e68;
                              local_ed0 = lVar83;
                              local_e80 = lVar83 + -1;
                              do {
                                if (local_d68.smallend.vect[0] <= local_d68.bigend.vect[0]) {
                                  lVar50 = (long)local_958.begin.x;
                                  lVar71 = CONCAT44(uStack_9ec,bx_6.btype.itype);
                                  lVar53 = (local_e40 - local_958.begin.z) * local_958.kstride * 8;
                                  lVar63 = (local_ed0 - local_958.begin.y) * local_958.jstride * 8;
                                  lVar51 = lVar53 + lVar63 + lVar50 * -8 + lVar62;
                                  lVar66 = ((long)local_f58 - (long)local_958.begin.z) *
                                           local_958.kstride * 8;
                                  lVar64 = lVar63 + lVar66 + lVar50 * -8 + lVar62;
                                  lVar63 = (local_e80 - local_958.begin.y) * local_958.jstride * 8;
                                  lVar67 = lVar53 + lVar63 + lVar50 * -8 + lVar62;
                                  lVar77 = lVar63 + lVar66 + lVar50 * -8 + lVar62;
                                  lVar50 = CONCAT44(bx_6.bigend.vect[2],bx_6.bigend.vect[1]) * 8;
                                  lVar68 = (local_e40 - local_9e0) * lVar50;
                                  lVar75 = CONCAT44(bx_6.bigend.vect[0],bx_6.smallend.vect[2]) * 8;
                                  lVar78 = (local_ed0 - local_9e4) * lVar75;
                                  lVar53 = lVar68 + lVar78;
                                  lVar100 = lVar71 * 0x38;
                                  lVar50 = ((long)local_f58 - (long)local_9e0) * lVar50;
                                  lVar78 = lVar78 + lVar50;
                                  lVar75 = (local_e80 - local_9e4) * lVar75;
                                  lVar68 = lVar68 + lVar75;
                                  lVar75 = lVar75 + lVar50;
                                  lVar92 = lVar71 * 0x10;
                                  lVar69 = (long)local_9e8;
                                  lVar88 = lVar71 * 0x90;
                                  lVar80 = lVar71 * 0x40;
                                  lVar98 = lVar71 * 0x30;
                                  lVar70 = bx_6.smallend.vect._0_8_ + lVar62;
                                  lVar93 = lVar53 + lVar88 + lVar69 * -8 + lVar70;
                                  lVar50 = lVar53 + lVar80 + lVar69 * -8 + lVar70;
                                  lVar63 = lVar53 + lVar100 + lVar69 * -8 + lVar70;
                                  lVar66 = lVar53 + lVar98 + lVar69 * -8 + lVar70;
                                  lVar87 = lVar53 + lVar92 + lVar69 * -8 + lVar70;
                                  lVar58 = lVar53 + lVar71 * 8 + lVar69 * -8 + lVar70;
                                  lVar89 = lVar53 + lVar69 * -8 + lVar70;
                                  lVar53 = lVar78 + lVar88 + lVar69 * -8 + lVar70;
                                  lVar84 = lVar78 + lVar80 + lVar69 * -8 + lVar70;
                                  lVar91 = lVar78 + lVar100 + lVar69 * -8 + lVar70;
                                  lVar94 = lVar78 + lVar98 + lVar69 * -8 + lVar70;
                                  lVar95 = lVar78 + lVar92 + lVar69 * -8 + lVar70;
                                  lVar96 = lVar78 + lVar71 * 8 + lVar69 * -8 + lVar70;
                                  lVar78 = lVar78 + lVar69 * -8 + lVar70;
                                  lVar45 = lVar68 + lVar88 + lVar69 * -8 + lVar70;
                                  lVar46 = lVar68 + lVar80 + lVar69 * -8 + lVar70;
                                  lVar85 = lVar68 + lVar100 + lVar69 * -8 + lVar70;
                                  lVar79 = lVar68 + lVar98 + lVar69 * -8 + lVar70;
                                  lVar43 = lVar68 + lVar92 + lVar69 * -8 + lVar70;
                                  lVar44 = lVar68 + lVar71 * 8 + lVar69 * -8 + lVar70;
                                  lVar65 = lVar68 + lVar69 * -8 + lVar70;
                                  lVar101 = lVar88 + lVar75 + lVar69 * -8 + lVar70;
                                  lVar80 = lVar80 + lVar75 + lVar69 * -8 + lVar70;
                                  lVar88 = lVar100 + lVar75 + lVar69 * -8 + lVar70;
                                  lVar100 = lVar98 + lVar75 + lVar69 * -8 + lVar70;
                                  lVar68 = lVar92 + lVar75 + lVar69 * -8 + lVar70;
                                  lVar98 = lVar75 + lVar71 * 8 + lVar69 * -8 + lVar70;
                                  lVar70 = lVar75 + lVar69 * -8 + lVar70;
                                  lVar71 = 0;
                                  do {
                                    dVar110 = 0.0;
                                    if (*(int *)(local_1000 + lVar71 * 4) == 0) {
                                      uVar52 = (ulong)DAT_00697990;
                                      dVar110 = ((*(double *)(lVar79 + -8 + lVar71 * 8) +
                                                  *(double *)(lVar85 + -8 + lVar71 * 8) +
                                                 *(double *)(lVar46 + -8 + lVar71 * 8)) * 0.5 +
                                                 *(double *)
                                                  ((long)local_958.p + lVar71 * 8 + lVar67 + -8) *
                                                 0.125 + (*(double *)(lVar65 + -8 + lVar71 * 8) +
                                                          *(double *)(lVar44 + -8 + lVar71 * 8) +
                                                         *(double *)(lVar43 + -8 + lVar71 * 8)) *
                                                         0.25 +
                                                *(double *)(lVar45 + -8 + lVar71 * 8)) *
                                                *(double *)((long)local_fc0 + -8 + lVar71 * 8) +
                                                (((((double)(*(ulong *)(lVar79 + lVar71 * 8) ^
                                                            uVar52) -
                                                   *(double *)(lVar85 + lVar71 * 8)) +
                                                  *(double *)(lVar46 + lVar71 * 8)) * 0.5 +
                                                 *(double *)
                                                  ((long)local_958.p + lVar71 * 8 + lVar67) * 0.125
                                                 + ((*(double *)(lVar44 + lVar71 * 8) -
                                                    *(double *)(lVar65 + lVar71 * 8)) +
                                                   *(double *)(lVar43 + lVar71 * 8)) * 0.25) -
                                                *(double *)(lVar45 + lVar71 * 8)) *
                                                *(double *)((long)local_fc0 + lVar71 * 8) +
                                                ((((*(double *)(lVar63 + -8 + lVar71 * 8) -
                                                   *(double *)(lVar66 + -8 + lVar71 * 8)) -
                                                  *(double *)(lVar50 + -8 + lVar71 * 8)) * 0.5 +
                                                 *(double *)
                                                  ((long)local_958.p + lVar71 * 8 + lVar51 + -8) *
                                                 0.125 + ((*(double *)(lVar89 + -8 + lVar71 * 8) -
                                                          *(double *)(lVar58 + -8 + lVar71 * 8)) +
                                                         *(double *)(lVar87 + -8 + lVar71 * 8)) *
                                                         0.25) -
                                                *(double *)(lVar93 + -8 + lVar71 * 8)) *
                                                *(double *)((long)local_fc8 + -8 + lVar71 * 8) +
                                                (((*(double *)(lVar66 + lVar71 * 8) -
                                                  *(double *)(lVar63 + lVar71 * 8)) -
                                                 *(double *)(lVar50 + lVar71 * 8)) * 0.5 +
                                                 *(double *)
                                                  ((long)local_958.p + lVar71 * 8 + lVar51) * 0.125
                                                 + (((double)(*(ulong *)(lVar89 + lVar71 * 8) ^
                                                             uVar52) -
                                                    *(double *)(lVar58 + lVar71 * 8)) +
                                                   *(double *)(lVar87 + lVar71 * 8)) * 0.25 +
                                                *(double *)(lVar93 + lVar71 * 8)) *
                                                *(double *)((long)local_fc8 + lVar71 * 8) +
                                                ((((*(double *)(lVar100 + -8 + lVar71 * 8) -
                                                   *(double *)(lVar88 + -8 + lVar71 * 8)) -
                                                  *(double *)(lVar80 + -8 + lVar71 * 8)) * 0.5 +
                                                 *(double *)
                                                  ((long)local_958.p + lVar71 * 8 + lVar77 + -8) *
                                                 0.125 + ((*(double *)(lVar70 + -8 + lVar71 * 8) +
                                                          *(double *)(lVar98 + -8 + lVar71 * 8)) -
                                                         *(double *)(lVar68 + -8 + lVar71 * 8)) *
                                                         0.25) -
                                                *(double *)(lVar101 + -8 + lVar71 * 8)) *
                                                *(double *)((long)local_fd8 + -8 + lVar71 * 8) +
                                                (((*(double *)(lVar88 + lVar71 * 8) -
                                                  *(double *)(lVar100 + lVar71 * 8)) -
                                                 *(double *)(lVar80 + lVar71 * 8)) * 0.5 +
                                                 *(double *)
                                                  ((long)local_958.p + lVar71 * 8 + lVar77) * 0.125
                                                 + ((*(double *)(lVar98 + lVar71 * 8) -
                                                    *(double *)(lVar70 + lVar71 * 8)) -
                                                   *(double *)(lVar68 + lVar71 * 8)) * 0.25 +
                                                *(double *)(lVar101 + lVar71 * 8)) *
                                                *(double *)((long)local_fd8 + lVar71 * 8) +
                                                (((*(double *)(lVar94 + lVar71 * 8) +
                                                   *(double *)(lVar91 + lVar71 * 8) +
                                                  *(double *)(lVar84 + lVar71 * 8)) * 0.5 +
                                                 *(double *)
                                                  ((long)local_958.p + lVar71 * 8 + lVar64) * 0.125
                                                 + (((double)(*(ulong *)(lVar78 + lVar71 * 8) ^
                                                             uVar52) -
                                                    *(double *)(lVar96 + lVar71 * 8)) -
                                                   *(double *)(lVar95 + lVar71 * 8)) * 0.25) -
                                                *(double *)(lVar53 + lVar71 * 8)) *
                                                *(double *)(local_fe0 + lVar71 * 8) +
                                                ((((double)(*(ulong *)(lVar94 + -8 + lVar71 * 8) ^
                                                           uVar52) -
                                                  *(double *)(lVar91 + -8 + lVar71 * 8)) +
                                                 *(double *)(lVar84 + -8 + lVar71 * 8)) * 0.5 +
                                                 *(double *)
                                                  ((long)local_958.p + lVar71 * 8 + lVar64 + -8) *
                                                 0.125 + ((*(double *)(lVar78 + -8 + lVar71 * 8) -
                                                          *(double *)(lVar96 + -8 + lVar71 * 8)) -
                                                         *(double *)(lVar95 + -8 + lVar71 * 8)) *
                                                         0.25 +
                                                *(double *)(lVar53 + -8 + lVar71 * 8)) *
                                                *(double *)(local_fe0 + -8 + lVar71 * 8);
                                    }
                                    *(double *)(lVar86 + lVar71 * 8) =
                                         dVar110 + *(double *)(lVar86 + lVar71 * 8);
                                    lVar71 = lVar71 + 1;
                                  } while ((local_d68.bigend.vect[0] - local_d68.smallend.vect[0]) +
                                           1 != (int)lVar71);
                                }
                                local_ed0 = local_ed0 + 1;
                                lVar86 = lVar86 + local_cf0 * 8;
                                local_1000 = local_1000 + local_ae8.jstride * 4;
                                local_fc8 = (double *)((long)local_fc8 + lVar82);
                                local_fe0 = local_fe0 + lVar82;
                                local_fc0 = (double *)((long)local_fc0 + lVar82);
                                local_fd8 = (double *)((long)local_fd8 + lVar82);
                                local_e80 = local_e80 + 1;
                              } while (local_d68.bigend.vect[1] + 1U != (int)local_ed0);
                            }
                            local_f58 = (double *)((long)local_f58 + 1);
                            local_e68 = local_e68 + local_ca0 * 8;
                            local_eb8 = local_eb8 + lVar74;
                            local_e88 = local_e88 + lVar74;
                            local_e90 = local_e90 + lVar74;
                            local_ef8 = local_ef8 + lVar74;
                            local_e40 = local_e40 + 1;
                          } while (local_d68.bigend.vect[2] + 1 != (int)local_f58);
                        }
                      }
                      else {
                        local_fa8 = (long)local_d68.smallend.vect[2];
                        if (local_d68.smallend.vect[2] <= local_d68.bigend.vect[2]) {
                          lVar83 = (long)local_d68.smallend.vect[1];
                          lVar97 = (long)local_d68.smallend.vect[0];
                          lVar74 = lVar83 * 8;
                          local_f88 = (lVar74 + (local_fa8 - lVar60) * local_b18 * 8 +
                                      local_c88 * -8) * local_cf0 + lVar97 * 8 + lVar61 * -8 +
                                      (long)local_d08;
                          pdVar99 = pdVar32 + (lVar97 - lVar40);
                          lVar62 = lVar39 * 8 * lVar57;
                          lVar82 = (local_fa8 - lVar49) * lVar39;
                          iVar35 = ~iVar81 + local_d68.smallend.vect[2];
                          local_fd0 = (lVar74 + lVar82 * 8 + lVar48 * -8) * lVar57 + lVar97 * 8 +
                                      lVar40 * -8 + (long)pdVar32;
                          local_fc8 = pdVar99;
                          do {
                            if (local_d68.smallend.vect[1] <= local_d68.bigend.vect[1]) {
                              lVar63 = (long)iVar35 * lVar39 * 8;
                              pdVar76 = (double *)
                                        ((lVar74 + lVar48 * -8 + lVar63) * lVar57 + (long)pdVar99);
                              lVar87 = (~iVar81 + (int)local_fa8) * lVar56;
                              lVar66 = (local_fa8 - lVar49) * lVar56;
                              lVar84 = (long)local_ae8.p +
                                       (lVar83 - local_ae8.begin.y) * local_ae8.jstride * 4 +
                                       (local_fa8 - local_ae8.begin.z) * local_ae8.kstride * 4 +
                                       (long)local_ae8.begin.x * -4 + lVar97 * 4;
                              lVar86 = lVar83;
                              lVar53 = local_f88;
                              lVar50 = local_fd0;
                              iVar73 = ~iVar37 + local_d68.smallend.vect[1];
                              do {
                                if (local_d68.smallend.vect[0] <= local_d68.bigend.vect[0]) {
                                  lVar91 = (~iVar37 + (int)lVar86) * lVar57;
                                  lVar94 = (lVar86 - lVar48) * lVar57;
                                  lVar95 = 0;
                                  do {
                                    dVar110 = 0.0;
                                    if (*(int *)(lVar84 + lVar95 * 4) == 0) {
                                      lVar78 = (long)(~iVar33 + local_d68.smallend.vect[0] +
                                                     (int)lVar95);
                                      dVar110 = (pdVar32[lVar91 + lVar78 + lVar87] +
                                                 *(double *)
                                                  ((long)pdVar99 +
                                                  lVar95 * 8 + (lVar63 + (long)iVar73 * 8) * lVar57)
                                                 + pdVar32[lVar94 + lVar78 + lVar87] +
                                                 pdVar76[lVar95] + pdVar32[lVar91 + lVar78 + lVar66]
                                                 + *(double *)
                                                    ((long)local_fc8 +
                                                    lVar95 * 8 +
                                                    (lVar82 * 8 + (long)iVar73 * 8) * lVar57) +
                                                 pdVar32[lVar94 + lVar78 + lVar66] +
                                                *(double *)(lVar50 + lVar95 * 8)) * 0.125;
                                    }
                                    *(double *)(lVar53 + lVar95 * 8) =
                                         dVar110 + *(double *)(lVar53 + lVar95 * 8);
                                    lVar95 = lVar95 + 1;
                                  } while ((local_d68.bigend.vect[0] - local_d68.smallend.vect[0]) +
                                           1 != (int)lVar95);
                                }
                                lVar86 = lVar86 + 1;
                                lVar53 = lVar53 + local_cf0 * 8;
                                lVar84 = lVar84 + local_ae8.jstride * 4;
                                iVar73 = iVar73 + 1;
                                lVar50 = lVar50 + lVar57 * 8;
                                pdVar76 = pdVar76 + lVar57;
                              } while (local_d68.bigend.vect[1] + 1U != (int)lVar86);
                            }
                            local_fa8 = local_fa8 + 1;
                            local_f88 = local_f88 + local_ca0 * 8;
                            local_fc8 = (double *)((long)local_fc8 + lVar62);
                            iVar35 = iVar35 + 1;
                            local_fd0 = local_fd0 + lVar62;
                          } while (local_d68.bigend.vect[2] + 1 != (int)local_fa8);
                        }
                      }
                    }
                    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                              ((Array4<double> *)&local_a68,
                               &sync_resid->super_FabArray<amrex::FArrayBox>,&mfi_1);
                    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                              (&local_958,&phi.super_FabArray<amrex::FArrayBox>,&mfi_1);
                    if ((int)local_cb8 == 1) {
                      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                                ((Array4<const_double> *)&bx_6,
                                 (FabArray<amrex::FArrayBox> *)*plVar27,&mfi_1);
                      local_a28.bigend.vect[2] = local_d68.bigend.vect[2];
                      local_a28.bigend.vect[0] = local_d68.bigend.vect[0];
                      local_a28.bigend.vect[1] = local_d68.bigend.vect[1];
                      local_a28.smallend.vect[0] = local_d68.smallend.vect[0] + -1;
                      local_a28.smallend.vect[1] = local_d68.smallend.vect[1] + -1;
                      local_a28.smallend.vect[2] = local_d68.smallend.vect[2] + -1;
                      bx_4.bigend.vect[1] = local_d68.bigend.vect[1];
                      bx_4.bigend.vect[2] = local_d68.bigend.vect[2];
                      bx_4.smallend.vect[0] = local_a28.smallend.vect[0];
                      bx_4.smallend.vect[1] = local_a28.smallend.vect[1];
                      bx_4.smallend.vect[2] = local_a28.smallend.vect[2];
                      bx_4.bigend.vect[0] = local_d68.bigend.vect[0];
                      lVar39 = 0;
                      do {
                        if ((local_d68.btype.itype >> ((uint)lVar39 & 0x1f) & 1) != 0) {
                          piVar41 = bx_4.bigend.vect + lVar39;
                          *piVar41 = *piVar41 + -1;
                        }
                        lVar39 = lVar39 + 1;
                      } while (lVar39 != 3);
                      bx_4.btype.itype = 0;
                      result.btype.itype = 0;
                      result.smallend.vect[2] = local_d68.smallend.vect[2] + -2;
                      result.bigend.vect[0] = bx_4.bigend.vect[0] + 1;
                      result.smallend.vect[1] = local_d68.smallend.vect[1] + -2;
                      result.smallend.vect[0] = local_d68.smallend.vect[0] + -2;
                      result.bigend.vect[1] = bx_4.bigend.vect[1] + 1;
                      result.bigend.vect[2] = bx_4.bigend.vect[2] + 1;
                      FArrayBox::resize(&sten,&local_a28,9,(Arena *)0x0);
                      DVar42 = sten.super_BaseFab<double>.super_DataAllocator;
                      if (sten.super_BaseFab<double>.super_DataAllocator.m_arena == (Arena *)0x0) {
                        DVar42.m_arena = The_Arena();
                      }
                      Gpu::Elixir::Elixir(&steneli,(void *)0x0,DVar42.m_arena);
                      iVar59 = sten.super_BaseFab<double>.domain.bigend.vect[2];
                      iVar73 = sten.super_BaseFab<double>.domain.bigend.vect[1];
                      iVar35 = sten.super_BaseFab<double>.domain.bigend.vect[0];
                      iVar81 = sten.super_BaseFab<double>.domain.smallend.vect[2];
                      iVar37 = sten.super_BaseFab<double>.domain.smallend.vect[1];
                      iVar33 = sten.super_BaseFab<double>.domain.smallend.vect[0];
                      pdVar32 = sten.super_BaseFab<double>.dptr;
                      lVar74 = (long)sten.super_BaseFab<double>.domain.smallend.vect[0];
                      lVar40 = (long)sten.super_BaseFab<double>.domain.smallend.vect[1];
                      lVar39 = (long)sten.super_BaseFab<double>.domain.smallend.vect[2];
                      FArrayBox::resize(&cn,&result,0x1c,(Arena *)0x0);
                      arena = (Arena *)CONCAT44(cn.super_BaseFab<double>.super_DataAllocator.m_arena
                                                ._4_4_,(int)cn.super_BaseFab<double>.
                                                            super_DataAllocator.m_arena);
                      if (arena == (Arena *)0x0) {
                        arena = The_Arena();
                      }
                      lVar48 = (long)((iVar35 - iVar33) + 1);
                      lVar57 = (long)((iVar73 - iVar37) + 1);
                      lVar62 = (long)((iVar59 - iVar81) + 1);
                      Gpu::Elixir::Elixir(&cneli,(void *)0x0,arena);
                      iVar81 = cn.super_BaseFab<double>.domain.smallend.vect[2];
                      iVar37 = cn.super_BaseFab<double>.domain.smallend.vect[1];
                      iVar33 = cn.super_BaseFab<double>.domain.smallend.vect[0];
                      lVar49 = CONCAT44(cn.super_BaseFab<double>.dptr._4_4_,
                                        (int)cn.super_BaseFab<double>.dptr);
                      lVar83 = (long)cn.super_BaseFab<double>.domain.smallend.vect[0];
                      lVar97 = (long)cn.super_BaseFab<double>.domain.smallend.vect[1];
                      lVar86 = (long)cn.super_BaseFab<double>.domain.smallend.vect[2];
                      lVar53 = (long)((cn.super_BaseFab<double>.domain.bigend.vect[0] -
                                      cn.super_BaseFab<double>.domain.smallend.vect[0]) + 1);
                      local_b10 = (long)((cn.super_BaseFab<double>.domain.bigend.vect[1] -
                                         cn.super_BaseFab<double>.domain.smallend.vect[1]) + 1);
                      local_cb0 = (long)((cn.super_BaseFab<double>.domain.bigend.vect[2] -
                                         cn.super_BaseFab<double>.domain.smallend.vect[2]) + 1);
                      local_cb8 = local_b10 * lVar53;
                      lVar82 = local_cb0 * local_cb8;
                      FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                                ((Array4<const_amrex::EBCellFlag> *)&bx_4,local_9b0,&mfi_1);
                      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                                (&local_9a0,local_b20,&mfi_1);
                      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                                (&local_b60,
                                 (FabArray<amrex::FArrayBox> *)
                                 this_02.
                                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                                 .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                                 &mfi_1);
                      BATransformer::operator()
                                (&local_44c,
                                 (BATransformer *)
                                 (CONCAT44(mfi_1.fabArray._4_4_,(int)mfi_1.fabArray) + 8),
                                 (Box *)((long)((mfi_1.index_map)->
                                               super_vector<int,_std::allocator<int>_>).
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start[mfi_1.currentIndex]
                                         * 0x1c + **(long **)(CONCAT44(mfi_1.fabArray._4_4_,
                                                                       (int)mfi_1.fabArray) + 0x50))
                                );
                      auVar31 = _DAT_006ba930;
                      auVar30 = _DAT_006979c0;
                      auVar29 = _DAT_006979b0;
                      bx_5.bigend.vect[1] = local_44c.bigend.vect[1];
                      bx_5.bigend.vect[2] = local_44c.bigend.vect[2];
                      bx_5.btype.itype = local_44c.btype.itype;
                      bx_5.smallend.vect[0] = local_44c.smallend.vect[0];
                      bx_5.smallend.vect[1] = local_44c.smallend.vect[1];
                      uVar28 = bx_5.smallend.vect._0_8_;
                      bx_5.bigend.vect[0] = local_44c.bigend.vect[0];
                      lVar56 = 0;
                      do {
                        if ((bx_5.btype.itype >> ((uint)lVar56 & 0x1f) & 1) != 0) {
                          piVar41 = bx_5.bigend.vect + lVar56;
                          *piVar41 = *piVar41 + -1;
                        }
                        lVar56 = lVar56 + 1;
                      } while (lVar56 != 3);
                      lVar56 = lVar82 * 0xd8 + lVar49;
                      lVar50 = (long)result.smallend.vect[2];
                      if (result.smallend.vect[2] <= result.bigend.vect[2]) {
                        lVar66 = (long)result.smallend.vect[0];
                        lVar63 = (long)result.smallend.vect[1];
                        bx_5.smallend.vect[0] = local_44c.smallend.vect[0];
                        iVar35 = bx_5.bigend.vect[2];
                        if (result.bigend.vect[2] < bx_5.bigend.vect[2]) {
                          iVar35 = result.bigend.vect[2];
                        }
                        iVar73 = bx_5.bigend.vect[1];
                        if (result.bigend.vect[1] < bx_5.bigend.vect[1]) {
                          iVar73 = result.bigend.vect[1];
                        }
                        if (result.bigend.vect[0] < bx_5.bigend.vect[0]) {
                          bx_5.bigend.vect[0] = result.bigend.vect[0];
                        }
                        iVar59 = local_44c.smallend.vect[2];
                        if (local_44c.smallend.vect[2] < result.smallend.vect[2]) {
                          iVar59 = result.smallend.vect[2];
                        }
                        bx_5.smallend.vect[1] = local_44c.smallend.vect[1];
                        if (bx_5.smallend.vect[1] < result.smallend.vect[1]) {
                          bx_5.smallend.vect[1] = result.smallend.vect[1];
                        }
                        if (bx_5.smallend.vect[0] < result.smallend.vect[0]) {
                          bx_5.smallend.vect[0] = result.smallend.vect[0];
                        }
                        lVar87 = lVar82 * 0x10;
                        local_d10 = lVar82 * 0x48;
                        local_d18 = lVar82 * 0x80;
                        local_d00 = (double *)CONCAT44(local_d00._4_4_,result.bigend.vect[2] + 1);
                        local_d40 = ((local_cb0 * 8 + lVar50 * 8 + lVar86 * -8) * local_b10 +
                                     lVar63 * 8 + lVar97 * -8) * lVar53 + lVar66 * 8 + lVar83 * -8 +
                                    lVar49;
                        local_f10 = (lVar63 * 8 + (lVar50 - lVar86) * local_b10 * 8 + lVar97 * -8) *
                                    lVar53 + lVar66 * 8 + lVar83 * -8 + lVar49;
                        local_ce0 = lVar82 * 0x30;
                        local_d20 = lVar82 * 0x38;
                        local_d28 = lVar82 * 0x50;
                        local_d30 = lVar82 * 0x60;
                        local_ce8 = lVar82 * 0x70;
                        local_cc8 = lVar82 * 0x78;
                        local_d38 = lVar82 * 0x88;
                        local_cf8 = lVar82 * 0xa8;
                        local_c80 = lVar82 * 0xb0;
                        local_c90 = lVar82 * 0xb8;
                        local_cd0 = lVar82 * 0xc0;
                        local_c98 = lVar82 * 200;
                        do {
                          if (result.smallend.vect[1] <= result.bigend.vect[1]) {
                            lVar84 = (lVar50 - lVar86) * local_cb8;
                            local_ea0 = local_f10;
                            local_ea8 = local_d40;
                            local_1000 = lVar63;
                            do {
                              if (result.smallend.vect[0] <= result.bigend.vect[0]) {
                                lVar45 = (local_1000 - local_9a0.begin.y) * local_9a0.jstride;
                                lVar88 = (lVar50 - local_9a0.begin.z) * local_9a0.kstride;
                                lVar71 = (local_1000 - local_b60.begin.y) * local_b60.jstride;
                                lVar98 = (lVar50 - local_b60.begin.z) * local_b60.kstride;
                                lVar46 = (local_1000 - lVar97) * lVar53;
                                lVar91 = lVar49 + lVar84 * 8 + lVar46 * 8;
                                lVar94 = local_ea0;
                                lVar95 = local_ea8;
                                lVar78 = lVar66;
                                do {
                                  iVar129 = auVar31._0_4_;
                                  iVar132 = auVar31._4_4_;
                                  if (((((lVar78 < bx_5.smallend.vect[0]) ||
                                        (local_1000 < bx_5.smallend.vect[1])) || (lVar50 < iVar59))
                                      || ((bx_5.bigend.vect[0] < lVar78 || (iVar73 < local_1000))))
                                     || ((iVar35 < lVar50 ||
                                         (*(int *)((local_1000 - (int)local_c14) *
                                                   CONCAT44(bx_1.bigend.vect[0],
                                                            bx_1.smallend.vect[2]) * 4 +
                                                   bx_1.smallend.vect._0_8_ +
                                                   (lVar50 - (int)local_c10) *
                                                   CONCAT44(bx_1.bigend.vect[2],bx_1.bigend.vect[1])
                                                   * 4 + (lVar78 - local_c18) * 4) == 0)))) {
                                    lVar51 = 0x1c;
                                    lVar64 = 0;
                                    auVar123 = auVar29;
                                    do {
                                      if (SUB164(auVar123 ^ auVar30,4) == iVar132 &&
                                          SUB164(auVar123 ^ auVar30,0) < iVar129) {
                                        *(undefined8 *)(lVar94 + lVar64) = 0;
                                        *(undefined8 *)(lVar95 + lVar64) = 0;
                                      }
                                      lVar67 = auVar123._8_8_;
                                      auVar123._0_8_ = auVar123._0_8_ + 2;
                                      auVar123._8_8_ = lVar67 + 2;
                                      lVar64 = lVar64 + lVar87;
                                      lVar51 = lVar51 + -2;
                                    } while (lVar51 != 0);
                                    uVar111 = 0;
                                  }
                                  else {
                                    uVar36 = *(uint *)((local_1000 - local_7f4) *
                                                       CONCAT44(bx_4.bigend.vect[0],
                                                                bx_4.smallend.vect[2]) * 4 +
                                                       bx_4.smallend.vect._0_8_ +
                                                       (lVar50 - local_7f0) *
                                                       CONCAT44(bx_4.bigend.vect[2],
                                                                bx_4.bigend.vect[1]) * 4 +
                                                      (lVar78 - local_7f8) * 4) & 3;
                                    if (uVar36 == 0) {
LAB_005b5865:
                                      lVar51 = 0x1c;
                                      lVar64 = 0;
                                      auVar124 = auVar29;
                                      do {
                                        if (SUB164(auVar124 ^ auVar30,4) == iVar132 &&
                                            SUB164(auVar124 ^ auVar30,0) < iVar129) {
                                          *(undefined8 *)(lVar94 + lVar64) = 0x3ff0000000000000;
                                          *(undefined8 *)(lVar95 + lVar64) = 0x3ff0000000000000;
                                        }
                                        lVar67 = auVar124._8_8_;
                                        auVar124._0_8_ = auVar124._0_8_ + 2;
                                        auVar124._8_8_ = lVar67 + 2;
                                        lVar64 = lVar64 + lVar87;
                                        lVar51 = lVar51 + -2;
                                      } while (lVar51 != 0);
                                    }
                                    else if (uVar36 == 3) {
                                      lVar51 = 0x1c;
                                      lVar64 = 0;
                                      auVar122 = auVar29;
                                      do {
                                        if (SUB164(auVar122 ^ auVar30,4) == iVar132 &&
                                            SUB164(auVar122 ^ auVar30,0) < iVar129) {
                                          *(undefined8 *)(lVar94 + lVar64) = 0;
                                          *(undefined8 *)(lVar95 + lVar64) = 0;
                                        }
                                        lVar67 = auVar122._8_8_;
                                        auVar122._0_8_ = auVar122._0_8_ + 2;
                                        auVar122._8_8_ = lVar67 + 2;
                                        lVar64 = lVar64 + lVar87;
                                        lVar51 = lVar51 + -2;
                                      } while (lVar51 != 0);
                                    }
                                    else {
                                      lVar51 = lVar78 - local_9a0.begin.x;
                                      if (0.9999999999999778 <=
                                          local_9a0.p[lVar45 + lVar88 + lVar51]) goto LAB_005b5865;
                                      lVar67 = lVar78 - local_b60.begin.x;
                                      uVar52 = (ulong)DAT_00697990;
                                      *(double *)(lVar91 + (lVar78 - lVar83) * 8) =
                                           (((local_b60.p
                                              [lVar71 + lVar67 + lVar98 + local_b60.nstride * 6] -
                                             local_b60.p
                                             [lVar71 + lVar67 + lVar98 + local_b60.nstride * 9]) -
                                            local_b60.p
                                            [lVar71 + lVar67 + lVar98 + local_b60.nstride * 0xb]) +
                                           local_b60.p
                                           [lVar71 + lVar67 + lVar98 + local_b60.nstride * 0xf]) *
                                           9.0 + local_9a0.p[lVar45 + lVar88 + lVar51] * 0.5625 +
                                                 (((double)((ulong)local_b60.p
                                                                   [lVar71 + lVar67 + lVar98] ^
                                                           uVar52) -
                                                  local_b60.p
                                                  [lVar71 + lVar67 + lVar98 + local_b60.nstride]) +
                                                  local_b60.p
                                                  [lVar71 + lVar67 + lVar98 + local_b60.nstride * 3]
                                                 + local_b60.p
                                                   [lVar71 + lVar67 + lVar98 + local_b60.nstride * 4
                                                   ]) * 2.25;
                                      lVar64 = lVar91 + (lVar78 - lVar83) * 8;
                                      *(double *)(lVar64 + lVar82 * 8) =
                                           (local_b60.p
                                            [lVar71 + lVar67 + lVar98 + local_b60.nstride * 0xb] -
                                           local_b60.p
                                           [lVar71 + lVar67 + lVar98 + local_b60.nstride * 0xf]) *
                                           18.0 + local_9a0.p[lVar45 + lVar88 + lVar51] * 1.125 +
                                                  ((local_b60.p
                                                    [lVar71 + lVar67 + lVar98 + local_b60.nstride *
                                                                                3] -
                                                   local_b60.p[lVar71 + lVar67 + lVar98]) -
                                                  local_b60.p
                                                  [lVar71 + lVar67 + lVar98 + local_b60.nstride * 4]
                                                  ) * 4.5;
                                      *(double *)(lVar87 + lVar64) =
                                           (((local_b60.p
                                              [lVar71 + lVar67 + lVar98 + local_b60.nstride * 9] -
                                             local_b60.p
                                             [lVar71 + lVar67 + lVar98 + local_b60.nstride * 6]) -
                                            local_b60.p
                                            [lVar71 + lVar67 + lVar98 + local_b60.nstride * 0xb]) +
                                           local_b60.p
                                           [lVar71 + lVar67 + lVar98 + local_b60.nstride * 0xf]) *
                                           9.0 + local_9a0.p[lVar45 + lVar88 + lVar51] * 0.5625 +
                                                 ((local_b60.p
                                                   [lVar71 + lVar67 + lVar98 + local_b60.nstride] -
                                                  local_b60.p[lVar71 + lVar67 + lVar98]) +
                                                  local_b60.p
                                                  [lVar71 + lVar67 + lVar98 + local_b60.nstride * 3]
                                                 + local_b60.p
                                                   [lVar71 + lVar67 + lVar98 + local_b60.nstride * 4
                                                   ]) * 2.25;
                                      *(double *)(lVar82 * 0x18 + lVar64) =
                                           (local_b60.p
                                            [lVar71 + lVar67 + lVar98 + local_b60.nstride * 9] -
                                           local_b60.p
                                           [lVar71 + lVar67 + lVar98 + local_b60.nstride * 0xf]) *
                                           18.0 + local_9a0.p[lVar45 + lVar88 + lVar51] * 1.125 +
                                                  (((double)((ulong)local_b60.p
                                                                    [lVar71 + lVar67 + lVar98 + 
                                                  local_b60.nstride] ^ uVar52) -
                                                  local_b60.p
                                                  [lVar71 + lVar67 + lVar98 + local_b60.nstride * 3]
                                                  ) + local_b60.p
                                                      [lVar71 + lVar67 + lVar98 + local_b60.nstride
                                                                                  * 4]) * 4.5;
                                      *(double *)(lVar82 * 0x20 + lVar64) =
                                           local_b60.p
                                           [lVar71 + lVar67 + lVar98 + local_b60.nstride * 0xf] *
                                           36.0 + local_9a0.p[lVar45 + lVar88 + lVar51] * 2.25 +
                                                  ((double)((ulong)local_b60.p
                                                                   [lVar71 + lVar67 + lVar98 + 
                                                  local_b60.nstride * 3] ^ uVar52) -
                                                  local_b60.p
                                                  [lVar71 + lVar67 + lVar98 + local_b60.nstride * 4]
                                                  ) * 9.0;
                                      *(double *)(lVar82 * 0x28 + lVar64) =
                                           ((double)((ulong)local_b60.p
                                                            [lVar71 + lVar67 + lVar98 + local_b60.
                                                                                        nstride * 9]
                                                    ^ uVar52) -
                                           local_b60.p
                                           [lVar71 + lVar67 + lVar98 + local_b60.nstride * 0xf]) *
                                           18.0 + local_9a0.p[lVar45 + lVar88 + lVar51] * 1.125 +
                                                  ((local_b60.p
                                                    [lVar71 + lVar67 + lVar98 + local_b60.nstride] -
                                                   local_b60.p
                                                   [lVar71 + lVar67 + lVar98 + local_b60.nstride * 3
                                                   ]) + local_b60.p
                                                        [lVar71 + lVar67 + lVar98 + local_b60.
                                                                                    nstride * 4]) *
                                                  4.5;
                                      *(double *)(local_ce0 + lVar64) =
                                           (((double)((ulong)local_b60.p
                                                             [lVar71 + lVar67 + lVar98 + local_b60.
                                                                                         nstride * 6
                                                             ] ^ uVar52) -
                                            local_b60.p
                                            [lVar71 + lVar67 + lVar98 + local_b60.nstride * 9]) +
                                            local_b60.p
                                            [lVar71 + lVar67 + lVar98 + local_b60.nstride * 0xb] +
                                           local_b60.p
                                           [lVar71 + lVar67 + lVar98 + local_b60.nstride * 0xf]) *
                                           9.0 + local_9a0.p[lVar45 + lVar88 + lVar51] * 0.5625 +
                                                 ((local_b60.p[lVar71 + lVar67 + lVar98] -
                                                  local_b60.p
                                                  [lVar71 + lVar67 + lVar98 + local_b60.nstride]) +
                                                  local_b60.p
                                                  [lVar71 + lVar67 + lVar98 + local_b60.nstride * 3]
                                                 + local_b60.p
                                                   [lVar71 + lVar67 + lVar98 + local_b60.nstride * 4
                                                   ]) * 2.25;
                                      *(double *)(local_d20 + lVar64) =
                                           ((double)((ulong)local_b60.p
                                                            [lVar71 + lVar98 + lVar67 + local_b60.
                                                                                        nstride * 
                                                  0xb] ^ uVar52) -
                                           local_b60.p
                                           [lVar71 + lVar98 + lVar67 + local_b60.nstride * 0xf]) *
                                           18.0 + local_9a0.p[lVar45 + lVar88 + lVar51] * 1.125 +
                                                  ((local_b60.p[lVar71 + lVar98 + lVar67] +
                                                   local_b60.p
                                                   [lVar71 + lVar98 + lVar67 + local_b60.nstride * 3
                                                   ]) - local_b60.p
                                                        [lVar71 + lVar98 + lVar67 + local_b60.
                                                                                    nstride * 4]) *
                                                  4.5;
                                      *(double *)(lVar82 * 0x40 + lVar64) =
                                           (local_b60.p
                                            [lVar71 + lVar98 + lVar67 + local_b60.nstride * 6] +
                                            local_b60.p
                                            [lVar71 + lVar98 + lVar67 + local_b60.nstride * 9] +
                                            local_b60.p
                                            [lVar71 + lVar98 + lVar67 + local_b60.nstride * 0xb] +
                                           local_b60.p
                                           [lVar71 + lVar98 + lVar67 + local_b60.nstride * 0xf]) *
                                           9.0 + local_9a0.p[lVar45 + lVar88 + lVar51] * 0.5625 +
                                                 (local_b60.p[lVar71 + lVar98 + lVar67] +
                                                  local_b60.p
                                                  [lVar71 + lVar98 + lVar67 + local_b60.nstride] +
                                                  local_b60.p
                                                  [lVar71 + lVar98 + lVar67 + local_b60.nstride * 3]
                                                 + local_b60.p
                                                   [lVar71 + lVar98 + lVar67 + local_b60.nstride * 4
                                                   ]) * 2.25;
                                      *(double *)(local_d10 + lVar64) =
                                           (((local_b60.p
                                              [lVar71 + lVar98 + lVar67 + local_b60.nstride * 7] -
                                             local_b60.p
                                             [lVar71 + lVar98 + lVar67 + local_b60.nstride * 10]) -
                                            local_b60.p
                                            [lVar71 + lVar98 + lVar67 + local_b60.nstride * 0xd]) +
                                           local_b60.p
                                           [lVar71 + lVar98 + lVar67 + local_b60.nstride * 0x10]) *
                                           9.0 + local_9a0.p[lVar45 + lVar88 + lVar51] * 0.5625 +
                                                 (((double)((ulong)local_b60.p
                                                                   [lVar71 + lVar98 + lVar67] ^
                                                           uVar52) -
                                                  local_b60.p
                                                  [lVar71 + lVar98 + lVar67 + local_b60.nstride * 2]
                                                  ) + local_b60.p
                                                      [lVar71 + lVar98 + lVar67 + local_b60.nstride
                                                                                  * 3] +
                                                 local_b60.p
                                                 [lVar71 + lVar98 + lVar67 + local_b60.nstride * 5])
                                                 * 2.25;
                                      *(double *)(local_d28 + lVar64) =
                                           (local_b60.p
                                            [lVar71 + lVar98 + lVar67 + local_b60.nstride * 0xd] -
                                           local_b60.p
                                           [lVar71 + lVar98 + lVar67 + local_b60.nstride * 0x10]) *
                                           18.0 + local_9a0.p[lVar45 + lVar88 + lVar51] * 1.125 +
                                                  ((local_b60.p
                                                    [lVar71 + lVar98 + lVar67 + local_b60.nstride *
                                                                                3] -
                                                   local_b60.p[lVar71 + lVar98 + lVar67]) -
                                                  local_b60.p
                                                  [lVar71 + lVar98 + lVar67 + local_b60.nstride * 5]
                                                  ) * 4.5;
                                      *(double *)(lVar82 * 0x58 + lVar64) =
                                           (((local_b60.p
                                              [lVar71 + lVar98 + lVar67 + local_b60.nstride * 10] -
                                             local_b60.p
                                             [lVar71 + lVar98 + lVar67 + local_b60.nstride * 7]) -
                                            local_b60.p
                                            [lVar71 + lVar98 + lVar67 + local_b60.nstride * 0xd]) +
                                           local_b60.p
                                           [lVar71 + lVar98 + lVar67 + local_b60.nstride * 0x10]) *
                                           9.0 + local_9a0.p[lVar45 + lVar88 + lVar51] * 0.5625 +
                                                 ((local_b60.p
                                                   [lVar71 + lVar98 + lVar67 + local_b60.nstride * 2
                                                   ] - local_b60.p[lVar71 + lVar98 + lVar67]) +
                                                  local_b60.p
                                                  [lVar71 + lVar98 + lVar67 + local_b60.nstride * 3]
                                                 + local_b60.p
                                                   [lVar71 + lVar98 + lVar67 + local_b60.nstride * 5
                                                   ]) * 2.25;
                                      *(double *)(local_d30 + lVar64) =
                                           (local_b60.p
                                            [lVar71 + lVar98 + lVar67 + local_b60.nstride * 10] -
                                           local_b60.p
                                           [lVar71 + lVar98 + lVar67 + local_b60.nstride * 0x10]) *
                                           18.0 + local_9a0.p[lVar45 + lVar88 + lVar51] * 1.125 +
                                                  (((double)((ulong)local_b60.p
                                                                    [lVar71 + lVar98 + lVar67 + 
                                                  local_b60.nstride * 2] ^ uVar52) -
                                                  local_b60.p
                                                  [lVar71 + lVar98 + lVar67 + local_b60.nstride * 3]
                                                  ) + local_b60.p
                                                      [lVar71 + lVar98 + lVar67 + local_b60.nstride
                                                                                  * 5]) * 4.5;
                                      *(double *)(lVar82 * 0x68 + lVar64) =
                                           local_b60.p
                                           [lVar71 + lVar98 + lVar67 + local_b60.nstride * 0x10] *
                                           36.0 + local_9a0.p[lVar45 + lVar88 + lVar51] * 2.25 +
                                                  ((double)((ulong)local_b60.p
                                                                   [lVar71 + lVar98 + lVar67 + 
                                                  local_b60.nstride * 3] ^ uVar52) -
                                                  local_b60.p
                                                  [lVar71 + lVar98 + lVar67 + local_b60.nstride * 5]
                                                  ) * 9.0;
                                      *(double *)(local_ce8 + lVar64) =
                                           ((double)((ulong)local_b60.p
                                                            [lVar71 + lVar98 + lVar67 + local_b60.
                                                                                        nstride * 10
                                                            ] ^ uVar52) -
                                           local_b60.p
                                           [lVar71 + lVar98 + lVar67 + local_b60.nstride * 0x10]) *
                                           18.0 + local_9a0.p[lVar45 + lVar88 + lVar51] * 1.125 +
                                                  ((local_b60.p
                                                    [lVar71 + lVar98 + lVar67 + local_b60.nstride *
                                                                                2] -
                                                   local_b60.p
                                                   [lVar71 + lVar98 + lVar67 + local_b60.nstride * 3
                                                   ]) + local_b60.p
                                                        [lVar71 + lVar98 + lVar67 + local_b60.
                                                                                    nstride * 5]) *
                                                  4.5;
                                      *(double *)(local_cc8 + lVar64) =
                                           (((double)((ulong)local_b60.p
                                                             [lVar71 + lVar98 + lVar67 + local_b60.
                                                                                         nstride * 7
                                                             ] ^ uVar52) -
                                            local_b60.p
                                            [lVar71 + lVar98 + lVar67 + local_b60.nstride * 10]) +
                                            local_b60.p
                                            [lVar71 + lVar98 + lVar67 + local_b60.nstride * 0xd] +
                                           local_b60.p
                                           [lVar71 + lVar98 + lVar67 + local_b60.nstride * 0x10]) *
                                           9.0 + local_9a0.p[lVar45 + lVar88 + lVar51] * 0.5625 +
                                                 ((local_b60.p[lVar71 + lVar98 + lVar67] -
                                                  local_b60.p
                                                  [lVar71 + lVar98 + lVar67 + local_b60.nstride * 2]
                                                  ) + local_b60.p
                                                      [lVar71 + lVar98 + lVar67 + local_b60.nstride
                                                                                  * 3] +
                                                 local_b60.p
                                                 [lVar71 + lVar98 + lVar67 + local_b60.nstride * 5])
                                                 * 2.25;
                                      *(double *)(local_d18 + lVar64) =
                                           ((double)((ulong)local_b60.p
                                                            [lVar71 + lVar98 + lVar67 + local_b60.
                                                                                        nstride * 
                                                  0xd] ^ uVar52) -
                                           local_b60.p
                                           [lVar71 + lVar98 + lVar67 + local_b60.nstride * 0x10]) *
                                           18.0 + local_9a0.p[lVar45 + lVar88 + lVar51] * 1.125 +
                                                  ((local_b60.p[lVar71 + lVar98 + lVar67] +
                                                   local_b60.p
                                                   [lVar71 + lVar98 + lVar67 + local_b60.nstride * 3
                                                   ]) - local_b60.p
                                                        [lVar71 + lVar98 + lVar67 + local_b60.
                                                                                    nstride * 5]) *
                                                  4.5;
                                      *(double *)(local_d38 + lVar64) =
                                           (local_b60.p
                                            [lVar71 + lVar98 + lVar67 + local_b60.nstride * 7] +
                                            local_b60.p
                                            [lVar71 + lVar98 + lVar67 + local_b60.nstride * 10] +
                                            local_b60.p
                                            [lVar71 + lVar98 + lVar67 + local_b60.nstride * 0xd] +
                                           local_b60.p
                                           [lVar71 + lVar98 + lVar67 + local_b60.nstride * 0x10]) *
                                           9.0 + local_9a0.p[lVar45 + lVar88 + lVar51] * 0.5625 +
                                                 (local_b60.p[lVar71 + lVar98 + lVar67] +
                                                  local_b60.p
                                                  [lVar71 + lVar98 + lVar67 + local_b60.nstride * 2]
                                                  + local_b60.p
                                                    [lVar71 + lVar98 + lVar67 + local_b60.nstride *
                                                                                3] +
                                                 local_b60.p
                                                 [lVar71 + lVar98 + lVar67 + local_b60.nstride * 5])
                                                 * 2.25;
                                      *(double *)(lVar82 * 0x90 + lVar64) =
                                           (((local_b60.p
                                              [lVar71 + lVar98 + lVar67 + local_b60.nstride * 8] -
                                             local_b60.p
                                             [lVar71 + lVar98 + lVar67 + local_b60.nstride * 0xc]) -
                                            local_b60.p
                                            [lVar71 + lVar98 + lVar67 + local_b60.nstride * 0xe]) +
                                           local_b60.p
                                           [lVar71 + lVar98 + lVar67 + local_b60.nstride * 0x11]) *
                                           9.0 + local_9a0.p[lVar45 + lVar88 + lVar51] * 0.5625 +
                                                 (((double)((ulong)local_b60.p
                                                                   [lVar71 + lVar98 + lVar67 + 
                                                  local_b60.nstride] ^ uVar52) -
                                                  local_b60.p
                                                  [lVar71 + lVar98 + lVar67 + local_b60.nstride * 2]
                                                  ) + local_b60.p
                                                      [lVar71 + lVar98 + lVar67 + local_b60.nstride
                                                                                  * 4] +
                                                 local_b60.p
                                                 [lVar71 + lVar98 + lVar67 + local_b60.nstride * 5])
                                                 * 2.25;
                                      *(double *)(lVar82 * 0x98 + lVar64) =
                                           (local_b60.p
                                            [lVar71 + lVar98 + lVar67 + local_b60.nstride * 0xe] -
                                           local_b60.p
                                           [lVar71 + lVar98 + lVar67 + local_b60.nstride * 0x11]) *
                                           18.0 + local_9a0.p[lVar45 + lVar88 + lVar51] * 1.125 +
                                                  ((local_b60.p
                                                    [lVar71 + lVar98 + lVar67 + local_b60.nstride *
                                                                                4] -
                                                   local_b60.p
                                                   [lVar71 + lVar98 + lVar67 + local_b60.nstride]) -
                                                  local_b60.p
                                                  [lVar71 + lVar98 + lVar67 + local_b60.nstride * 5]
                                                  ) * 4.5;
                                      *(double *)(lVar82 * 0xa0 + lVar64) =
                                           (((local_b60.p
                                              [lVar71 + lVar98 + lVar67 + local_b60.nstride * 0xc] -
                                             local_b60.p
                                             [lVar71 + lVar98 + lVar67 + local_b60.nstride * 8]) -
                                            local_b60.p
                                            [lVar71 + lVar98 + lVar67 + local_b60.nstride * 0xe]) +
                                           local_b60.p
                                           [lVar71 + lVar98 + lVar67 + local_b60.nstride * 0x11]) *
                                           9.0 + local_9a0.p[lVar45 + lVar88 + lVar51] * 0.5625 +
                                                 ((local_b60.p
                                                   [lVar71 + lVar98 + lVar67 + local_b60.nstride * 2
                                                   ] - local_b60.p
                                                       [lVar71 + lVar98 + lVar67 + local_b60.nstride
                                                       ]) + local_b60.p
                                                            [lVar71 + lVar98 + lVar67 + local_b60.
                                                                                        nstride * 4]
                                                 + local_b60.p
                                                   [lVar71 + lVar98 + lVar67 + local_b60.nstride * 5
                                                   ]) * 2.25;
                                      lVar68 = (local_1000 - local_b60.begin.y) * local_b60.jstride;
                                      lVar77 = (lVar50 - local_b60.begin.z) * local_b60.kstride;
                                      *(double *)(local_cf8 + lVar64) =
                                           (local_b60.p
                                            [lVar68 + lVar67 + lVar77 + local_b60.nstride * 0xc] -
                                           local_b60.p
                                           [lVar68 + lVar67 + lVar77 + local_b60.nstride * 0x11]) *
                                           18.0 + local_9a0.p[lVar45 + lVar88 + lVar51] * 1.125 +
                                                  (((double)((ulong)local_b60.p
                                                                    [lVar68 + lVar67 + lVar77 + 
                                                  local_b60.nstride * 2] ^ uVar52) -
                                                  local_b60.p
                                                  [lVar68 + lVar67 + lVar77 + local_b60.nstride * 4]
                                                  ) + local_b60.p
                                                      [lVar68 + lVar67 + lVar77 + local_b60.nstride
                                                                                  * 5]) * 4.5;
                                      lVar51 = lVar78 - local_b60.begin.x;
                                      lVar77 = (local_1000 - local_b60.begin.y) * local_b60.jstride;
                                      lVar67 = (lVar50 - local_b60.begin.z) * local_b60.kstride;
                                      *(double *)(local_c80 + lVar64) =
                                           local_b60.p
                                           [lVar77 + lVar51 + lVar67 + local_b60.nstride * 0x11] *
                                           36.0 + local_9a0.p
                                                  [(local_1000 - local_9a0.begin.y) *
                                                   local_9a0.jstride +
                                                   (lVar78 - local_9a0.begin.x) +
                                                   (lVar50 - local_9a0.begin.z) * local_9a0.kstride]
                                                  * 2.25 + ((double)((ulong)local_b60.p
                                                                            [lVar77 + lVar51 + 
                                                  lVar67 + local_b60.nstride * 4] ^ uVar52) -
                                                  local_b60.p
                                                  [lVar77 + lVar51 + lVar67 + local_b60.nstride * 5]
                                                  ) * 9.0;
                                      lVar51 = lVar78 - local_b60.begin.x;
                                      lVar77 = (local_1000 - local_b60.begin.y) * local_b60.jstride;
                                      lVar67 = (lVar50 - local_b60.begin.z) * local_b60.kstride;
                                      *(double *)(local_c90 + lVar64) =
                                           ((double)((ulong)local_b60.p
                                                            [lVar77 + lVar51 + lVar67 + local_b60.
                                                                                        nstride * 
                                                  0xc] ^ uVar52) -
                                           local_b60.p
                                           [lVar77 + lVar51 + lVar67 + local_b60.nstride * 0x11]) *
                                           18.0 + local_9a0.p
                                                  [(local_1000 - local_9a0.begin.y) *
                                                   local_9a0.jstride +
                                                   (lVar78 - local_9a0.begin.x) +
                                                   (lVar50 - local_9a0.begin.z) * local_9a0.kstride]
                                                  * 1.125 + ((local_b60.p
                                                              [lVar77 + lVar51 + lVar67 + local_b60.
                                                                                          nstride * 
                                                  2] - local_b60.p
                                                       [lVar77 + lVar51 + lVar67 + local_b60.nstride
                                                                                   * 4]) +
                                                  local_b60.p
                                                  [lVar77 + lVar51 + lVar67 + local_b60.nstride * 5]
                                                  ) * 4.5;
                                      lVar77 = (local_1000 - local_b60.begin.y) * local_b60.jstride;
                                      lVar51 = lVar78 - local_b60.begin.x;
                                      lVar67 = (lVar50 - local_b60.begin.z) * local_b60.kstride;
                                      *(double *)(local_cd0 + lVar64) =
                                           (((double)((ulong)local_b60.p
                                                             [lVar77 + lVar51 + lVar67 + local_b60.
                                                                                         nstride * 8
                                                             ] ^ uVar52) -
                                            local_b60.p
                                            [lVar77 + lVar51 + lVar67 + local_b60.nstride * 0xc]) +
                                            local_b60.p
                                            [lVar77 + lVar51 + lVar67 + local_b60.nstride * 0xe] +
                                           local_b60.p
                                           [lVar77 + lVar51 + lVar67 + local_b60.nstride * 0x11]) *
                                           9.0 + local_9a0.p
                                                 [(local_1000 - local_9a0.begin.y) *
                                                  local_9a0.jstride +
                                                  (lVar78 - local_9a0.begin.x) +
                                                  (lVar50 - local_9a0.begin.z) * local_9a0.kstride]
                                                 * 0.5625 +
                                                 ((local_b60.p
                                                   [lVar77 + lVar51 + lVar67 + local_b60.nstride] -
                                                  local_b60.p
                                                  [lVar77 + lVar51 + lVar67 + local_b60.nstride * 2]
                                                  ) + local_b60.p
                                                      [lVar77 + lVar51 + lVar67 + local_b60.nstride
                                                                                  * 4] +
                                                 local_b60.p
                                                 [lVar77 + lVar51 + lVar67 + local_b60.nstride * 5])
                                                 * 2.25;
                                      lVar77 = (local_1000 - local_b60.begin.y) * local_b60.jstride;
                                      lVar51 = lVar78 - local_b60.begin.x;
                                      lVar67 = (lVar50 - local_b60.begin.z) * local_b60.kstride;
                                      *(double *)(local_c98 + lVar64) =
                                           ((double)((ulong)local_b60.p
                                                            [lVar77 + lVar51 + lVar67 + local_b60.
                                                                                        nstride * 
                                                  0xe] ^ uVar52) -
                                           local_b60.p
                                           [lVar77 + lVar51 + lVar67 + local_b60.nstride * 0x11]) *
                                           18.0 + local_9a0.p
                                                  [(local_1000 - local_9a0.begin.y) *
                                                   local_9a0.jstride +
                                                   (lVar78 - local_9a0.begin.x) +
                                                   (lVar50 - local_9a0.begin.z) * local_9a0.kstride]
                                                  * 1.125 + ((local_b60.p
                                                              [lVar77 + lVar51 + lVar67 + local_b60.
                                                                                          nstride] +
                                                             local_b60.p
                                                             [lVar77 + lVar51 + lVar67 + local_b60.
                                                                                         nstride * 4
                                                             ]) - local_b60.p
                                                                  [lVar77 + lVar51 + lVar67 + 
                                                  local_b60.nstride * 5]) * 4.5;
                                      lVar77 = (local_1000 - local_b60.begin.y) * local_b60.jstride;
                                      lVar67 = lVar78 - local_b60.begin.x;
                                      lVar51 = (lVar50 - local_b60.begin.z) * local_b60.kstride;
                                      *(double *)(lVar82 * 0xd0 + lVar64) =
                                           (local_b60.p
                                            [lVar77 + lVar67 + lVar51 + local_b60.nstride * 8] +
                                            local_b60.p
                                            [lVar77 + lVar67 + lVar51 + local_b60.nstride * 0xc] +
                                            local_b60.p
                                            [lVar77 + lVar67 + lVar51 + local_b60.nstride * 0xe] +
                                           local_b60.p
                                           [lVar77 + lVar67 + lVar51 + local_b60.nstride * 0x11]) *
                                           9.0 + local_9a0.p
                                                 [(local_1000 - local_9a0.begin.y) *
                                                  local_9a0.jstride +
                                                  (lVar78 - local_9a0.begin.x) +
                                                  (lVar50 - local_9a0.begin.z) * local_9a0.kstride]
                                                 * 0.5625 +
                                                 (local_b60.p
                                                  [lVar77 + lVar67 + lVar51 + local_b60.nstride] +
                                                  local_b60.p
                                                  [lVar77 + lVar67 + lVar51 + local_b60.nstride * 2]
                                                  + local_b60.p
                                                    [lVar77 + lVar67 + lVar51 + local_b60.nstride *
                                                                                4] +
                                                 local_b60.p
                                                 [lVar77 + lVar67 + lVar51 + local_b60.nstride * 5])
                                                 * 2.25;
                                    }
                                    uVar111 = *(undefined8 *)
                                               (bx_6.smallend.vect._0_8_ +
                                                (local_1000 - local_9e4) *
                                                CONCAT44(bx_6.bigend.vect[0],bx_6.smallend.vect[2])
                                                * 8 + (lVar78 - local_9e8) * 8 +
                                               (lVar50 - local_9e0) *
                                               CONCAT44(bx_6.bigend.vect[2],bx_6.bigend.vect[1]) * 8
                                               );
                                  }
                                  *(undefined8 *)
                                   (lVar56 + lVar84 * 8 + lVar46 * 8 + (lVar78 - lVar83) * 8) =
                                       uVar111;
                                  lVar78 = lVar78 + 1;
                                  lVar95 = lVar95 + 8;
                                  lVar94 = lVar94 + 8;
                                } while (result.bigend.vect[0] + 1 != (int)lVar78);
                              }
                              local_1000 = local_1000 + 1;
                              local_ea8 = local_ea8 + lVar53 * 8;
                              local_ea0 = local_ea0 + lVar53 * 8;
                            } while (result.bigend.vect[1] + 1 != (int)local_1000);
                          }
                          lVar50 = lVar50 + 1;
                          local_d40 = local_d40 + local_cb8 * 8;
                          local_f10 = local_f10 + local_cb8 * 8;
                        } while (result.bigend.vect[2] + 1 != (int)lVar50);
                      }
                      local_d80 = (long)local_a28.smallend.vect[2];
                      if (local_a28.smallend.vect[2] <= local_a28.bigend.vect[2]) {
                        lVar64 = (long)local_a28.smallend.vect[1];
                        lVar95 = lVar64 * 8 + lVar97 * -8;
                        lVar78 = local_cb0 * 0xd8;
                        lVar66 = local_d80 * 8;
                        local_cf8 = (lVar78 + local_d80 * 8 + lVar86 * -8) * local_b10;
                        lVar45 = local_cb0 * 0x20;
                        local_c80 = (local_cb0 * 0x68 + local_d80 * 8 + lVar86 * -8) * local_b10;
                        local_c90 = (local_cb0 * 0x50 + local_d80 * 8 + lVar86 * -8) * local_b10;
                        lVar87 = local_cb0 * 8;
                        lVar94 = local_cb0 * 0x18;
                        local_cd0 = (local_cb0 * 0x60 + local_d80 * 8 + lVar86 * -8) * local_b10;
                        lVar67 = (long)local_a28.smallend.vect[0];
                        lVar46 = local_cb0 * 0x58;
                        lVar88 = local_cb0 * 0xb8;
                        lVar98 = local_cb0 * 0x70;
                        lVar71 = local_cb0 * 0xd0;
                        lVar51 = local_cb0 * 200;
                        lVar77 = local_cb0 * 0xc0;
                        lVar84 = local_d80 * 8;
                        lVar50 = local_d80 * 8;
                        lVar91 = local_cb0 * 0x28;
                        lVar63 = local_d80 * 8;
                        uVar36 = ~iVar37;
                        local_c98 = (ulong)uVar36;
                        local_a28.bigend.vect[2] = local_a28.bigend.vect[2] + 1;
                        uVar52 = lVar67 * 8 + lVar83 * -8 + lVar49;
                        local_b00 = CONCAT44(local_b00._4_4_,~iVar81 + local_a28.smallend.vect[2]);
                        local_d40 = (local_cf8 + lVar64 * 8 + lVar97 * -8) * lVar53 + lVar67 * 8 +
                                    lVar83 * -8 + lVar49;
                        local_f10 = ((lVar66 + local_cb0 * 0x48 + lVar86 * -8) * local_b10 +
                                     lVar64 * 8 + lVar97 * -8) * lVar53 + lVar67 * 8 + lVar83 * -8 +
                                    lVar49;
                        local_d00 = (double *)
                                    (((local_cb0 * 0x90 + local_d80 * 8 + lVar86 * -8) * local_b10 +
                                      lVar64 * 8 + lVar97 * -8) * lVar53 + lVar67 * 8 + lVar83 * -8
                                    + lVar49);
                        local_ee8 = ((local_cb0 * 0xb0 + local_d80 * 8 + lVar86 * -8) * local_b10 +
                                     lVar64 * 8 + lVar97 * -8) * lVar53 + lVar67 * 8 + lVar83 * -8 +
                                    lVar49;
                        local_ef0 = (local_c80 + lVar64 * 8 + lVar97 * -8) * lVar53 + lVar67 * 8 +
                                    lVar83 * -8 + lVar49;
                        local_cd8 = ((lVar45 + local_d80 * 8 + lVar86 * -8) * local_b10 + lVar64 * 8
                                    + lVar97 * -8) * lVar53 + lVar67 * 8 + lVar83 * -8 + lVar49;
                        local_ca8 = (lVar64 * 8 + (local_d80 - lVar86) * local_b10 * 8 + lVar97 * -8
                                    ) * lVar53 + lVar67 * 8 + lVar83 * -8 + lVar49;
                        local_bc0 = (local_c90 + lVar64 * 8 + lVar97 * -8) * lVar53 + lVar67 * 8 +
                                    lVar83 * -8 + lVar49;
                        local_bc8 = ((local_cb0 * 0x98 + local_d80 * 8 + lVar86 * -8) * local_b10 +
                                     lVar64 * 8 + lVar97 * -8) * lVar53 + lVar67 * 8 + lVar83 * -8 +
                                    lVar49;
                        local_bd0 = ((lVar87 + local_d80 * 8 + lVar86 * -8) * local_b10 + lVar64 * 8
                                    + lVar97 * -8) * lVar53 + lVar67 * 8 + lVar83 * -8 + lVar49;
                        local_bd8 = lVar67 * 8 +
                                    ((local_cb0 * 0xa8 + local_d80 * 8 + lVar86 * -8) * local_b10 +
                                     lVar64 * 8 + lVar97 * -8) * lVar53 + lVar83 * -8 + lVar49;
                        local_be0 = ((lVar94 + local_d80 * 8 + lVar86 * -8) * local_b10 + lVar64 * 8
                                    + lVar97 * -8) * lVar53 + lVar67 * 8 + lVar83 * -8 + lVar49;
                        local_be8 = (local_cd0 + lVar64 * 8 + lVar97 * -8) * lVar53 + lVar67 * 8 +
                                    lVar83 * -8 + lVar49;
                        local_95c = ~iVar37 + local_a28.smallend.vect[1];
                        local_d38 = (local_cb0 * 0x10 + local_d80 * 8 + lVar86 * -8) * local_b10;
                        lVar68 = lVar57 * lVar48 * 8;
                        local_b90 = ((lVar62 * 0x10 + local_d80 * 8 + lVar39 * -8) * lVar57 +
                                     lVar64 * 8 + lVar40 * -8) * lVar48 + lVar67 * 8 + lVar74 * -8 +
                                    (long)pdVar32;
                        local_b98 = ((lVar66 + lVar62 * 0x18 + lVar39 * -8) * lVar57 + lVar64 * 8 +
                                    lVar40 * -8) * lVar48 + lVar67 * 8 + lVar74 * -8 + (long)pdVar32
                        ;
                        local_ba0 = ((lVar62 * 0x20 + local_d80 * 8 + lVar39 * -8) * lVar57 +
                                     lVar64 * 8 + lVar40 * -8) * lVar48 + lVar67 * 8 + lVar74 * -8 +
                                    (long)pdVar32;
                        local_ba8 = ((lVar66 + lVar62 * 0x28 + lVar39 * -8) * lVar57 + lVar64 * 8 +
                                    lVar40 * -8) * lVar48 + lVar67 * 8 + lVar74 * -8 + (long)pdVar32
                        ;
                        local_bb0 = ((lVar62 * 0x30 + local_d80 * 8 + lVar39 * -8) * lVar57 +
                                     lVar64 * 8 + lVar40 * -8) * lVar48 + lVar67 * 8 + lVar74 * -8 +
                                    (long)pdVar32;
                        local_af8 = ((lVar62 * 0x38 + local_d80 * 8 + lVar39 * -8) * lVar57 +
                                     lVar64 * 8 + lVar40 * -8) * lVar48 + lVar67 * 8 + lVar74 * -8 +
                                    (long)pdVar32;
                        local_d10 = CONCAT44(local_d10._4_4_,local_a28.bigend.vect[0]);
                        local_d18 = CONCAT44(local_d18._4_4_,local_a28.bigend.vect[1] + 1U);
                        local_ce0 = lVar53 * 8;
                        lVar83 = local_cb8 * 8;
                        lVar66 = local_cb0 * 0xa0;
                        local_d20 = lVar48 * 8;
                        local_d28 = uVar52;
                        local_cb0 = ((lVar62 * 8 + local_d80 * 8 + lVar39 * -8) * lVar57 +
                                     lVar64 * 8 + lVar40 * -8) * lVar48 + lVar67 * 8 + lVar74 * -8 +
                                    (long)pdVar32;
                        do {
                          if (local_a28.smallend.vect[1] <= local_a28.bigend.vect[1]) {
                            lVar67 = (long)(int)local_b00;
                            local_d30 = (lVar78 + lVar67 * 8) * local_b10;
                            lVar65 = (lVar95 + local_d30) * lVar53 + uVar52;
                            lVar79 = ((lVar46 + lVar67 * 8) * local_b10 + lVar95) * lVar53 + uVar52;
                            local_f88 = ((lVar66 + lVar67 * 8) * local_b10 + lVar95) * lVar53 +
                                        uVar52;
                            lVar70 = ((lVar45 + lVar67 * 8) * local_b10 + lVar95) * lVar53 + uVar52;
                            lVar75 = ((lVar87 + lVar67 * 8) * local_b10 + lVar95) * lVar53 + uVar52;
                            local_fd0 = ((lVar88 + lVar67 * 8) * local_b10 + lVar95) * lVar53 +
                                        uVar52;
                            local_f90 = ((lVar94 + lVar67 * 8) * local_b10 + lVar95) * lVar53 +
                                        uVar52;
                            lVar69 = (lVar98 + lVar67 * 8) * local_b10;
                            local_ff0 = (lVar95 + lVar69) * lVar53 + uVar52;
                            local_ce8 = (lVar71 + lVar67 * 8) * local_b10;
                            local_cc8 = (lVar91 + lVar67 * 8) * local_b10;
                            lVar58 = (local_d80 - lVar86) * local_cb8;
                            lVar92 = (~iVar81 + (int)local_d80) * local_cb8;
                            local_f50 = local_ba0;
                            local_e60 = local_b98;
                            local_ea8 = local_b90;
                            local_fc8 = (double *)local_cb0;
                            local_f38 = local_be8;
                            local_fe8 = (double *)local_be0;
                            local_f98 = local_bd8;
                            local_fd8 = (double *)local_bd0;
                            local_f78 = local_bc8;
                            local_fb0 = local_bc0;
                            local_f40 = local_ca8;
                            local_f60 = local_cd8;
                            local_f68 = local_ef0;
                            local_f48 = (double *)local_ee8;
                            local_f18 = local_d00;
                            local_ea0 = local_f10;
                            uVar102 = local_af8;
                            lVar67 = local_bb0;
                            lVar43 = local_ba8;
                            lVar44 = local_d40;
                            local_e70 = lVar64;
                            iVar37 = local_95c;
                            do {
                              if (local_a28.smallend.vect[0] <= local_a28.bigend.vect[0]) {
                                lVar89 = (long)iVar37;
                                lVar80 = (local_cf8 + lVar89 * 8) * lVar53 + local_d28;
                                lVar100 = ((lVar51 + lVar50 + lVar86 * -8) * local_b10 + lVar89 * 8)
                                          * lVar53 + local_d28;
                                lVar85 = ((lVar91 + lVar63 + lVar86 * -8) * local_b10 + lVar89 * 8)
                                         * lVar53 + local_d28;
                                lVar93 = (local_e70 - lVar97) * lVar53;
                                lVar96 = (int)(uVar36 + (int)local_e70) * lVar53;
                                lVar101 = 0;
                                do {
                                  *(double *)((long)local_fc8 + lVar101 * 8) =
                                       (*(double *)
                                         ((local_cc8 + lVar89 * 8) * lVar53 + uVar52 + lVar101 * 8)
                                        * local_5e8 +
                                       *(double *)
                                        ((local_ce8 + lVar89 * 8) * lVar53 + uVar52 + lVar101 * 8) *
                                       local_578 +
                                       *(double *)
                                        ((lVar69 + lVar89 * 8) * lVar53 + uVar52 + lVar101 * 8) *
                                       local_5c8) *
                                       *(double *)
                                        ((local_d30 + lVar89 * 8) * lVar53 + uVar52 + lVar101 * 8) +
                                       (*(double *)(local_f90 + lVar101 * 8) * local_5e8 +
                                       *(double *)(local_f88 + lVar101 * 8) * local_578 +
                                       *(double *)(local_ff0 + lVar101 * 8) * local_5c8) *
                                       *(double *)(lVar65 + lVar101 * 8) +
                                       (*(double *)((long)local_fe8 + lVar101 * 8) * local_5e8 +
                                       local_f18[lVar101] * local_578 +
                                       *(double *)(local_f38 + lVar101 * 8) * local_5c8) *
                                       *(double *)(lVar44 + lVar101 * 8) +
                                       (*(double *)(lVar85 + lVar101 * 8) * local_5e8 +
                                       *(double *)
                                        (((lVar84 + lVar77 + lVar86 * -8) * local_b10 + lVar89 * 8)
                                         * lVar53 + local_d28 + lVar101 * 8) * local_578 +
                                       *(double *)
                                        ((local_cd0 + lVar89 * 8) * lVar53 + local_d28 + lVar101 * 8
                                        ) * local_5c8) * *(double *)(lVar80 + lVar101 * 8);
                                  lVar55 = (long)(~iVar33 + local_a28.smallend.vect[0] +
                                                 (int)lVar101);
                                  lVar4 = lVar56 + lVar93 * 8 + lVar55 * 8;
                                  lVar5 = lVar49 + lVar93 * 8 + lVar55 * 8;
                                  lVar6 = lVar5 + lVar58 * 8;
                                  lVar5 = lVar5 + lVar92 * 8;
                                  *(double *)(local_ea8 + lVar101 * 8) =
                                       (*(double *)(lVar5 + lVar82 * 0x38) * local_5e8 +
                                       *(double *)(lVar5 + lVar82 * 0xb8) * local_598 +
                                       *(double *)(lVar82 * 0x88 + lVar5) * local_588) *
                                       *(double *)(lVar4 + lVar92 * 8) +
                                       (*(double *)(lVar75 + lVar101 * 8) * local_5e8 +
                                       *(double *)(local_fd0 + lVar101 * 8) * local_598 +
                                       *(double *)(lVar79 + lVar101 * 8) * local_588) *
                                       *(double *)(lVar65 + lVar101 * 8) +
                                       (*(double *)((long)local_fd8 + lVar101 * 8) * local_5e8 +
                                       *(double *)(local_f98 + lVar101 * 8) * local_598 +
                                       *(double *)(local_ea0 + lVar101 * 8) * local_588) *
                                       *(double *)(lVar44 + lVar101 * 8) +
                                       (*(double *)(lVar6 + lVar82 * 0x38) * local_5e8 +
                                       *(double *)(lVar6 + lVar82 * 0xa8) * local_598 +
                                       *(double *)(lVar82 * 0x78 + lVar6) * local_588) *
                                       *(double *)(lVar4 + lVar58 * 8);
                                  lVar5 = lVar49 + lVar96 * 8 + lVar58 * 8 + lVar55 * 8;
                                  *(double *)(local_e60 + lVar101 * 8) =
                                       (*(double *)(lVar82 * 0x40 + lVar5) * local_5d8 +
                                       *(double *)(lVar5 + lVar82 * 200) * local_598 +
                                       *(double *)(lVar5 + lVar82 * 0x80) * local_5c8) *
                                       *(double *)(lVar56 + lVar96 * 8 + lVar58 * 8 + lVar55 * 8) +
                                       (*(double *)
                                         ((local_d38 + lVar89 * 8) * lVar53 + local_d28 +
                                         lVar101 * 8) * local_5d8 +
                                       *(double *)(lVar100 + lVar101 * 8) * local_598 +
                                       *(double *)
                                        ((local_c90 + lVar89 * 8) * lVar53 + local_d28 + lVar101 * 8
                                        ) * local_5c8) * *(double *)(lVar80 + lVar101 * 8) +
                                       (*(double *)(local_f40 + lVar101 * 8) * local_5d8 +
                                       *(double *)(local_f78 + lVar101 * 8) * local_598 +
                                       *(double *)(local_fb0 + lVar101 * 8) * local_5c8) *
                                       *(double *)(lVar44 + lVar101 * 8) +
                                       (*(double *)(lVar82 * 0x30 + lVar6) * local_5d8 +
                                       *(double *)(lVar6 + lVar82 * 0x98) * local_598 +
                                       *(double *)(lVar6 + lVar82 * 0x80) * local_5c8) *
                                       *(double *)(lVar4 + lVar58 * 8);
                                  *(double *)(local_f50 + lVar101 * 8) =
                                       (*(double *)(local_f60 + lVar101 * 8) * local_5f8 +
                                       *(double *)(local_f98 + lVar101 * 8) * local_5b8 +
                                       *(double *)(local_f38 + lVar101 * 8) *
                                       (double)local_568._0_8_) * *(double *)(lVar44 + lVar101 * 8)
                                       + (*(double *)(lVar70 + lVar101 * 8) * local_5f8 +
                                         *(double *)(local_fd0 + lVar101 * 8) * local_5b8 +
                                         *(double *)(local_ff0 + lVar101 * 8) *
                                         (double)local_568._0_8_) *
                                         *(double *)(lVar65 + lVar101 * 8);
                                  *(double *)(lVar43 + lVar101 * 8) =
                                       (*(double *)((long)local_fe8 + lVar101 * 8) * local_4c8 +
                                       *(double *)(local_f78 + lVar101 * 8) * local_5b8 +
                                       *(double *)(local_f68 + lVar101 * 8) * local_4d8) *
                                       *(double *)(lVar44 + lVar101 * 8) +
                                       (*(double *)(lVar85 + lVar101 * 8) * local_4c8 +
                                       *(double *)(lVar100 + lVar101 * 8) * local_5b8 +
                                       *(double *)
                                        ((local_c80 + lVar89 * 8) * lVar53 + local_d28 + lVar101 * 8
                                        ) * local_4d8) * *(double *)(lVar80 + lVar101 * 8);
                                  *(double *)(lVar67 + lVar101 * 8) =
                                       (*(double *)((long)local_fd8 + lVar101 * 8) * local_4c8 +
                                       *(double *)((long)local_f48 + lVar101 * 8) * local_5a8 +
                                       *(double *)(local_fb0 + lVar101 * 8) *
                                       (double)local_568._0_8_) * *(double *)(lVar44 + lVar101 * 8)
                                       + (*(double *)(lVar6 + lVar82 * 0x38) * local_4c8 +
                                         *(double *)(lVar6 + lVar82 * 0xb0) * local_5a8 +
                                         *(double *)(lVar6 + lVar82 * 0x80) *
                                         (double)local_568._0_8_) * *(double *)(lVar4 + lVar58 * 8);
                                  *(double *)(uVar102 + lVar101 * 8) =
                                       (*(double *)(local_f60 + lVar101 * 8) * facz_2 +
                                       *(double *)((long)local_f48 + lVar101 * 8) * facx_2 +
                                       *(double *)(local_f68 + lVar101 * 8) * facy_2) *
                                       *(double *)(lVar44 + lVar101 * 8);
                                  lVar101 = lVar101 + 1;
                                } while ((local_a28.bigend.vect[0] - local_a28.smallend.vect[0]) + 1
                                         != (int)lVar101);
                              }
                              local_e70 = local_e70 + 1;
                              lVar65 = lVar65 + local_ce0;
                              lVar44 = lVar44 + local_ce0;
                              lVar79 = lVar79 + local_ce0;
                              local_f88 = local_f88 + local_ce0;
                              lVar70 = lVar70 + local_ce0;
                              lVar75 = lVar75 + local_ce0;
                              local_fd0 = local_fd0 + local_ce0;
                              local_f90 = local_f90 + local_ce0;
                              local_ff0 = local_ff0 + local_ce0;
                              local_ea0 = local_ea0 + local_ce0;
                              local_f18 = local_f18 + lVar53;
                              local_f48 = (double *)((long)local_f48 + local_ce0);
                              local_f68 = local_f68 + local_ce0;
                              local_f60 = local_f60 + local_ce0;
                              local_f40 = local_f40 + local_ce0;
                              local_fb0 = local_fb0 + local_ce0;
                              local_f78 = local_f78 + local_ce0;
                              local_fd8 = (double *)((long)local_fd8 + local_ce0);
                              local_f98 = local_f98 + local_ce0;
                              local_fe8 = (double *)((long)local_fe8 + local_ce0);
                              local_f38 = local_f38 + local_ce0;
                              iVar37 = iVar37 + 1;
                              local_fc8 = (double *)((long)local_fc8 + local_d20);
                              local_ea8 = local_ea8 + local_d20;
                              local_e60 = local_e60 + local_d20;
                              local_f50 = local_f50 + local_d20;
                              lVar43 = lVar43 + local_d20;
                              lVar67 = lVar67 + local_d20;
                              uVar102 = uVar102 + local_d20;
                            } while (local_a28.bigend.vect[1] + 1U != (int)local_e70);
                          }
                          local_d80 = local_d80 + 1;
                          local_b00 = CONCAT44(local_b00._4_4_,(int)local_b00 + 1);
                          local_d40 = local_d40 + lVar83;
                          local_f10 = local_f10 + lVar83;
                          local_d00 = local_d00 + local_cb8;
                          local_ee8 = local_ee8 + lVar83;
                          local_ef0 = local_ef0 + lVar83;
                          local_cd8 = local_cd8 + lVar83;
                          local_ca8 = local_ca8 + lVar83;
                          local_bc0 = local_bc0 + lVar83;
                          local_bc8 = local_bc8 + lVar83;
                          local_bd0 = local_bd0 + lVar83;
                          local_bd8 = local_bd8 + lVar83;
                          local_be0 = local_be0 + lVar83;
                          local_be8 = local_be8 + lVar83;
                          local_d28 = local_d28 + lVar83;
                          local_cb0 = local_cb0 + lVar68;
                          local_b90 = local_b90 + lVar68;
                          local_b98 = local_b98 + lVar68;
                          local_ba0 = local_ba0 + lVar68;
                          local_ba8 = local_ba8 + lVar68;
                          local_bb0 = local_bb0 + lVar68;
                          local_af8 = local_af8 + lVar68;
                        } while (local_a28.bigend.vect[2] != (int)local_d80);
                      }
                      local_b08 = CONCAT44(local_b08._4_4_,local_a28.bigend.vect[2]);
                      local_fe0 = (long)local_d68.smallend.vect[2];
                      lVar49 = local_cf0;
                      lVar56 = local_ca0;
                      iVar33 = local_d68.bigend.vect[2];
                      if (local_d68.smallend.vect[2] <= local_d68.bigend.vect[2]) {
                        lVar49 = lVar62 * 0x38 + local_fe0 * 8 + lVar39 * -8;
                        lVar86 = local_fe0 * 8 + lVar62 * 0x28 + lVar39 * -8;
                        lVar83 = lVar62 * 0x30 + local_fe0 * 8 + lVar39 * -8;
                        lVar56 = local_fe0 * 8 + lVar62 * 0x18 + lVar39 * -8;
                        lVar97 = (long)local_d68.smallend.vect[1];
                        lVar82 = (lVar49 + -8) * lVar57 + lVar97 * 8 + lVar40 * -8;
                        lVar66 = lVar49 * lVar57 + lVar97 * 8 + lVar40 * -8;
                        lVar53 = (lVar62 * 0x20 + local_fe0 * 8 + lVar39 * -8) * lVar57 + lVar97 * 8
                                 + lVar40 * -8;
                        lVar63 = (lVar83 + -8) * lVar57 + lVar97 * 8 + lVar40 * -8;
                        lVar49 = lVar83 * lVar57 + lVar97 * 8 + lVar40 * -8;
                        lVar50 = lVar97 * 8 + (lVar62 * 0x10 + local_fe0 * 8 + lVar39 * -8) * lVar57
                                 + lVar40 * -8;
                        lVar83 = (long)local_d68.smallend.vect[0];
                        local_e50 = lVar83 * 8 + lVar82 * lVar48 + lVar74 * -8 + (long)pdVar32;
                        local_dc8 = lVar83 * 8 +
                                    ((lVar86 + -8) * lVar57 + lVar97 * 8 + lVar40 * -8) * lVar48 +
                                    lVar74 * -8 + (long)pdVar32;
                        local_e58 = lVar83 * 8 + lVar66 * lVar48 + lVar74 * -8 + (long)pdVar32;
                        local_d30 = (lVar86 * lVar57 + lVar97 * 8 + lVar40 * -8) * lVar48 +
                                    lVar83 * 8 + lVar74 * -8 + (long)pdVar32;
                        local_d78 = lVar53 * lVar48 + lVar83 * 8 + lVar74 * -8 + (long)pdVar32;
                        local_ce8 = ((lVar62 * 8 + local_fe0 * 8 + lVar39 * -8) * lVar57 +
                                     lVar97 * 8 + lVar40 * -8) * lVar48 + lVar83 * 8 + lVar74 * -8 +
                                    (long)pdVar32;
                        local_cc8 = (lVar82 + -8) * lVar48 + lVar83 * 8 + lVar74 * -8 +
                                    (long)pdVar32;
                        local_d38 = (lVar66 + -8) * lVar48 + lVar83 * 8 + lVar74 * -8 +
                                    (long)pdVar32;
                        local_f20 = (lVar53 + -8) * lVar48 + lVar83 * 8 + lVar74 * -8 +
                                    (long)pdVar32;
                        local_f00 = lVar63 * lVar48 + lVar83 * 8 + lVar74 * -8 + (long)pdVar32;
                        local_cf8 = ((lVar56 + -8) * lVar57 + lVar97 * 8 + lVar40 * -8) * lVar48 +
                                    lVar83 * 8 + lVar74 * -8 + (long)pdVar32;
                        local_c80 = ((lVar62 * 0x40 + local_fe0 * 8 + lVar39 * -8) * lVar57 +
                                     lVar97 * 8 + lVar40 * -8) * lVar48 + lVar83 * 8 + lVar74 * -8 +
                                    (long)pdVar32;
                        local_c90 = (lVar97 * 8 + (local_fe0 - lVar39) * lVar57 * 8 + lVar40 * -8) *
                                    lVar48 + lVar83 * 8 + lVar74 * -8 + (long)pdVar32;
                        local_cd0 = lVar49 * lVar48 + lVar83 * 8 + lVar74 * -8 + (long)pdVar32;
                        local_c98 = (lVar56 * lVar57 + lVar97 * 8 + lVar40 * -8) * lVar48 +
                                    lVar83 * 8 + lVar74 * -8 + (long)pdVar32;
                        local_d80 = lVar50 * lVar48 + lVar83 * 8 + lVar74 * -8 + (long)pdVar32;
                        local_d88 = (lVar63 + -8) * lVar48 + lVar83 * 8 + lVar74 * -8 +
                                    (long)pdVar32;
                        local_d40 = (lVar49 + -8) * lVar48 + lVar83 * 8 + lVar74 * -8 +
                                    (long)pdVar32;
                        local_f10 = (lVar50 + -8) * lVar48 + lVar83 * 8 + lVar74 * -8 +
                                    (long)pdVar32;
                        local_d08 = (double *)
                                    ((long)local_d08 +
                                    (lVar97 * 8 + (local_fe0 - lVar60) * local_b18 * 8 +
                                    local_c88 * -8) * local_cf0 + lVar83 * 8 + lVar61 * -8);
                        iVar33 = local_d68.bigend.vect[2] + 1;
                        local_c88 = lVar57 * lVar48 * 8;
                        lVar48 = lVar48 * 8;
                        local_d28 = CONCAT44(local_d28._4_4_,local_d68.smallend.vect[0] + 1);
                        local_d18 = lVar83 * 8;
                        local_cd8 = lVar97 + -1;
                        local_e08 = local_fe0 + -1;
                        local_d10 = CONCAT44(local_d10._4_4_,local_d68.smallend.vect[2] + 1);
                        local_ca8 = CONCAT44(local_ca8._4_4_,local_d68.smallend.vect[1] + 1);
                        do {
                          if (local_d68.smallend.vect[1] <= local_d68.bigend.vect[1]) {
                            local_ce0 = local_fe0 + -1;
                            lVar40 = (long)local_c18;
                            iVar81 = (int)local_fe0 + 1;
                            local_d20 = CONCAT44(local_d20._4_4_,iVar81);
                            local_fe8 = (double *)
                                        ((long)local_a68.p +
                                        (lVar97 - local_a68.begin.y) * local_a68.jstride * 8 +
                                        (local_fe0 - local_a68.begin.z) * local_a68.kstride * 8 +
                                        (long)local_a68.begin.x * -8 + local_d18);
                            lVar74 = CONCAT44(bx_1.bigend.vect[0],bx_1.smallend.vect[2]) * 4;
                            lVar60 = (local_cd8 - (int)local_c14) * lVar74;
                            lVar56 = CONCAT44(bx_1.bigend.vect[2],bx_1.bigend.vect[1]) * 4;
                            lVar39 = (local_fe0 - (int)local_c10) * lVar56;
                            lVar56 = (local_e08 - (int)local_c10) * lVar56;
                            lVar57 = (lVar97 - (int)local_c14) * lVar74;
                            lVar49 = bx_1.smallend.vect._0_8_ + lVar83 * 4;
                            local_ec8 = lVar60 + lVar39 + lVar40 * -4 + lVar49;
                            local_fd8 = (double *)(lVar60 + lVar56 + lVar40 * -4 + lVar49);
                            local_ef8 = lVar39 + lVar57 + lVar40 * -4 + lVar49;
                            local_f18 = (double *)(lVar57 + lVar56 + lVar40 * -4 + lVar49);
                            local_f68 = (long)local_ae8.p +
                                        (lVar97 - local_ae8.begin.y) * local_ae8.jstride * 4 +
                                        (local_fe0 - local_ae8.begin.z) * local_ae8.kstride * 4 +
                                        (long)local_ae8.begin.x * -4 + lVar83 * 4;
                            local_f48 = local_d08;
                            local_fc8 = (double *)local_f10;
                            local_1000 = local_d40;
                            local_ff8 = local_d88;
                            local_fb0 = local_d80;
                            local_fb8 = local_c98;
                            local_ff0 = local_cd0;
                            local_f80 = local_c90;
                            local_ea0 = local_c80;
                            local_fa0 = local_cf8;
                            local_f38 = local_f00;
                            local_fa8 = local_f20;
                            local_f70 = local_d38;
                            local_f88 = local_cc8;
                            local_fd0 = local_ce8;
                            local_f90 = local_d78;
                            local_f98 = local_d30;
                            local_f78 = local_e58;
                            local_f40 = local_dc8;
                            local_f60 = local_e50;
                            local_fc0 = (double *)lVar97;
                            local_de8 = local_cd8;
                            iVar37 = local_d68.smallend.vect[1] + 1;
                            do {
                              if (local_d68.smallend.vect[0] <= local_d68.bigend.vect[0]) {
                                lVar49 = (long)local_fc0 - (long)local_958.begin.y;
                                lVar91 = local_958.jstride * lVar49;
                                lVar39 = (long)local_958.begin.z;
                                lVar50 = local_958.kstride * (local_fe0 - lVar39);
                                lVar87 = (lVar49 + -1) * local_958.jstride;
                                lVar84 = (((int)local_fc0 - local_958.begin.y) + 1) *
                                         local_958.jstride;
                                lVar86 = (local_ce0 - lVar39) * local_958.kstride;
                                lVar53 = (iVar81 - local_958.begin.z) * local_958.kstride;
                                lVar82 = local_958.jstride * 8;
                                lVar49 = lVar49 * lVar82;
                                lVar66 = local_958.kstride * 8;
                                lVar61 = ((int)local_d10 - local_958.begin.z) * lVar66;
                                lVar62 = (local_e08 - lVar39) * lVar66;
                                lVar66 = lVar66 * (local_fe0 - lVar39);
                                lVar60 = (local_de8 - local_958.begin.y) * lVar82;
                                lVar82 = (iVar37 - local_958.begin.y) * lVar82;
                                lVar63 = (long)local_958.begin.x;
                                lVar39 = lVar49 + lVar61 + lVar63 * -8 + local_d18;
                                lVar40 = lVar62 + lVar49 + lVar63 * -8 + local_d18;
                                lVar49 = lVar49 + lVar66 + lVar63 * -8 + local_d18;
                                lVar56 = lVar60 + lVar61 + lVar63 * -8 + local_d18;
                                lVar57 = lVar62 + lVar60 + lVar63 * -8 + local_d18;
                                lVar60 = lVar60 + lVar66 + lVar63 * -8 + local_d18;
                                lVar61 = lVar61 + lVar82 + lVar63 * -8 + local_d18;
                                lVar62 = lVar62 + lVar82 + lVar63 * -8 + local_d18;
                                lVar82 = lVar82 + lVar66 + lVar63 * -8 + local_d18;
                                lVar63 = 0;
                                do {
                                  *(double *)(local_f80 + lVar63 * 8) =
                                       -(*(double *)(local_fd0 + -8 + lVar63 * 8) +
                                         *(double *)(local_fd0 + lVar63 * 8) +
                                         *(double *)((long)local_fc8 + lVar63 * 8) +
                                         *(double *)(local_fb0 + lVar63 * 8) +
                                         *(double *)(local_fa0 + lVar63 * 8) +
                                         *(double *)(local_fb8 + lVar63 * 8) +
                                         *(double *)(local_fa8 + -8 + lVar63 * 8) +
                                         *(double *)(local_fa8 + lVar63 * 8) +
                                         *(double *)(local_f90 + -8 + lVar63 * 8) +
                                         *(double *)(local_f90 + lVar63 * 8) +
                                         *(double *)(local_f40 + -8 + lVar63 * 8) +
                                         *(double *)(local_f40 + lVar63 * 8) +
                                         *(double *)(local_f98 + -8 + lVar63 * 8) +
                                         *(double *)(local_f98 + lVar63 * 8) +
                                         *(double *)(local_ff8 + lVar63 * 8) +
                                         *(double *)(local_f38 + lVar63 * 8) +
                                         *(double *)(local_1000 + lVar63 * 8) +
                                         *(double *)(local_ff0 + lVar63 * 8) +
                                         *(double *)(local_f88 + -8 + lVar63 * 8) +
                                         *(double *)(local_f88 + lVar63 * 8) +
                                         *(double *)(local_f60 + -8 + lVar63 * 8) +
                                         *(double *)(local_f60 + lVar63 * 8) +
                                         *(double *)(local_f70 + -8 + lVar63 * 8) +
                                         *(double *)(local_f70 + lVar63 * 8) +
                                         *(double *)(local_f78 + -8 + lVar63 * 8) +
                                        *(double *)(local_f78 + lVar63 * 8));
                                  *(double *)(local_ea0 + lVar63 * 8) =
                                       1.0 / (ABS(*(double *)(local_f78 + lVar63 * 8)) +
                                              ABS(*(double *)(local_f78 + -8 + lVar63 * 8)) +
                                              ABS(*(double *)(local_f70 + lVar63 * 8)) +
                                              ABS(*(double *)(local_f70 + -8 + lVar63 * 8)) +
                                              ABS(*(double *)(local_f60 + lVar63 * 8)) +
                                              ABS(*(double *)(local_f60 + -8 + lVar63 * 8)) +
                                              ABS(*(double *)(local_f88 + lVar63 * 8)) +
                                              ABS(*(double *)(local_f88 + -8 + lVar63 * 8)) +
                                              ABS(*(double *)(local_ff0 + lVar63 * 8)) +
                                              ABS(*(double *)(local_1000 + lVar63 * 8)) +
                                              ABS(*(double *)(local_f38 + lVar63 * 8)) +
                                              ABS(*(double *)(local_ff8 + lVar63 * 8)) +
                                              ABS(*(double *)(local_f98 + lVar63 * 8)) +
                                              ABS(*(double *)(local_f98 + -8 + lVar63 * 8)) +
                                              ABS(*(double *)(local_f40 + lVar63 * 8)) +
                                              ABS(*(double *)(local_f40 + -8 + lVar63 * 8)) +
                                              ABS(*(double *)(local_f90 + lVar63 * 8)) +
                                              ABS(*(double *)(local_f90 + -8 + lVar63 * 8)) +
                                              ABS(*(double *)(local_fa8 + lVar63 * 8)) +
                                              ABS(*(double *)(local_fa8 + -8 + lVar63 * 8)) +
                                              ABS(*(double *)(local_fb8 + lVar63 * 8)) +
                                              ABS(*(double *)(local_fa0 + lVar63 * 8)) +
                                              ABS(*(double *)(local_fb0 + lVar63 * 8)) +
                                              ABS(*(double *)((long)local_fc8 + lVar63 * 8)) +
                                              ABS(*(double *)(local_fd0 + lVar63 * 8)) +
                                              ABS(*(double *)(local_fd0 + -8 + lVar63 * 8)) + 1e-100
                                             );
                                  dVar110 = 0.0;
                                  if (*(int *)(local_f68 + lVar63 * 4) == 0) {
                                    lVar66 = (long)(((local_d68.smallend.vect[0] + 1) -
                                                    local_958.begin.x) + (int)lVar63);
                                    dVar110 = local_958.p[lVar84 + lVar66 + lVar53] *
                                              *(double *)(local_f78 + lVar63 * 8) +
                                              *(double *)
                                               ((long)local_958.p + lVar63 * 8 + lVar61 + -8) *
                                              *(double *)(local_f78 + -8 + lVar63 * 8) +
                                              local_958.p[lVar87 + lVar66 + lVar53] *
                                              *(double *)(local_f70 + lVar63 * 8) +
                                              *(double *)
                                               ((long)local_958.p + lVar63 * 8 + lVar56 + -8) *
                                              *(double *)(local_f70 + -8 + lVar63 * 8) +
                                              local_958.p[lVar84 + lVar66 + lVar86] *
                                              *(double *)(local_f60 + lVar63 * 8) +
                                              *(double *)
                                               ((long)local_958.p + lVar63 * 8 + lVar62 + -8) *
                                              *(double *)(local_f60 + -8 + lVar63 * 8) +
                                              local_958.p[lVar87 + lVar66 + lVar86] *
                                              *(double *)(local_f88 + lVar63 * 8) +
                                              *(double *)
                                               ((long)local_958.p + lVar63 * 8 + lVar57 + -8) *
                                              *(double *)(local_f88 + -8 + lVar63 * 8) +
                                              *(double *)((long)local_958.p + lVar63 * 8 + lVar61) *
                                              *(double *)(local_ff0 + lVar63 * 8) +
                                              *(double *)((long)local_958.p + lVar63 * 8 + lVar56) *
                                              *(double *)(local_1000 + lVar63 * 8) +
                                              *(double *)((long)local_958.p + lVar63 * 8 + lVar62) *
                                              *(double *)(local_f38 + lVar63 * 8) +
                                              *(double *)((long)local_958.p + lVar63 * 8 + lVar57) *
                                              *(double *)(local_ff8 + lVar63 * 8) +
                                              local_958.p[lVar91 + lVar66 + lVar53] *
                                              *(double *)(local_f98 + lVar63 * 8) +
                                              *(double *)
                                               ((long)local_958.p + lVar63 * 8 + lVar39 + -8) *
                                              *(double *)(local_f98 + -8 + lVar63 * 8) +
                                              local_958.p[lVar91 + lVar66 + lVar86] *
                                              *(double *)(local_f40 + lVar63 * 8) +
                                              *(double *)
                                               ((long)local_958.p + lVar63 * 8 + lVar40 + -8) *
                                              *(double *)(local_f40 + -8 + lVar63 * 8) +
                                              local_958.p[lVar84 + lVar66 + lVar50] *
                                              *(double *)(local_f90 + lVar63 * 8) +
                                              *(double *)
                                               ((long)local_958.p + lVar63 * 8 + lVar82 + -8) *
                                              *(double *)(local_f90 + -8 + lVar63 * 8) +
                                              local_958.p[lVar87 + lVar66 + lVar50] *
                                              *(double *)(local_fa8 + lVar63 * 8) +
                                              *(double *)
                                               ((long)local_958.p + lVar63 * 8 + lVar60 + -8) *
                                              *(double *)(local_fa8 + -8 + lVar63 * 8) +
                                              *(double *)((long)local_958.p + lVar63 * 8 + lVar39) *
                                              *(double *)(local_fb8 + lVar63 * 8) +
                                              *(double *)((long)local_958.p + lVar63 * 8 + lVar40) *
                                              *(double *)(local_fa0 + lVar63 * 8) +
                                              *(double *)((long)local_958.p + lVar63 * 8 + lVar82) *
                                              *(double *)(local_fb0 + lVar63 * 8) +
                                              *(double *)((long)local_958.p + lVar63 * 8 + lVar60) *
                                              *(double *)((long)local_fc8 + lVar63 * 8) +
                                              local_958.p[lVar91 + lVar66 + lVar50] *
                                              *(double *)(local_fd0 + lVar63 * 8) +
                                              *(double *)((long)local_958.p + lVar63 * 8 + lVar49) *
                                              *(double *)(local_f80 + lVar63 * 8) +
                                              *(double *)
                                               ((long)local_958.p + lVar63 * 8 + lVar49 + -8) *
                                              *(double *)(local_fd0 + -8 + lVar63 * 8);
                                  }
                                  *(double *)((long)local_fe8 + lVar63 * 8) = dVar110;
                                  iVar35 = *(int *)((long)local_fd8 + -4 + lVar63 * 4);
                                  if ((iVar35 == 0) ||
                                     (((((*(int *)((long)local_fd8 + lVar63 * 4) == 0 ||
                                         (*(int *)((long)local_f18 + -4 + lVar63 * 4) == 0)) ||
                                        ((*(int *)((long)local_f18 + lVar63 * 4) == 0 ||
                                         (((*(int *)(local_ec8 + -4 + lVar63 * 4) == 0 ||
                                           (*(int *)(local_ec8 + lVar63 * 4) == 0)) ||
                                          (*(int *)(local_ef8 + -4 + lVar63 * 4) == 0)))))) ||
                                       (dVar119 = 0.0, *(int *)(local_ef8 + lVar63 * 4) == 0)) &&
                                      (((iVar35 == 0 ||
                                        (*(int *)((long)local_fd8 + lVar63 * 4) == 0)) ||
                                       ((((*(int *)((long)local_f18 + -4 + lVar63 * 4) == 0 ||
                                          ((*(int *)((long)local_f18 + lVar63 * 4) == 0 ||
                                           (*(int *)(local_ec8 + -4 + lVar63 * 4) == 0)))) ||
                                         (*(int *)(local_ec8 + lVar63 * 4) == 0)) ||
                                        ((*(int *)(local_ef8 + -4 + lVar63 * 4) == 0 ||
                                         (dVar119 = 0.0, *(int *)(local_ef8 + lVar63 * 4) == 0))))))
                                      )))) {
                                    if (((bx.smallend.vect[0] - lVar83 != lVar63) ||
                                        ((dVar119 = 2.0, LVar21 != Neumann &&
                                         (dVar119 = 2.0, LVar21 != inflow)))) &&
                                       (dVar119 = 1.0, bx.bigend.vect[0] - lVar83 == lVar63)) {
                                      dVar119 = dVar10;
                                    }
                                    if (((local_fc0 == (double *)(long)bx.smallend.vect[1]) &&
                                        (((int)local_cc0 == 0x6a || ((int)local_cc0 == 0x66)))) ||
                                       ((local_fc0 == (double *)(long)bx.bigend.vect[1] &&
                                        ((LVar23 == inflow || (LVar23 == Neumann)))))) {
                                      dVar119 = dVar119 + dVar119;
                                    }
                                    if (((local_fe0 == bx.smallend.vect[2]) &&
                                        ((LVar22 == inflow || (LVar22 == Neumann)))) ||
                                       ((local_fe0 == bx.bigend.vect[2] &&
                                        ((LVar24 == inflow || (LVar24 == Neumann)))))) {
                                      dVar119 = dVar119 + dVar119;
                                    }
                                    dVar119 = (local_f48[lVar63] - dVar110) * dVar119;
                                  }
                                  *(double *)((long)local_fe8 + lVar63 * 8) = dVar119;
                                  lVar63 = lVar63 + 1;
                                } while ((local_d68.bigend.vect[0] - local_d68.smallend.vect[0]) + 1
                                         != (int)lVar63);
                              }
                              local_fc0 = (double *)((long)local_fc0 + 1);
                              local_fe8 = (double *)((long)local_fe8 + local_a68.jstride * 8);
                              local_ec8 = local_ec8 + lVar74;
                              local_fd8 = (double *)((long)local_fd8 + lVar74);
                              local_ef8 = local_ef8 + lVar74;
                              local_f18 = (double *)((long)local_f18 + lVar74);
                              local_de8 = local_de8 + 1;
                              iVar37 = iVar37 + 1;
                              local_f60 = local_f60 + lVar48;
                              local_f40 = local_f40 + lVar48;
                              local_f78 = local_f78 + lVar48;
                              local_f98 = local_f98 + lVar48;
                              local_f90 = local_f90 + lVar48;
                              local_fd0 = local_fd0 + lVar48;
                              local_f88 = local_f88 + lVar48;
                              local_f70 = local_f70 + lVar48;
                              local_fa8 = local_fa8 + lVar48;
                              local_f38 = local_f38 + lVar48;
                              local_fa0 = local_fa0 + lVar48;
                              local_ea0 = local_ea0 + lVar48;
                              local_f80 = local_f80 + lVar48;
                              local_ff0 = local_ff0 + lVar48;
                              local_fb8 = local_fb8 + lVar48;
                              local_fb0 = local_fb0 + lVar48;
                              local_ff8 = local_ff8 + lVar48;
                              local_1000 = local_1000 + lVar48;
                              local_fc8 = (double *)((long)local_fc8 + lVar48);
                              local_f68 = local_f68 + local_ae8.jstride * 4;
                              local_f48 = local_f48 + local_cf0;
                            } while (local_d68.bigend.vect[1] + 1U != (int)local_fc0);
                          }
                          local_fe0 = local_fe0 + 1;
                          local_e08 = local_e08 + 1;
                          local_d10 = CONCAT44(local_d10._4_4_,(int)local_d10 + 1);
                          local_e50 = local_e50 + local_c88;
                          local_dc8 = local_dc8 + local_c88;
                          local_e58 = local_e58 + local_c88;
                          local_d30 = local_d30 + local_c88;
                          local_d78 = local_d78 + local_c88;
                          local_ce8 = local_ce8 + local_c88;
                          local_cc8 = local_cc8 + local_c88;
                          local_d38 = local_d38 + local_c88;
                          local_f20 = local_f20 + local_c88;
                          local_f00 = local_f00 + local_c88;
                          local_cf8 = local_cf8 + local_c88;
                          local_c80 = local_c80 + local_c88;
                          local_c90 = local_c90 + local_c88;
                          local_cd0 = local_cd0 + local_c88;
                          local_c98 = local_c98 + local_c88;
                          local_d80 = local_d80 + local_c88;
                          local_d88 = local_d88 + local_c88;
                          local_d40 = local_d40 + local_c88;
                          local_f10 = local_f10 + local_c88;
                          local_d08 = local_d08 + local_ca0;
                          lVar49 = local_cf0 * 8;
                          lVar56 = local_ca0 * 8;
                        } while (iVar33 != (int)local_fe0);
                      }
                      local_ca0 = lVar56;
                      local_cf0 = lVar49;
                      local_d00 = (double *)CONCAT44(local_d00._4_4_,iVar33);
                      bx_5.smallend.vect._0_8_ = uVar28;
                      Gpu::Elixir::~Elixir(&cneli);
                      Gpu::Elixir::~Elixir(&steneli);
                      lVar74 = local_cf0;
                      lVar62 = local_ca0;
                    }
                    else {
                      BATransformer::operator()
                                (&bx_4,(BATransformer *)
                                       (CONCAT44(mfi_1.fabArray._4_4_,(int)mfi_1.fabArray) + 8),
                                 (Box *)((long)((mfi_1.index_map)->
                                               super_vector<int,_std::allocator<int>_>).
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start[mfi_1.currentIndex]
                                         * 0x1c + **(long **)(CONCAT44(mfi_1.fabArray._4_4_,
                                                                       (int)mfi_1.fabArray) + 0x50))
                                );
                      bx_6.bigend.vect[1] = bx_4.bigend.vect[1];
                      bx_6.bigend.vect[2] = bx_4.bigend.vect[2];
                      bx_6.btype = bx_4.btype;
                      bx_6.smallend.vect[0] = bx_4.smallend.vect[0];
                      bx_6.smallend.vect[1] = bx_4.smallend.vect[1];
                      uVar28 = bx_6.smallend.vect._0_8_;
                      bx_6.smallend.vect[2] = bx_4.smallend.vect[2];
                      bx_6.bigend.vect[0] = bx_4.bigend.vect[0];
                      lVar74 = 0;
                      do {
                        if ((bx_4.btype.itype >> ((uint)lVar74 & 0x1f) & 1) != 0) {
                          piVar41 = bx_6.bigend.vect + lVar74;
                          *piVar41 = *piVar41 + -1;
                        }
                        lVar74 = lVar74 + 1;
                      } while (lVar74 != 3);
                      bx_6.smallend.vect[0] = bx_4.smallend.vect[0];
                      bx_6.smallend.vect[1] = bx_4.smallend.vect[1];
                      iVar33 = bx_6.smallend.vect[0];
                      if (bx_6.smallend.vect[0] < bx_2.smallend.vect[0]) {
                        iVar33 = bx_2.smallend.vect[0];
                      }
                      iVar37 = bx_6.smallend.vect[1];
                      if (bx_6.smallend.vect[1] < bx_2.smallend.vect[1]) {
                        iVar37 = bx_2.smallend.vect[1];
                      }
                      iVar81 = bx_4.smallend.vect[2];
                      if (bx_4.smallend.vect[2] < bx_2.smallend.vect[2]) {
                        iVar81 = bx_2.smallend.vect[2];
                      }
                      iVar35 = bx_6.bigend.vect[0];
                      if (bx_2.bigend.vect[0] < bx_6.bigend.vect[0]) {
                        iVar35 = bx_2.bigend.vect[0];
                      }
                      iVar73 = bx_6.bigend.vect[1];
                      if (bx_2.bigend.vect[1] < bx_6.bigend.vect[1]) {
                        iVar73 = bx_2.bigend.vect[1];
                      }
                      iVar59 = bx_6.bigend.vect[2];
                      if (bx_2.bigend.vect[2] < bx_6.bigend.vect[2]) {
                        iVar59 = bx_2.bigend.vect[2];
                      }
                      bx_6.smallend.vect._0_8_ = uVar28;
                      if (*plVar27 == 0) {
                        lVar74 = (long)bx_2.smallend.vect[2];
                        if (bx_2.smallend.vect[2] <= bx_2.bigend.vect[2]) {
                          RVar20 = this->m_const_sigma;
                          lVar62 = (long)bx_2.smallend.vect[0];
                          do {
                            if (bx_2.smallend.vect[1] <= bx_2.bigend.vect[1]) {
                              lVar82 = (long)bx_2.smallend.vect[1];
                              do {
                                if (bx_2.smallend.vect[0] <= bx_2.bigend.vect[0]) {
                                  lVar83 = 0;
                                  do {
                                    if ((((((lVar62 + lVar83 < (long)iVar33) || (lVar82 < iVar37))
                                          || (lVar74 < iVar81)) ||
                                         (((long)iVar35 < lVar62 + lVar83 || (iVar73 < lVar82)))) ||
                                        (iVar59 < lVar74)) ||
                                       (RVar120 = RVar20,
                                       lVar97 = (lVar74 - lVar49) * lVar56 +
                                                (lVar82 - lVar48) * lVar57,
                                       *(int *)((lVar74 - (int)local_c10) *
                                                CONCAT44(bx_1.bigend.vect[2],bx_1.bigend.vect[1]) *
                                                4 + (lVar82 - (int)local_c14) *
                                                    CONCAT44(bx_1.bigend.vect[0],
                                                             bx_1.smallend.vect[2]) * 4 +
                                                (long)local_c18 * -4 +
                                                bx_1.smallend.vect._0_8_ + lVar62 * 4 + lVar83 * 4)
                                       == 0)) {
                                      RVar120 = 0.0;
                                      lVar97 = (lVar74 - lVar49) * lVar56 +
                                               (lVar82 - lVar48) * lVar57;
                                    }
                                    (pdVar32 + lVar97)[(lVar62 + lVar83) - lVar40] = RVar120;
                                    lVar83 = lVar83 + 1;
                                  } while ((bx_2.bigend.vect[0] - bx_2.smallend.vect[0]) + 1 !=
                                           (int)lVar83);
                                }
                                lVar82 = lVar82 + 1;
                              } while (bx_2.bigend.vect[1] + 1 != (int)lVar82);
                            }
                            lVar74 = lVar74 + 1;
                          } while (bx_2.bigend.vect[2] + 1 != (int)lVar74);
                        }
                      }
                      else {
                        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                                  ((Array4<const_double> *)&bx_6,
                                   (FabArray<amrex::FArrayBox> *)*plVar27,&mfi_1);
                        lVar74 = (long)bx_2.smallend.vect[2];
                        if (bx_2.smallend.vect[2] <= bx_2.bigend.vect[2]) {
                          lVar62 = (long)bx_2.smallend.vect[0];
                          do {
                            if (bx_2.smallend.vect[1] <= bx_2.bigend.vect[1]) {
                              lVar82 = (long)bx_2.smallend.vect[1];
                              do {
                                if (bx_2.smallend.vect[0] <= bx_2.bigend.vect[0]) {
                                  pdVar99 = pdVar32 + (lVar74 - lVar49) * lVar56 +
                                                      (lVar82 - lVar48) * lVar57;
                                  lVar83 = 0;
                                  do {
                                    dVar110 = 0.0;
                                    pdVar76 = pdVar99;
                                    if (((((long)iVar33 <= lVar62 + lVar83) && (iVar37 <= lVar82))
                                        && ((iVar81 <= lVar74 &&
                                            (((lVar62 + lVar83 <= (long)iVar35 && (lVar82 <= iVar73)
                                              ) && (lVar74 <= iVar59)))))) &&
                                       (*(int *)((lVar82 - (int)local_c14) *
                                                 CONCAT44(bx_1.bigend.vect[0],bx_1.smallend.vect[2])
                                                 * 4 + (lVar74 - (int)local_c10) *
                                                       CONCAT44(bx_1.bigend.vect[2],
                                                                bx_1.bigend.vect[1]) * 4 +
                                                 (long)local_c18 * -4 +
                                                 bx_1.smallend.vect._0_8_ + lVar62 * 4 + lVar83 * 4)
                                        != 0)) {
                                      dVar110 = *(double *)
                                                 ((lVar82 - local_9e4) *
                                                  CONCAT44(bx_6.bigend.vect[0],bx_6.smallend.vect[2]
                                                          ) * 8 +
                                                  (lVar74 - local_9e0) *
                                                  CONCAT44(bx_6.bigend.vect[2],bx_6.bigend.vect[1])
                                                  * 8 + (long)local_9e8 * -8 +
                                                  bx_6.smallend.vect._0_8_ + lVar62 * 8 + lVar83 * 8
                                                 );
                                      pdVar76 = pdVar32 + (lVar74 - lVar49) * lVar56 +
                                                          (lVar82 - lVar48) * lVar57;
                                    }
                                    pdVar76[(lVar62 + lVar83) - lVar40] = dVar110;
                                    lVar83 = lVar83 + 1;
                                  } while ((bx_2.bigend.vect[0] - bx_2.smallend.vect[0]) + 1 !=
                                           (int)lVar83);
                                }
                                lVar82 = lVar82 + 1;
                              } while (bx_2.bigend.vect[1] + 1 != (int)lVar82);
                            }
                            lVar74 = lVar74 + 1;
                          } while (bx_2.bigend.vect[2] + 1 != (int)lVar74);
                        }
                      }
                      local_1000 = (long)local_d68.smallend.vect[2];
                      local_d20 = CONCAT44(local_d20._4_4_,local_d68.bigend.vect[2]);
                      lVar74 = local_cf0;
                      lVar62 = local_ca0;
                      if (local_d68.smallend.vect[2] <= local_d68.bigend.vect[2]) {
                        local_d28 = (ulong)(uint)local_d68.bigend.vect[1];
                        lVar82 = (long)local_d68.smallend.vect[1];
                        lVar83 = (long)local_d68.smallend.vect[0];
                        lVar74 = lVar82 * 8;
                        local_d08 = (double *)
                                    ((long)local_d08 +
                                    (lVar74 + (local_1000 - lVar60) * local_b18 * 8 + local_c88 * -8
                                    ) * local_cf0 + lVar83 * 8 + lVar61 * -8);
                        local_eb8 = local_1000 + -1;
                        lVar60 = lVar74 + (local_1000 - lVar49) * lVar39 * 8 + lVar48 * -8;
                        lVar74 = lVar74 + (local_eb8 - lVar49) * lVar39 * 8 + lVar48 * -8;
                        local_d20 = CONCAT44(local_d20._4_4_,local_d68.bigend.vect[2] + 1);
                        local_e08 = (lVar60 + -8) * lVar57 + lVar83 * 8 + lVar40 * -8 +
                                    (long)pdVar32;
                        lVar56 = lVar56 * 8;
                        lVar39 = lVar57 * 8;
                        local_d10 = (lVar74 + -8) * lVar57 + lVar83 * 8 + lVar40 * -8 +
                                    (long)pdVar32;
                        local_d18 = lVar60 * lVar57 + lVar83 * 8 + lVar40 * -8 + (long)pdVar32;
                        local_ce0 = lVar74 * lVar57 + lVar83 * 8 + lVar40 * -8 + (long)pdVar32;
                        lVar40 = lVar83 * 8;
                        local_d30 = CONCAT44(local_d30._4_4_,local_d68.smallend.vect[1] + 1);
                        iVar33 = local_d68.smallend.vect[2];
                        do {
                          iVar33 = iVar33 + 1;
                          if (local_d68.smallend.vect[1] <= local_d68.bigend.vect[1]) {
                            lVar49 = CONCAT44(bx_1.bigend.vect[0],bx_1.smallend.vect[2]);
                            lVar60 = (long)local_c18;
                            lVar74 = CONCAT44(bx_1.bigend.vect[2],bx_1.bigend.vect[1]);
                            lVar62 = (int)(~local_c10 + (int)local_1000) * lVar74;
                            lVar97 = lVar74 * (local_1000 - (int)local_c10);
                            local_ff0 = (long)local_a68.p +
                                        (lVar82 - local_a68.begin.y) * local_a68.jstride * 8 +
                                        (local_1000 - local_a68.begin.z) * local_a68.kstride * 8 +
                                        (long)local_a68.begin.x * -8 + lVar40;
                            lVar86 = (local_1000 - (int)local_c10) * lVar74 * 4;
                            lVar48 = lVar49 * 4;
                            lVar61 = (long)(int)((int)local_eb8 - local_c10) * lVar74 * 4;
                            lVar57 = (lVar82 - (int)local_c14) * lVar48;
                            lVar74 = bx_1.smallend.vect._0_8_ + lVar83 * 4;
                            local_f58 = (double *)(lVar86 + lVar57 + lVar60 * -4 + lVar74);
                            local_f70 = lVar57 + lVar61 + lVar60 * -4 + lVar74;
                            local_f38 = (long)local_ae8.p +
                                        (lVar82 - local_ae8.begin.y) * local_ae8.jstride * 4 +
                                        (local_1000 - local_ae8.begin.z) * local_ae8.kstride * 4 +
                                        (long)local_ae8.begin.x * -4 + lVar83 * 4;
                            iVar37 = (local_d68.smallend.vect[1] + -1) - local_c14;
                            local_f88 = local_ce0;
                            local_fd0 = local_d18;
                            local_f90 = local_d10;
                            local_f98 = local_e08;
                            local_fe8 = local_d08;
                            lVar57 = lVar82;
                            local_e30 = lVar82 + -1;
                            iVar81 = local_d68.smallend.vect[1] + 1;
                            do {
                              if (local_d68.smallend.vect[0] <= local_d68.bigend.vect[0]) {
                                lVar87 = lVar57 - local_958.begin.y;
                                lVar46 = local_958.jstride * lVar87;
                                lVar53 = (long)local_958.begin.z;
                                lVar88 = local_958.kstride * (local_1000 - lVar53);
                                lVar98 = (lVar87 + -1) * local_958.jstride;
                                lVar71 = ((local_1000 + -1) - lVar53) * local_958.kstride;
                                lVar51 = (((int)lVar57 - local_958.begin.y) + 1) * local_958.jstride
                                ;
                                lVar64 = (((int)local_1000 + 1) - local_958.begin.z) *
                                         local_958.kstride;
                                lVar67 = (long)local_a68.begin.x;
                                lVar44 = (local_1000 - local_a68.begin.z) * local_a68.kstride;
                                lVar43 = (lVar57 - local_a68.begin.y) * local_a68.jstride;
                                lVar45 = local_958.jstride * 8;
                                lVar87 = lVar87 * lVar45;
                                lVar50 = local_958.kstride * 8;
                                lVar78 = (iVar33 - local_958.begin.z) * lVar50;
                                lVar77 = (local_eb8 - lVar53) * lVar50;
                                lVar50 = lVar50 * (local_1000 - lVar53);
                                lVar94 = (local_e30 - local_958.begin.y) * lVar45;
                                lVar45 = (iVar81 - local_958.begin.y) * lVar45;
                                lVar53 = (long)local_958.begin.x;
                                lVar63 = lVar87 + lVar78 + lVar53 * -8 + lVar40;
                                lVar66 = lVar77 + lVar87 + lVar53 * -8 + lVar40;
                                lVar87 = lVar87 + lVar50 + lVar53 * -8 + lVar40;
                                lVar84 = lVar50 + lVar94 + lVar53 * -8 + lVar40;
                                lVar91 = lVar94 + lVar78 + lVar53 * -8 + lVar40;
                                lVar94 = lVar94 + lVar77 + lVar53 * -8 + lVar40;
                                lVar95 = lVar50 + lVar45 + lVar53 * -8 + lVar40;
                                lVar78 = lVar78 + lVar45 + lVar53 * -8 + lVar40;
                                lVar45 = lVar45 + lVar77 + lVar53 * -8 + lVar40;
                                lVar53 = lVar86 + lVar60 * -4 + lVar74 + iVar37 * lVar48;
                                lVar68 = iVar37 * lVar48 + lVar61 + lVar60 * -4 + lVar74;
                                lVar50 = bx_1.smallend.vect._0_8_ +
                                         (lVar57 - (int)local_c14) * lVar49 * 4;
                                lVar77 = 0;
                                do {
                                  dVar110 = 0.0;
                                  if (*(int *)(local_f38 + lVar77 * 4) == 0) {
                                    dVar110 = *(double *)(local_f90 + -8 + lVar77 * 8);
                                    dVar119 = *(double *)(local_f90 + lVar77 * 8);
                                    dVar121 = dVar110 + dVar119;
                                    dVar127 = *(double *)(local_f88 + -8 + lVar77 * 8);
                                    dVar128 = *(double *)(local_f88 + lVar77 * 8);
                                    dVar112 = dVar121 + dVar127 + dVar128;
                                    dVar118 = *(double *)(local_f98 + -8 + lVar77 * 8);
                                    dVar133 = *(double *)(local_f98 + lVar77 * 8);
                                    dVar11 = *(double *)(local_fd0 + -8 + lVar77 * 8);
                                    dVar104 = *(double *)(local_fd0 + lVar77 * 8);
                                    lVar92 = (long)(((local_d68.smallend.vect[0] + 1) -
                                                    local_958.begin.x) + (int)lVar77);
                                    dVar110 = (dVar112 * *(double *)
                                                          ((long)local_958.p + lVar77 * 8 + lVar66)
                                              + (dVar118 + dVar133 + dVar11 + dVar104) *
                                                *(double *)((long)local_958.p + lVar77 * 8 + lVar63)
                                              ) * fm2xm2y4z +
                                              ((dVar121 + dVar118 + dVar133) *
                                               *(double *)((long)local_958.p + lVar77 * 8 + lVar84)
                                              + (dVar127 + dVar128 + dVar11 + dVar104) *
                                                *(double *)((long)local_958.p + lVar77 * 8 + lVar95)
                                              ) * fm2x4ym2z +
                                              ((dVar110 + dVar127 + dVar118 + dVar11) *
                                               *(double *)
                                                ((long)local_958.p + lVar77 * 8 + lVar87 + -8) +
                                              (dVar119 + dVar128 + dVar133 + dVar104) *
                                              local_958.p[lVar46 + lVar92 + lVar88]) * f4xm2ym2z +
                                              ((dVar128 + dVar104) *
                                               local_958.p[lVar51 + lVar92 + lVar88] +
                                              (dVar127 + dVar11) *
                                              *(double *)
                                               ((long)local_958.p + lVar77 * 8 + lVar95 + -8) +
                                              (dVar110 + dVar118) *
                                              *(double *)
                                               ((long)local_958.p + lVar77 * 8 + lVar84 + -8) +
                                              (dVar119 + dVar133) *
                                              local_958.p[lVar98 + lVar92 + lVar88]) * f2x2ymz +
                                              ((dVar133 + dVar104) *
                                               local_958.p[lVar46 + lVar92 + lVar64] +
                                              (dVar118 + dVar11) *
                                              *(double *)
                                               ((long)local_958.p + lVar77 * 8 + lVar63 + -8) +
                                              *(double *)
                                               ((long)local_958.p + lVar77 * 8 + lVar66 + -8) *
                                              (dVar110 + dVar127) +
                                              local_958.p[lVar46 + lVar92 + lVar71] *
                                              (dVar119 + dVar128)) * f2xmy2z +
                                              ((dVar11 + dVar104) *
                                               *(double *)((long)local_958.p + lVar77 * 8 + lVar78)
                                              + *(double *)((long)local_958.p + lVar77 * 8 + lVar91)
                                                * (dVar118 + dVar133) +
                                                *(double *)((long)local_958.p + lVar77 * 8 + lVar94)
                                                * dVar121 +
                                                *(double *)((long)local_958.p + lVar77 * 8 + lVar45)
                                                * (dVar127 + dVar128)) * fmx2y2z +
                                              (local_958.p[lVar51 + lVar92 + lVar64] * dVar104 +
                                              *(double *)
                                               ((long)local_958.p + lVar77 * 8 + lVar78 + -8) *
                                              dVar11 + local_958.p[lVar98 + lVar92 + lVar64] *
                                                       dVar133 + *(double *)
                                                                  ((long)local_958.p +
                                                                  lVar77 * 8 + lVar91 + -8) *
                                                                 dVar118 + local_958.p
                                                                           [lVar51 + lVar92 + lVar71
                                                                           ] * dVar128 +
                                                                           *(double *)
                                                                            ((long)local_958.p +
                                                                            lVar77 * 8 + lVar45 + -8
                                                                            ) * dVar127 +
                                                                           *(double *)
                                                                            ((long)local_958.p +
                                                                            lVar77 * 8 + lVar94 + -8
                                                                            ) * dVar110 +
                                                                           local_958.p
                                                                           [lVar98 + lVar92 + lVar71
                                                                           ] * dVar119) * fxyz +
                                              (dVar112 + dVar118 + dVar133 + dVar11 + dVar104) *
                                              *(double *)((long)local_958.p + lVar77 * 8 + lVar87) *
                                              -4.0 * fxyz;
                                  }
                                  *(double *)(local_ff0 + lVar77 * 8) = dVar110;
                                  lVar58 = (long)(((local_d68.smallend.vect[0] + -1) - local_c18) +
                                                 (int)lVar77);
                                  lVar92 = bx_1.smallend.vect._0_8_ +
                                           (int)(~local_c14 + (int)lVar57) * lVar49 * 4 + lVar58 * 4
                                  ;
                                  iVar35 = *(int *)(lVar92 + lVar62 * 4);
                                  if ((iVar35 == 0) ||
                                     (((((*(int *)(lVar68 + lVar77 * 4) == 0 ||
                                         (lVar65 = lVar50 + lVar58 * 4,
                                         *(int *)(lVar65 + lVar62 * 4) == 0)) ||
                                        ((*(int *)(local_f70 + lVar77 * 4) == 0 ||
                                         ((*(int *)(lVar92 + lVar97 * 4) == 0 ||
                                          (*(int *)(lVar53 + lVar77 * 4) == 0)))))) ||
                                       ((*(int *)(lVar65 + lVar97 * 4) == 0 ||
                                        (*(int *)((long)local_f58 + lVar77 * 4) == 0)))) &&
                                      (((((iVar35 == 0 || (*(int *)(lVar68 + lVar77 * 4) == 0)) ||
                                         (lVar58 = lVar50 + lVar58 * 4,
                                         *(int *)(lVar58 + lVar62 * 4) == 0)) ||
                                        ((*(int *)(local_f70 + lVar77 * 4) == 0 ||
                                         (*(int *)(lVar92 + lVar97 * 4) == 0)))) ||
                                       ((*(int *)(lVar53 + lVar77 * 4) == 0 ||
                                        ((*(int *)(lVar58 + lVar97 * 4) == 0 ||
                                         (*(int *)((long)local_f58 + lVar77 * 4) == 0)))))))))) {
                                    if (((bx.smallend.vect[0] - lVar83 != lVar77) ||
                                        ((dVar110 = 2.0, LVar21 != Neumann &&
                                         (dVar110 = 2.0, LVar21 != inflow)))) &&
                                       (dVar110 = 1.0, bx.bigend.vect[0] - lVar83 == lVar77)) {
                                      dVar110 = dVar10;
                                    }
                                    if (((lVar57 == bx.smallend.vect[1]) &&
                                        (((int)local_cc0 == 0x6a || ((int)local_cc0 == 0x66)))) ||
                                       ((lVar57 == bx.bigend.vect[1] &&
                                        ((LVar23 == inflow || (LVar23 == Neumann)))))) {
                                      dVar110 = dVar110 + dVar110;
                                    }
                                    if (((local_1000 == bx.smallend.vect[2]) &&
                                        ((LVar22 == inflow || (LVar22 == Neumann)))) ||
                                       ((local_1000 == bx.bigend.vect[2] &&
                                        ((LVar24 == inflow || (LVar24 == Neumann)))))) {
                                      dVar110 = dVar110 + dVar110;
                                    }
                                    local_a68.p[lVar83 + ((lVar44 + lVar43 + lVar77) - lVar67)] =
                                         (local_fe8[lVar77] -
                                         local_a68.p[lVar83 + ((lVar44 + lVar43 + lVar77) - lVar67)]
                                         ) * dVar110;
                                  }
                                  else {
                                    local_a68.p[lVar83 + ((lVar44 + lVar43 + lVar77) - lVar67)] =
                                         0.0;
                                  }
                                  lVar77 = lVar77 + 1;
                                } while ((local_d68.bigend.vect[0] - local_d68.smallend.vect[0]) + 1
                                         != (int)lVar77);
                              }
                              lVar57 = lVar57 + 1;
                              local_ff0 = local_ff0 + local_a68.jstride * 8;
                              iVar37 = iVar37 + 1;
                              local_f58 = (double *)((long)local_f58 + lVar48);
                              local_f70 = local_f70 + lVar48;
                              local_fe8 = local_fe8 + local_cf0;
                              local_f38 = local_f38 + local_ae8.jstride * 4;
                              local_e30 = local_e30 + 1;
                              iVar81 = iVar81 + 1;
                              local_f98 = local_f98 + lVar39;
                              local_f90 = local_f90 + lVar39;
                              local_fd0 = local_fd0 + lVar39;
                              local_f88 = local_f88 + lVar39;
                            } while (local_d68.bigend.vect[1] + 1U != (int)lVar57);
                          }
                          local_1000 = local_1000 + 1;
                          local_eb8 = local_eb8 + 1;
                          local_d08 = local_d08 + local_ca0;
                          local_e08 = local_e08 + lVar56;
                          local_d10 = local_d10 + lVar56;
                          local_d18 = local_d18 + lVar56;
                          local_ce0 = local_ce0 + lVar56;
                          lVar74 = local_cf0 * 8;
                          lVar62 = local_ca0 * 8;
                        } while (local_d68.bigend.vect[2] + 1 != (int)local_1000);
                      }
                    }
                    local_ca0 = lVar62;
                    local_cf0 = lVar74;
                    Gpu::Elixir::~Elixir(&rhseli);
                    Gpu::Elixir::~Elixir(&ueli);
                  }
                  goto LAB_005b697c;
                }
LAB_005ad5dd:
                lVar56 = lVar56 + 1;
                lVar49 = lVar49 + lVar74;
              } while (bx_2.bigend.vect[1] + 1 != (int)lVar56);
            }
            lVar49 = lVar39 + 1;
            bVar103 = bx_2.bigend.vect[2] <= lVar39;
            lVar48 = lVar48 + lVar40;
            lVar39 = lVar49;
          } while (bx_2.bigend.vect[2] + 1 != (int)lVar49);
        }
      }
LAB_005b697c:
      MFIter::operator++(&mfi_1);
    } while (mfi_1.currentIndex < mfi_1.endIndex);
  }
  MFIter::~MFIter(&mfi_1);
  cn.super_BaseFab<double>._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0074eb90;
  BaseFab<double>::clear(&cn.super_BaseFab<double>);
  sten.super_BaseFab<double>._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0074eb90;
  BaseFab<double>::clear(&sten.super_BaseFab<double>);
  u.super_BaseFab<double>._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0074eb90;
  BaseFab<double>::clear(&u.super_BaseFab<double>);
  rhs.super_BaseFab<double>._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0074eb90;
  BaseFab<double>::clear(&rhs.super_BaseFab<double>);
  MultiFab::~MultiFab(&phi);
  iMultiFab::~iMultiFab(&crse_cc_mask);
  BoxArray::~BoxArray(&local_280);
  BoxArray::~BoxArray(&local_218);
  return;
code_r0x005ad5d5:
  lVar57 = lVar57 + 1;
  if ((bx_2.bigend.vect[0] - bx_2.smallend.vect[0]) + 1 == (int)lVar57) goto LAB_005ad5dd;
  goto LAB_005ad5ce;
}

Assistant:

void
MLNodeLaplacian::compSyncResidualCoarse (MultiFab& sync_resid, const MultiFab& a_phi,
                                         const MultiFab& vold, const MultiFab* rhcc,
                                         const BoxArray& fine_grids, const IntVect& ref_ratio)
{
    BL_PROFILE("MLNodeLaplacian::SyncResCrse()");

    sync_resid.setVal(0.0);

    const Geometry& geom = m_geom[0][0];
    const DistributionMapping& dmap = m_dmap[0][0];
    const BoxArray& ccba = m_grids[0][0];
    const BoxArray& ndba = amrex::convert(ccba, IntVect::TheNodeVector());
    const BoxArray& ccfba = amrex::convert(fine_grids, IntVect::TheZeroVector());

    const auto lobc = LoBC();
    const auto hibc = HiBC();

    // cell-center, 1: coarse; 0: covered by fine
    const int owner = 1;
    const int nonowner = 0;
    iMultiFab crse_cc_mask = amrex::makeFineMask(ccba, dmap, IntVect(1), ccfba, ref_ratio,
                                                 geom.periodicity(), owner, nonowner);

    const Box& ccdom = geom.Domain();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(crse_cc_mask); mfi.isValid(); ++mfi)
    {
        Array4<int> const& fab = crse_cc_mask.array(mfi);
        mlndlap_fillbc_cc<int>(mfi.validbox(),fab,ccdom,lobc,hibc);
    }

    MultiFab phi(ndba, dmap, 1, 1);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(phi,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        const Box& gbx = mfi.growntilebox();
        Array4<Real> const& fab = phi.array(mfi);
        Array4<Real const> const& a_fab = a_phi.const_array(mfi);
        Array4<int const> const& msk = crse_cc_mask.const_array(mfi);
        AMREX_HOST_DEVICE_FOR_3D(gbx, i, j, k,
        {
            if (bx.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                fab(i,j,k) = a_fab(i,j,k);
                mlndlap_zero_fine(i,j,k,fab,msk,nonowner);
            } else {
                fab(i,j,k) = 0.0;
            }
        });
    }

    const auto& nddom = amrex::surroundingNodes(ccdom);

    const auto dxinv = geom.InvCellSizeArray();

#if (AMREX_SPACEDIM == 2)
    bool is_rz = m_is_rz;
#endif

    const auto& sigma_orig = m_sigma[0][0][0];
    const iMultiFab& dmsk = *m_dirichlet_mask[0][0];

#ifdef AMREX_USE_EB
    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[0][0].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
    const MultiFab* intg = m_integral[0].get();
    const MultiFab* vfrac = (factory) ? &(factory->getVolFrac()) : nullptr;
#endif

    bool neumann_doubling = true; // yes even for RAP, because unimposeNeumannBC will be called on rhs

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    {
        FArrayBox rhs, u;
#ifdef AMREX_USE_EB
        FArrayBox sten, cn;
#endif
        for (MFIter mfi(sync_resid,mfi_info); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();

            auto typ = FabType::regular;
#ifdef AMREX_USE_EB
            if (factory) {
                typ = (*flags)[mfi].getType(amrex::enclosedCells(bx));
            }
#endif
            if (typ != FabType::covered)
            {
                const Box& bxg1 = amrex::grow(bx,1);
                const Box& ccbxg1 = amrex::enclosedCells(bxg1);
                Array4<int const> const& cccmsk = crse_cc_mask.const_array(mfi);

                bool has_fine;
                if (Gpu::inLaunchRegion()) {
                    AMREX_ASSERT(ccbxg1 == crse_cc_mask[mfi].box());
                    has_fine = Reduce::AnyOf(ccbxg1,
                                             [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept -> bool
                    {
                        return cccmsk(i,j,k) == nonowner;
                    });
                } else {
                    has_fine = mlndlap_any_fine_sync_cells(ccbxg1,cccmsk,nonowner);
                }

                if (has_fine)
                {
                    const Box& ccvbx = amrex::enclosedCells(mfi.validbox());

                    u.resize(ccbxg1, AMREX_SPACEDIM);
                    Elixir ueli = u.elixir();
                    Array4<Real> const& uarr = u.array();

                    Box b = ccbxg1 & ccvbx;
                    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
                    {
                        if (m_lobc[0][idim] == LinOpBCType::inflow)
                        {
                            if (b.smallEnd(idim) == ccdom.smallEnd(idim)) {
                                b.growLo(idim, 1);
                            }
                        }
                        if (m_hibc[0][idim] == LinOpBCType::inflow)
                        {
                            if (b.bigEnd(idim) == ccdom.bigEnd(idim)) {
                                b.growHi(idim, 1);
                            }
                        }
                    }

                    Array4<Real const> const& voarr = vold.const_array(mfi);
                    AMREX_HOST_DEVICE_FOR_3D(ccbxg1, i, j, k,
                    {
                        if (b.contains(IntVect(AMREX_D_DECL(i,j,k))) && cccmsk(i,j,k)){
                            AMREX_D_TERM(uarr(i,j,k,0) = voarr(i,j,k,0);,
                                         uarr(i,j,k,1) = voarr(i,j,k,1);,
                                         uarr(i,j,k,2) = voarr(i,j,k,2););
                        } else {
                            AMREX_D_TERM(uarr(i,j,k,0) = 0.0;,
                                         uarr(i,j,k,1) = 0.0;,
                                         uarr(i,j,k,2) = 0.0;);
                        }
                    });

                    rhs.resize(bx);
                    Elixir rhseli = rhs.elixir();
                    Array4<Real> const& rhsarr = rhs.array();
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

#ifdef AMREX_USE_EB
                    if (typ == FabType::singlevalued)
                    {
                        Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
                        Array4<Real const> const& intgarr = intg->const_array(mfi);
                        AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                        {
                            mlndlap_divu_eb(i,j,k,rhsarr,uarr,vfracarr,intgarr,dmskarr,dxinv,nddom,lobc,hibc);
                        });
                    }
                    else
#endif
                    {
#if (AMREX_SPACEDIM == 2)
                        AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                        {
                            mlndlap_divu(i,j,k,rhsarr,uarr,dmskarr,dxinv,nddom,lobc,hibc,is_rz);
                        });
#else
                        AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                        {
                            mlndlap_divu(i,j,k,rhsarr,uarr,dmskarr,dxinv,nddom,lobc,hibc);
                        });
#endif
                    }

                    if (rhcc)
                    {
                        Array4<Real> rhccarr = uarr;
                        Array4<Real const> const& rhccarr_orig = rhcc->const_array(mfi);
                        const Box& b2 = ccbxg1 & ccvbx;
                        AMREX_HOST_DEVICE_FOR_3D(ccbxg1, i, j, k,
                        {
                            if (b2.contains(IntVect(AMREX_D_DECL(i,j,k))) && cccmsk(i,j,k)){
                                rhccarr(i,j,k) = rhccarr_orig(i,j,k);
                            } else {
                                rhccarr(i,j,k) = 0.0;
                            }
                        });

#ifdef AMREX_USE_EB
                        if (typ == FabType::singlevalued)
                        {
                            Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
                            Array4<Real const> const& intgarr = intg->const_array(mfi);
                            AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                            {
                                Real rhs2 = mlndlap_rhcc_eb(i,j,k,rhccarr,vfracarr,intgarr,dmskarr);
                                rhsarr(i,j,k) += rhs2;
                            });
                        }
                        else
#endif
                        {
                            AMREX_HOST_DEVICE_FOR_3D (bx, i, j, k,
                            {
                                Real rhs2 = mlndlap_rhcc(i,j,k,rhccarr,dmskarr);
                                rhsarr(i,j,k) += rhs2;
                            });
                        }
                    }

                    Array4<Real> const& sync_resid_a = sync_resid.array(mfi);
                    Array4<Real const> const& phiarr = phi.const_array(mfi);
#ifdef AMREX_USE_EB
                    if (typ == FabType::singlevalued)
                    {
                        Array4<Real const> const& sigmaarr_orig = sigma_orig->const_array(mfi);

                        Box stbx = bx;
                        AMREX_D_TERM(stbx.growLo(0,1);, stbx.growLo(1,1);, stbx.growLo(2,1));
                        Box const& sgbx = amrex::grow(amrex::enclosedCells(stbx),1);

                        constexpr int ncomp_s = (AMREX_SPACEDIM == 2) ? 5 : 9;
                        sten.resize(stbx,ncomp_s);
                        Elixir steneli = sten.elixir();
                        Array4<Real> const& stenarr = sten.array();

                        constexpr int ncomp_c = (AMREX_SPACEDIM == 2) ? 6 : 27;
                        cn.resize(sgbx,ncomp_c+1);
                        Elixir cneli = cn.elixir();
                        Array4<Real> const& cnarr = cn.array();
                        Array4<Real> const& sgarr = cn.array(ncomp_c);

                        Array4<EBCellFlag const> const& flagarr = flags->const_array(mfi);
                        Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
                        Array4<Real const> const& intgarr = intg->const_array(mfi);

                        const Box& ibx = sgbx & amrex::enclosedCells(mfi.validbox());
                        AMREX_HOST_DEVICE_FOR_3D(sgbx, i, j, k,
                        {
                            if (ibx.contains(IntVect(AMREX_D_DECL(i,j,k))) && cccmsk(i,j,k)) {
                                mlndlap_set_connection(i,j,k,cnarr,intgarr,vfracarr,flagarr);
                                sgarr(i,j,k) = sigmaarr_orig(i,j,k);
                            } else {
                                for (int n = 0; n < ncomp_c; ++n) {
                                    cnarr(i,j,k,n) = 0.0;
                                }
                                sgarr(i,j,k) = 0.0;
                            }
                        });

                        AMREX_HOST_DEVICE_FOR_3D(stbx, i, j, k,
                        {
                            mlndlap_set_stencil_eb(i, j, k, stenarr, sgarr, cnarr, dxinv);
                        });

                        AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                        {
                            mlndlap_set_stencil_s0(i, j, k, stenarr);
                            sync_resid_a(i,j,k) = mlndlap_adotx_sten(i, j, k, phiarr, stenarr, dmskarr);
                            mlndlap_crse_resid(i, j, k, sync_resid_a, rhsarr, cccmsk, nddom, lobc, hibc, neumann_doubling);
                        });
                    }
                    else
#endif
                    {
                        Array4<Real> sigmaarr = uarr;
                        const Box& ibx = ccbxg1 & amrex::enclosedCells(mfi.validbox());
                        if (sigma_orig) {
                            Array4<Real const> const& sigmaarr_orig = sigma_orig->const_array(mfi);
                            AMREX_HOST_DEVICE_FOR_3D(ccbxg1, i, j, k,
                            {
                                if (ibx.contains(IntVect(AMREX_D_DECL(i,j,k))) && cccmsk(i,j,k)) {
                                    sigmaarr(i,j,k) = sigmaarr_orig(i,j,k);
                                } else {
                                    sigmaarr(i,j,k) = 0.0;
                                }
                            });
                        } else {
                            Real const_sigma = m_const_sigma;
                            AMREX_HOST_DEVICE_FOR_3D(ccbxg1, i, j, k,
                            {
                                if (ibx.contains(IntVect(AMREX_D_DECL(i,j,k))) && cccmsk(i,j,k)) {
                                    sigmaarr(i,j,k) = const_sigma;
                                } else {
                                    sigmaarr(i,j,k) = 0.0;
                                }
                            });
                        }

#if (AMREX_SPACEDIM == 2)
                        AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                        {
                            sync_resid_a(i,j,k) = mlndlap_adotx_aa(i, j, k, phiarr, sigmaarr, dmskarr, is_rz, dxinv);
                            mlndlap_crse_resid(i, j, k, sync_resid_a, rhsarr, cccmsk, nddom, lobc, hibc, neumann_doubling);
                        });
#else
                        AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                        {
                            sync_resid_a(i,j,k) = mlndlap_adotx_aa(i, j, k, phiarr, sigmaarr, dmskarr, dxinv);
                            mlndlap_crse_resid(i, j, k, sync_resid_a, rhsarr, cccmsk, nddom, lobc, hibc, neumann_doubling);
                        });
#endif
                    }
                }
            }
        }
    }
}